

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [32];
  undefined4 uVar12;
  undefined1 auVar13 [32];
  Primitive PVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  RTCFilterFunctionN p_Var21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [28];
  undefined1 auVar120 [12];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [24];
  uint uVar124;
  int iVar125;
  ulong uVar126;
  RTCIntersectArguments *pRVar127;
  uint uVar128;
  ulong uVar129;
  long lVar130;
  byte bVar131;
  long lVar132;
  ulong uVar133;
  undefined1 auVar134 [8];
  Geometry *geometry;
  long lVar135;
  float fVar136;
  float fVar137;
  float fVar151;
  float fVar153;
  vint4 bi_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar156;
  float fVar158;
  float fVar160;
  undefined1 auVar143 [32];
  float fVar154;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar152;
  float fVar155;
  float fVar157;
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  vint4 bi;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar176;
  float fVar177;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar167 [16];
  float fVar178;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar179;
  float fVar191;
  float fVar192;
  vint4 bi_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar193;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar194;
  float fVar206;
  float fVar208;
  vint4 ai_1;
  undefined1 auVar195 [16];
  float fVar209;
  undefined1 auVar196 [16];
  float fVar207;
  float fVar211;
  undefined1 auVar198 [16];
  undefined1 auVar197 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar210;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar215;
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar216;
  float fVar228;
  float fVar230;
  vint4 ai_2;
  undefined1 auVar218 [16];
  float fVar232;
  undefined1 auVar219 [16];
  float fVar217;
  undefined1 auVar221 [16];
  undefined1 auVar237 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [32];
  float fVar229;
  float fVar231;
  float fVar233;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar235;
  float fVar245;
  float fVar246;
  undefined1 auVar236 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar250;
  float fVar251;
  float fVar259;
  float fVar260;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar262;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar261;
  float fVar263;
  float fVar267;
  undefined1 auVar258 [32];
  vint4 ai;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar276;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar288;
  undefined1 auVar281 [32];
  float fVar287;
  float fVar291;
  float fVar295;
  undefined1 auVar282 [32];
  float fVar289;
  float fVar290;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar283 [64];
  float fVar296;
  float fVar301;
  float fVar302;
  undefined1 auVar297 [16];
  float fVar303;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar304;
  float fVar312;
  float fVar315;
  undefined1 auVar306 [16];
  float fVar305;
  float fVar313;
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar314;
  float fVar317;
  undefined1 auVar310 [32];
  undefined1 auVar311 [64];
  float fVar323;
  float fVar324;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar325 [16];
  float fVar330;
  undefined1 auVar326 [32];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar337;
  float fVar342;
  float fVar343;
  undefined1 auVar338 [16];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar344;
  undefined1 auVar341 [64];
  float fVar345;
  float fVar346;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar347 [32];
  float fVar354;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  uint local_7c0;
  undefined4 uStack_7bc;
  undefined1 local_7a0 [16];
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  undefined1 auStack_738 [8];
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 (*local_700) [16];
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [4];
  undefined1 auStack_5bc [8];
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  RTCHitN local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  PVar14 = prim[1];
  uVar126 = (ulong)(byte)PVar14;
  lVar22 = uVar126 * 0x25;
  fVar324 = *(float *)(prim + lVar22 + 0x12);
  auVar237 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar237 = vinsertps_avx(auVar237,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar186 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar186 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar237 = vsubps_avx(auVar237,*(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar163._0_4_ = fVar324 * auVar237._0_4_;
  auVar163._4_4_ = fVar324 * auVar237._4_4_;
  auVar163._8_4_ = fVar324 * auVar237._8_4_;
  auVar163._12_4_ = fVar324 * auVar237._12_4_;
  auVar268._0_4_ = fVar324 * auVar186._0_4_;
  auVar268._4_4_ = fVar324 * auVar186._4_4_;
  auVar268._8_4_ = fVar324 * auVar186._8_4_;
  auVar268._12_4_ = fVar324 * auVar186._12_4_;
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 6)));
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 5 + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 6)));
  auVar221 = vcvtdq2ps_avx(auVar221);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xf + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar126 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1a + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1b + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1c + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vshufps_avx(auVar268,auVar268,0);
  auVar30 = vshufps_avx(auVar268,auVar268,0x55);
  auVar31 = vshufps_avx(auVar268,auVar268,0xaa);
  fVar324 = auVar31._0_4_;
  fVar207 = auVar31._4_4_;
  fVar328 = auVar31._8_4_;
  fVar211 = auVar31._12_4_;
  fVar216 = auVar30._0_4_;
  fVar228 = auVar30._4_4_;
  fVar230 = auVar30._8_4_;
  fVar232 = auVar30._12_4_;
  fVar194 = auVar29._0_4_;
  fVar206 = auVar29._4_4_;
  fVar208 = auVar29._8_4_;
  fVar209 = auVar29._12_4_;
  auVar331._0_4_ = fVar194 * auVar237._0_4_ + fVar216 * auVar186._0_4_ + fVar324 * auVar221._0_4_;
  auVar331._4_4_ = fVar206 * auVar237._4_4_ + fVar228 * auVar186._4_4_ + fVar207 * auVar221._4_4_;
  auVar331._8_4_ = fVar208 * auVar237._8_4_ + fVar230 * auVar186._8_4_ + fVar328 * auVar221._8_4_;
  auVar331._12_4_ =
       fVar209 * auVar237._12_4_ + fVar232 * auVar186._12_4_ + fVar211 * auVar221._12_4_;
  auVar338._0_4_ = fVar194 * auVar198._0_4_ + fVar216 * auVar24._0_4_ + auVar25._0_4_ * fVar324;
  auVar338._4_4_ = fVar206 * auVar198._4_4_ + fVar228 * auVar24._4_4_ + auVar25._4_4_ * fVar207;
  auVar338._8_4_ = fVar208 * auVar198._8_4_ + fVar230 * auVar24._8_4_ + auVar25._8_4_ * fVar328;
  auVar338._12_4_ = fVar209 * auVar198._12_4_ + fVar232 * auVar24._12_4_ + auVar25._12_4_ * fVar211;
  auVar269._0_4_ = fVar194 * auVar26._0_4_ + fVar216 * auVar27._0_4_ + auVar28._0_4_ * fVar324;
  auVar269._4_4_ = fVar206 * auVar26._4_4_ + fVar228 * auVar27._4_4_ + auVar28._4_4_ * fVar207;
  auVar269._8_4_ = fVar208 * auVar26._8_4_ + fVar230 * auVar27._8_4_ + auVar28._8_4_ * fVar328;
  auVar269._12_4_ = fVar209 * auVar26._12_4_ + fVar232 * auVar27._12_4_ + auVar28._12_4_ * fVar211;
  auVar29 = vshufps_avx(auVar163,auVar163,0);
  auVar30 = vshufps_avx(auVar163,auVar163,0x55);
  auVar31 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar324 = auVar31._0_4_;
  fVar207 = auVar31._4_4_;
  fVar328 = auVar31._8_4_;
  fVar211 = auVar31._12_4_;
  fVar216 = auVar30._0_4_;
  fVar228 = auVar30._4_4_;
  fVar230 = auVar30._8_4_;
  fVar232 = auVar30._12_4_;
  fVar194 = auVar29._0_4_;
  fVar206 = auVar29._4_4_;
  fVar208 = auVar29._8_4_;
  fVar209 = auVar29._12_4_;
  auVar164._0_4_ = fVar194 * auVar237._0_4_ + fVar216 * auVar186._0_4_ + fVar324 * auVar221._0_4_;
  auVar164._4_4_ = fVar206 * auVar237._4_4_ + fVar228 * auVar186._4_4_ + fVar207 * auVar221._4_4_;
  auVar164._8_4_ = fVar208 * auVar237._8_4_ + fVar230 * auVar186._8_4_ + fVar328 * auVar221._8_4_;
  auVar164._12_4_ =
       fVar209 * auVar237._12_4_ + fVar232 * auVar186._12_4_ + fVar211 * auVar221._12_4_;
  auVar138._0_4_ = fVar194 * auVar198._0_4_ + auVar25._0_4_ * fVar324 + fVar216 * auVar24._0_4_;
  auVar138._4_4_ = fVar206 * auVar198._4_4_ + auVar25._4_4_ * fVar207 + fVar228 * auVar24._4_4_;
  auVar138._8_4_ = fVar208 * auVar198._8_4_ + auVar25._8_4_ * fVar328 + fVar230 * auVar24._8_4_;
  auVar138._12_4_ = fVar209 * auVar198._12_4_ + auVar25._12_4_ * fVar211 + fVar232 * auVar24._12_4_;
  auVar277._8_4_ = 0x7fffffff;
  auVar277._0_8_ = 0x7fffffff7fffffff;
  auVar277._12_4_ = 0x7fffffff;
  auVar237 = vandps_avx(auVar331,auVar277);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  auVar237 = vcmpps_avx(auVar237,auVar218,1);
  auVar186 = vblendvps_avx(auVar331,auVar218,auVar237);
  auVar237 = vandps_avx(auVar338,auVar277);
  auVar237 = vcmpps_avx(auVar237,auVar218,1);
  auVar221 = vblendvps_avx(auVar338,auVar218,auVar237);
  auVar237 = vandps_avx(auVar277,auVar269);
  auVar237 = vcmpps_avx(auVar237,auVar218,1);
  auVar237 = vblendvps_avx(auVar269,auVar218,auVar237);
  auVar180._0_4_ = fVar194 * auVar26._0_4_ + fVar216 * auVar27._0_4_ + auVar28._0_4_ * fVar324;
  auVar180._4_4_ = fVar206 * auVar26._4_4_ + fVar228 * auVar27._4_4_ + auVar28._4_4_ * fVar207;
  auVar180._8_4_ = fVar208 * auVar26._8_4_ + fVar230 * auVar27._8_4_ + auVar28._8_4_ * fVar328;
  auVar180._12_4_ = fVar209 * auVar26._12_4_ + fVar232 * auVar27._12_4_ + auVar28._12_4_ * fVar211;
  auVar198 = vrcpps_avx(auVar186);
  fVar194 = auVar198._0_4_;
  auVar195._0_4_ = fVar194 * auVar186._0_4_;
  fVar206 = auVar198._4_4_;
  auVar195._4_4_ = fVar206 * auVar186._4_4_;
  fVar208 = auVar198._8_4_;
  auVar195._8_4_ = fVar208 * auVar186._8_4_;
  fVar209 = auVar198._12_4_;
  auVar195._12_4_ = fVar209 * auVar186._12_4_;
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = 0x3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar186 = vsubps_avx(auVar252,auVar195);
  fVar194 = fVar194 + fVar194 * auVar186._0_4_;
  fVar206 = fVar206 + fVar206 * auVar186._4_4_;
  fVar208 = fVar208 + fVar208 * auVar186._8_4_;
  fVar209 = fVar209 + fVar209 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar221);
  fVar216 = auVar186._0_4_;
  auVar236._0_4_ = fVar216 * auVar221._0_4_;
  fVar228 = auVar186._4_4_;
  auVar236._4_4_ = fVar228 * auVar221._4_4_;
  fVar230 = auVar186._8_4_;
  auVar236._8_4_ = fVar230 * auVar221._8_4_;
  fVar232 = auVar186._12_4_;
  auVar236._12_4_ = fVar232 * auVar221._12_4_;
  auVar186 = vsubps_avx(auVar252,auVar236);
  fVar216 = fVar216 + fVar216 * auVar186._0_4_;
  fVar228 = fVar228 + fVar228 * auVar186._4_4_;
  fVar230 = fVar230 + fVar230 * auVar186._8_4_;
  fVar232 = fVar232 + fVar232 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar237);
  fVar235 = auVar186._0_4_;
  auVar270._0_4_ = fVar235 * auVar237._0_4_;
  fVar245 = auVar186._4_4_;
  auVar270._4_4_ = fVar245 * auVar237._4_4_;
  fVar246 = auVar186._8_4_;
  auVar270._8_4_ = fVar246 * auVar237._8_4_;
  fVar247 = auVar186._12_4_;
  auVar270._12_4_ = fVar247 * auVar237._12_4_;
  auVar237 = vsubps_avx(auVar252,auVar270);
  fVar235 = fVar235 + fVar235 * auVar237._0_4_;
  fVar245 = fVar245 + fVar245 * auVar237._4_4_;
  fVar246 = fVar246 + fVar246 * auVar237._8_4_;
  fVar247 = fVar247 + fVar247 * auVar237._12_4_;
  auVar237 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
                           *(float *)(prim + lVar22 + 0x1a)));
  auVar221 = vshufps_avx(auVar237,auVar237,0);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + uVar126 * 7 + 6);
  auVar237 = vpmovsxwd_avx(auVar237);
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar126 * 0xb + 6);
  auVar186 = vpmovsxwd_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar198 = vsubps_avx(auVar186,auVar237);
  fVar324 = auVar221._0_4_;
  fVar207 = auVar221._4_4_;
  fVar328 = auVar221._8_4_;
  fVar211 = auVar221._12_4_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar126 * 9 + 6);
  auVar186 = vpmovsxwd_avx(auVar221);
  auVar271._0_4_ = auVar198._0_4_ * fVar324 + auVar237._0_4_;
  auVar271._4_4_ = auVar198._4_4_ * fVar207 + auVar237._4_4_;
  auVar271._8_4_ = auVar198._8_4_ * fVar328 + auVar237._8_4_;
  auVar271._12_4_ = auVar198._12_4_ * fVar211 + auVar237._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar126 * 0xd + 6);
  auVar221 = vpmovsxwd_avx(auVar198);
  auVar237 = vcvtdq2ps_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar221);
  auVar186 = vsubps_avx(auVar186,auVar237);
  auVar278._0_4_ = auVar186._0_4_ * fVar324 + auVar237._0_4_;
  auVar278._4_4_ = auVar186._4_4_ * fVar207 + auVar237._4_4_;
  auVar278._8_4_ = auVar186._8_4_ * fVar328 + auVar237._8_4_;
  auVar278._12_4_ = auVar186._12_4_ * fVar211 + auVar237._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar126 * 0x12 + 6);
  auVar237 = vpmovsxwd_avx(auVar24);
  uVar129 = (ulong)(uint)((int)(uVar126 * 5) << 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar126 * 2 + uVar129 + 6);
  auVar186 = vpmovsxwd_avx(auVar25);
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar237);
  auVar297._0_4_ = auVar186._0_4_ * fVar324 + auVar237._0_4_;
  auVar297._4_4_ = auVar186._4_4_ * fVar207 + auVar237._4_4_;
  auVar297._8_4_ = auVar186._8_4_ * fVar328 + auVar237._8_4_;
  auVar297._12_4_ = auVar186._12_4_ * fVar211 + auVar237._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar129 + 6);
  auVar237 = vpmovsxwd_avx(auVar26);
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar126 * 0x18 + 6);
  auVar186 = vpmovsxwd_avx(auVar27);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar221 = vsubps_avx(auVar186,auVar237);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar126 * 0x1d + 6);
  auVar186 = vpmovsxwd_avx(auVar28);
  auVar306._0_4_ = auVar221._0_4_ * fVar324 + auVar237._0_4_;
  auVar306._4_4_ = auVar221._4_4_ * fVar207 + auVar237._4_4_;
  auVar306._8_4_ = auVar221._8_4_ * fVar328 + auVar237._8_4_;
  auVar306._12_4_ = auVar221._12_4_ * fVar211 + auVar237._12_4_;
  auVar237 = vcvtdq2ps_avx(auVar186);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar126 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar186 = vpmovsxwd_avx(auVar29);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar237);
  auVar325._0_4_ = auVar186._0_4_ * fVar324 + auVar237._0_4_;
  auVar325._4_4_ = auVar186._4_4_ * fVar207 + auVar237._4_4_;
  auVar325._8_4_ = auVar186._8_4_ * fVar328 + auVar237._8_4_;
  auVar325._12_4_ = auVar186._12_4_ * fVar211 + auVar237._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar126) + 6);
  auVar237 = vpmovsxwd_avx(auVar30);
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar126 * 0x23 + 6);
  auVar186 = vpmovsxwd_avx(auVar31);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar237);
  auVar253._0_4_ = auVar237._0_4_ + auVar186._0_4_ * fVar324;
  auVar253._4_4_ = auVar237._4_4_ + auVar186._4_4_ * fVar207;
  auVar253._8_4_ = auVar237._8_4_ + auVar186._8_4_ * fVar328;
  auVar253._12_4_ = auVar237._12_4_ + auVar186._12_4_ * fVar211;
  auVar237 = vsubps_avx(auVar271,auVar164);
  auVar272._0_4_ = fVar194 * auVar237._0_4_;
  auVar272._4_4_ = fVar206 * auVar237._4_4_;
  auVar272._8_4_ = fVar208 * auVar237._8_4_;
  auVar272._12_4_ = fVar209 * auVar237._12_4_;
  auVar237 = vsubps_avx(auVar278,auVar164);
  auVar165._0_4_ = fVar194 * auVar237._0_4_;
  auVar165._4_4_ = fVar206 * auVar237._4_4_;
  auVar165._8_4_ = fVar208 * auVar237._8_4_;
  auVar165._12_4_ = fVar209 * auVar237._12_4_;
  auVar237 = vsubps_avx(auVar297,auVar138);
  auVar196._0_4_ = fVar216 * auVar237._0_4_;
  auVar196._4_4_ = fVar228 * auVar237._4_4_;
  auVar196._8_4_ = fVar230 * auVar237._8_4_;
  auVar196._12_4_ = fVar232 * auVar237._12_4_;
  auVar237 = vsubps_avx(auVar306,auVar138);
  auVar139._0_4_ = fVar216 * auVar237._0_4_;
  auVar139._4_4_ = fVar228 * auVar237._4_4_;
  auVar139._8_4_ = fVar230 * auVar237._8_4_;
  auVar139._12_4_ = fVar232 * auVar237._12_4_;
  auVar237 = vsubps_avx(auVar325,auVar180);
  auVar219._0_4_ = fVar235 * auVar237._0_4_;
  auVar219._4_4_ = fVar245 * auVar237._4_4_;
  auVar219._8_4_ = fVar246 * auVar237._8_4_;
  auVar219._12_4_ = fVar247 * auVar237._12_4_;
  auVar237 = vsubps_avx(auVar253,auVar180);
  auVar181._0_4_ = fVar235 * auVar237._0_4_;
  auVar181._4_4_ = fVar245 * auVar237._4_4_;
  auVar181._8_4_ = fVar246 * auVar237._8_4_;
  auVar181._12_4_ = fVar247 * auVar237._12_4_;
  auVar237 = vpminsd_avx(auVar272,auVar165);
  auVar186 = vpminsd_avx(auVar196,auVar139);
  auVar237 = vmaxps_avx(auVar237,auVar186);
  auVar186 = vpminsd_avx(auVar219,auVar181);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar279._4_4_ = uVar12;
  auVar279._0_4_ = uVar12;
  auVar279._8_4_ = uVar12;
  auVar279._12_4_ = uVar12;
  auVar186 = vmaxps_avx(auVar186,auVar279);
  auVar237 = vmaxps_avx(auVar237,auVar186);
  local_2d0._0_4_ = auVar237._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar237._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar237._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar237._12_4_ * 0.99999964;
  auVar237 = vpmaxsd_avx(auVar272,auVar165);
  auVar186 = vpmaxsd_avx(auVar196,auVar139);
  auVar237 = vminps_avx(auVar237,auVar186);
  auVar186 = vpmaxsd_avx(auVar219,auVar181);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar182._4_4_ = uVar12;
  auVar182._0_4_ = uVar12;
  auVar182._8_4_ = uVar12;
  auVar182._12_4_ = uVar12;
  auVar186 = vminps_avx(auVar186,auVar182);
  auVar237 = vminps_avx(auVar237,auVar186);
  auVar140._0_4_ = auVar237._0_4_ * 1.0000004;
  auVar140._4_4_ = auVar237._4_4_ * 1.0000004;
  auVar140._8_4_ = auVar237._8_4_ * 1.0000004;
  auVar140._12_4_ = auVar237._12_4_ * 1.0000004;
  auVar237 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar186 = vpcmpgtd_avx(auVar237,_DAT_01f7fcf0);
  auVar237 = vcmpps_avx(local_2d0,auVar140,2);
  auVar237 = vandps_avx(auVar237,auVar186);
  uVar124 = vmovmskps_avx(auVar237);
  if (uVar124 == 0) {
    bVar131 = 0;
  }
  else {
    uVar124 = uVar124 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_530 = pre->ray_space + k;
    local_700 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_6f8 = pre;
    local_528 = prim;
    do {
      lVar22 = 0;
      if (uVar124 != 0) {
        for (; (uVar124 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      uVar15 = *(uint *)(local_528 + 2);
      local_788 = (ulong)uVar15;
      uVar16 = *(uint *)(local_528 + lVar22 * 4 + 6);
      pGVar18 = (context->scene->geometries).items[local_788].ptr;
      local_600._0_8_ = CONCAT44(0,uVar16);
      uVar129 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                CONCAT44(0,uVar16) *
                                pGVar18[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar324 = (pGVar18->time_range).lower;
      fVar324 = pGVar18->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar324) /
                ((pGVar18->time_range).upper - fVar324));
      auVar237 = vroundss_avx(ZEXT416((uint)fVar324),ZEXT416((uint)fVar324),9);
      auVar237 = vminss_avx(auVar237,ZEXT416((uint)(pGVar18->fnumTimeSegments + -1.0)));
      auVar237 = vmaxss_avx(ZEXT816(0) << 0x20,auVar237);
      fVar324 = fVar324 - auVar237._0_4_;
      _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar130 = (long)(int)auVar237._0_4_ * 0x38;
      lVar22 = *(long *)(_Var19 + 0x10 + lVar130);
      uVar126 = uVar129 + 3;
      lVar135 = *(long *)(_Var19 + 0x38 + lVar130);
      lVar20 = *(long *)(_Var19 + 0x48 + lVar130);
      auVar237 = vshufps_avx(ZEXT416((uint)fVar324),ZEXT416((uint)fVar324),0);
      pfVar1 = (float *)(lVar135 + uVar129 * lVar20);
      fVar207 = auVar237._0_4_;
      fVar328 = auVar237._4_4_;
      fVar211 = auVar237._8_4_;
      fVar194 = auVar237._12_4_;
      pfVar2 = (float *)(lVar135 + (uVar129 + 1) * lVar20);
      lVar132 = (uVar129 + 2) * lVar20;
      pfVar3 = (float *)(lVar135 + lVar132);
      pfVar4 = (float *)(lVar135 + lVar20 * uVar126);
      lVar135 = *(long *)(_Var19 + lVar130);
      auVar237 = vshufps_avx(ZEXT416((uint)(1.0 - fVar324)),ZEXT416((uint)(1.0 - fVar324)),0);
      pfVar5 = (float *)(lVar135 + lVar22 * uVar129);
      fVar324 = auVar237._0_4_;
      fVar206 = auVar237._4_4_;
      fVar208 = auVar237._8_4_;
      fVar209 = auVar237._12_4_;
      pfVar6 = (float *)(lVar135 + lVar22 * (uVar129 + 1));
      pfVar7 = (float *)(lVar135 + lVar22 * (uVar129 + 2));
      pfVar8 = (float *)(lVar135 + lVar22 * uVar126);
      uVar17 = (uint)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar22 = (long)(int)uVar17 * 0x44;
      local_710 = (undefined1  [8])
                  CONCAT44(fVar328 * pfVar1[1] + fVar206 * pfVar5[1],
                           fVar207 * *pfVar1 + fVar324 * *pfVar5);
      uStack_708._0_4_ = fVar211 * pfVar1[2] + fVar208 * pfVar5[2];
      uStack_708._4_4_ = fVar194 * pfVar1[3] + fVar209 * pfVar5[3];
      local_5d0 = (undefined1  [8])
                  CONCAT44(fVar206 * pfVar6[1] + fVar328 * pfVar2[1],
                           fVar324 * *pfVar6 + fVar207 * *pfVar2);
      uStack_5c8._0_4_ = fVar208 * pfVar6[2] + fVar211 * pfVar2[2];
      uStack_5c8._4_4_ = fVar209 * pfVar6[3] + fVar194 * pfVar2[3];
      local_5e0 = (undefined1  [8])
                  CONCAT44(fVar206 * pfVar7[1] + fVar328 * pfVar3[1],
                           fVar324 * *pfVar7 + fVar207 * *pfVar3);
      uStack_5d8._0_4_ = fVar208 * pfVar7[2] + fVar211 * pfVar3[2];
      uStack_5d8._4_4_ = fVar209 * pfVar7[3] + fVar194 * pfVar3[3];
      local_5f0 = (undefined1  [8])
                  CONCAT44(fVar206 * pfVar8[1] + fVar328 * pfVar4[1],
                           fVar324 * *pfVar8 + fVar207 * *pfVar4);
      uStack_5e8._0_4_ = fVar208 * pfVar8[2] + fVar211 * pfVar4[2];
      uStack_5e8._4_4_ = fVar209 * pfVar8[3] + fVar194 * pfVar4[3];
      auVar237 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar198 = vinsertps_avx(auVar237,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar221 = vsubps_avx(_local_710,auVar198);
      auVar237 = vshufps_avx(auVar221,auVar221,0);
      auVar186 = vshufps_avx(auVar221,auVar221,0x55);
      auVar221 = vshufps_avx(auVar221,auVar221,0xaa);
      fVar324 = (local_530->vx).field_0.m128[0];
      fVar207 = (local_530->vx).field_0.m128[1];
      fVar328 = (local_530->vx).field_0.m128[2];
      fVar211 = (local_530->vx).field_0.m128[3];
      fVar194 = (local_530->vy).field_0.m128[0];
      fVar206 = (local_530->vy).field_0.m128[1];
      fVar208 = (local_530->vy).field_0.m128[2];
      fVar209 = (local_530->vy).field_0.m128[3];
      fVar216 = (local_530->vz).field_0.m128[0];
      fVar228 = (local_530->vz).field_0.m128[1];
      fVar230 = (local_530->vz).field_0.m128[2];
      fVar232 = (local_530->vz).field_0.m128[3];
      auVar197._0_8_ =
           CONCAT44(auVar237._4_4_ * fVar207 + auVar186._4_4_ * fVar206 + fVar228 * auVar221._4_4_,
                    auVar237._0_4_ * fVar324 + auVar186._0_4_ * fVar194 + fVar216 * auVar221._0_4_);
      auVar197._8_4_ =
           auVar237._8_4_ * fVar328 + auVar186._8_4_ * fVar208 + fVar230 * auVar221._8_4_;
      auVar197._12_4_ =
           auVar237._12_4_ * fVar211 + auVar186._12_4_ * fVar209 + fVar232 * auVar221._12_4_;
      auVar237 = vblendps_avx(auVar197,_local_710,8);
      auVar24 = vsubps_avx(_local_5d0,auVar198);
      auVar186 = vshufps_avx(auVar24,auVar24,0);
      auVar221 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar273._0_4_ = auVar186._0_4_ * fVar324 + auVar221._0_4_ * fVar194 + fVar216 * auVar24._0_4_
      ;
      auVar273._4_4_ = auVar186._4_4_ * fVar207 + auVar221._4_4_ * fVar206 + fVar228 * auVar24._4_4_
      ;
      auVar273._8_4_ = auVar186._8_4_ * fVar328 + auVar221._8_4_ * fVar208 + fVar230 * auVar24._8_4_
      ;
      auVar273._12_4_ =
           auVar186._12_4_ * fVar211 + auVar221._12_4_ * fVar209 + fVar232 * auVar24._12_4_;
      auVar186 = vblendps_avx(auVar273,_local_5d0,8);
      auVar25 = vsubps_avx(_local_5e0,auVar198);
      auVar221 = vshufps_avx(auVar25,auVar25,0);
      auVar24 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar280._0_4_ = auVar221._0_4_ * fVar324 + auVar24._0_4_ * fVar194 + auVar25._0_4_ * fVar216;
      auVar280._4_4_ = auVar221._4_4_ * fVar207 + auVar24._4_4_ * fVar206 + auVar25._4_4_ * fVar228;
      auVar280._8_4_ = auVar221._8_4_ * fVar328 + auVar24._8_4_ * fVar208 + auVar25._8_4_ * fVar230;
      auVar280._12_4_ =
           auVar221._12_4_ * fVar211 + auVar24._12_4_ * fVar209 + auVar25._12_4_ * fVar232;
      auVar221 = vblendps_avx(auVar280,_local_5e0,8);
      auVar25 = vsubps_avx(_local_5f0,auVar198);
      auVar198 = vshufps_avx(auVar25,auVar25,0);
      auVar24 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar166._0_4_ = auVar198._0_4_ * fVar324 + auVar24._0_4_ * fVar194 + fVar216 * auVar25._0_4_;
      auVar166._4_4_ = auVar198._4_4_ * fVar207 + auVar24._4_4_ * fVar206 + fVar228 * auVar25._4_4_;
      auVar166._8_4_ = auVar198._8_4_ * fVar328 + auVar24._8_4_ * fVar208 + fVar230 * auVar25._8_4_;
      auVar166._12_4_ =
           auVar198._12_4_ * fVar211 + auVar24._12_4_ * fVar209 + fVar232 * auVar25._12_4_;
      auVar198 = vblendps_avx(auVar166,_local_5f0,8);
      auVar220._8_4_ = 0x7fffffff;
      auVar220._0_8_ = 0x7fffffff7fffffff;
      auVar220._12_4_ = 0x7fffffff;
      auVar237 = vandps_avx(auVar237,auVar220);
      auVar186 = vandps_avx(auVar186,auVar220);
      auVar24 = vmaxps_avx(auVar237,auVar186);
      auVar237 = vandps_avx(auVar221,auVar220);
      auVar186 = vandps_avx(auVar198,auVar220);
      auVar237 = vmaxps_avx(auVar237,auVar186);
      auVar237 = vmaxps_avx(auVar24,auVar237);
      auVar186 = vmovshdup_avx(auVar237);
      auVar186 = vmaxss_avx(auVar186,auVar237);
      auVar237 = vshufpd_avx(auVar237,auVar237,1);
      auVar237 = vmaxss_avx(auVar237,auVar186);
      fVar209 = *(float *)(bspline_basis0 + lVar22 + 0x908);
      fVar216 = *(float *)(bspline_basis0 + lVar22 + 0x90c);
      fVar228 = *(float *)(bspline_basis0 + lVar22 + 0x910);
      fVar230 = *(float *)(bspline_basis0 + lVar22 + 0x914);
      fVar232 = *(float *)(bspline_basis0 + lVar22 + 0x918);
      fVar235 = *(float *)(bspline_basis0 + lVar22 + 0x91c);
      fVar245 = *(float *)(bspline_basis0 + lVar22 + 0x920);
      auVar186 = vshufps_avx(auVar280,auVar280,0);
      register0x00001250 = auVar186;
      _local_620 = auVar186;
      auVar221 = vshufps_avx(auVar280,auVar280,0x55);
      register0x00001290 = auVar221;
      _local_780 = auVar221;
      fVar324 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      fVar207 = *(float *)(bspline_basis0 + lVar22 + 0xd90);
      fVar328 = *(float *)(bspline_basis0 + lVar22 + 0xd94);
      fVar211 = *(float *)(bspline_basis0 + lVar22 + 0xd98);
      fVar194 = *(float *)(bspline_basis0 + lVar22 + 0xd9c);
      fVar206 = *(float *)(bspline_basis0 + lVar22 + 0xda0);
      fVar208 = *(float *)(bspline_basis0 + lVar22 + 0xda4);
      auVar119 = *(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      auVar198 = vshufps_avx(auVar166,auVar166,0);
      register0x00001210 = auVar198;
      _local_4e0 = auVar198;
      fVar155 = auVar198._0_4_;
      fVar157 = auVar198._4_4_;
      fVar159 = auVar198._8_4_;
      fVar161 = auVar198._12_4_;
      fVar162 = auVar186._0_4_;
      fVar234 = auVar186._4_4_;
      fVar178 = auVar186._8_4_;
      fVar251 = auVar186._12_4_;
      auVar186 = vshufps_avx(auVar166,auVar166,0x55);
      fVar323 = auVar186._0_4_;
      fVar327 = auVar186._4_4_;
      fVar329 = auVar186._8_4_;
      fVar330 = auVar186._12_4_;
      fVar179 = auVar221._0_4_;
      fVar191 = auVar221._4_4_;
      fVar192 = auVar221._8_4_;
      fVar193 = auVar221._12_4_;
      auVar186 = vshufps_avx(_local_5e0,_local_5e0,0xff);
      register0x00001450 = auVar186;
      _local_80 = auVar186;
      auVar221 = vshufps_avx(_local_5f0,_local_5f0,0xff);
      register0x00001390 = auVar221;
      _local_120 = auVar221;
      fVar250 = auVar221._0_4_;
      fVar176 = auVar221._4_4_;
      fVar260 = auVar221._8_4_;
      fVar262 = auVar221._12_4_;
      fVar296 = auVar186._0_4_;
      fVar301 = auVar186._4_4_;
      fVar302 = auVar186._8_4_;
      auVar221 = vshufps_avx(auVar273,auVar273,0);
      auVar222._16_16_ = auVar221;
      auVar222._0_16_ = auVar221;
      fVar246 = *(float *)(bspline_basis0 + lVar22 + 0x484);
      fVar247 = *(float *)(bspline_basis0 + lVar22 + 0x488);
      fVar319 = *(float *)(bspline_basis0 + lVar22 + 0x48c);
      fVar285 = *(float *)(bspline_basis0 + lVar22 + 0x490);
      fVar287 = *(float *)(bspline_basis0 + lVar22 + 0x494);
      fVar210 = *(float *)(bspline_basis0 + lVar22 + 0x498);
      fVar320 = *(float *)(bspline_basis0 + lVar22 + 0x49c);
      fVar217 = auVar221._0_4_;
      fVar229 = auVar221._4_4_;
      fVar231 = auVar221._8_4_;
      fVar233 = auVar221._12_4_;
      auVar221 = vshufps_avx(auVar273,auVar273,0x55);
      fVar354 = auVar221._0_4_;
      fVar357 = auVar221._4_4_;
      fVar358 = auVar221._8_4_;
      fVar359 = auVar221._12_4_;
      auVar221 = vshufps_avx(_local_5d0,_local_5d0,0xff);
      register0x00001590 = auVar221;
      _local_a0 = auVar221;
      fVar345 = auVar221._0_4_;
      fVar348 = auVar221._4_4_;
      fVar350 = auVar221._8_4_;
      fVar352 = auVar221._12_4_;
      auVar111._8_4_ = auVar197._8_4_;
      auVar111._0_8_ = auVar197._0_8_;
      auVar111._12_4_ = auVar197._12_4_;
      auVar221 = vshufps_avx(auVar111,auVar111,0);
      register0x00001350 = auVar221;
      _local_4a0 = auVar221;
      pauVar9 = (undefined1 (*) [16])(bspline_basis0 + lVar22);
      fVar289 = *(float *)*pauVar9;
      fVar291 = *(float *)(bspline_basis0 + lVar22 + 4);
      fVar212 = *(float *)(bspline_basis0 + lVar22 + 8);
      auVar120 = *(undefined1 (*) [12])*pauVar9;
      fVar321 = *(float *)(bspline_basis0 + lVar22 + 0xc);
      fStack_330 = *(float *)(bspline_basis0 + lVar22 + 0x10);
      fStack_32c = *(float *)(bspline_basis0 + lVar22 + 0x14);
      fStack_328 = *(float *)(bspline_basis0 + lVar22 + 0x18);
      uStack_324 = *(undefined4 *)(bspline_basis0 + lVar22 + 0x1c);
      fVar265 = auVar221._0_4_;
      fVar266 = auVar221._4_4_;
      fVar267 = auVar221._8_4_;
      fVar248 = auVar221._12_4_;
      auVar274._0_4_ = fVar265 * fVar289 + fVar217 * fVar246 + fVar162 * fVar209 + fVar155 * fVar324
      ;
      auVar274._4_4_ = fVar266 * fVar291 + fVar229 * fVar247 + fVar234 * fVar216 + fVar157 * fVar207
      ;
      auVar274._8_4_ = fVar267 * fVar212 + fVar231 * fVar319 + fVar178 * fVar228 + fVar159 * fVar328
      ;
      auVar274._12_4_ =
           fVar248 * fVar321 + fVar233 * fVar285 + fVar251 * fVar230 + fVar161 * fVar211;
      auVar274._16_4_ =
           fVar265 * fStack_330 + fVar217 * fVar287 + fVar162 * fVar232 + fVar155 * fVar194;
      auVar274._20_4_ =
           fVar266 * fStack_32c + fVar229 * fVar210 + fVar234 * fVar235 + fVar157 * fVar206;
      auVar274._24_4_ =
           fVar267 * fStack_328 + fVar231 * fVar320 + fVar178 * fVar245 + fVar159 * fVar208;
      auVar274._28_4_ = fVar248 + fVar251 + fVar161 + 0.0;
      auVar221 = vshufps_avx(auVar111,auVar111,0x55);
      register0x00001290 = auVar221;
      _local_100 = auVar221;
      fVar259 = auVar221._0_4_;
      fVar261 = auVar221._4_4_;
      fVar263 = auVar221._8_4_;
      fVar264 = auVar221._12_4_;
      auVar332._0_4_ = fVar259 * fVar289 + fVar354 * fVar246 + fVar179 * fVar209 + fVar323 * fVar324
      ;
      auVar332._4_4_ = fVar261 * fVar291 + fVar357 * fVar247 + fVar191 * fVar216 + fVar327 * fVar207
      ;
      auVar332._8_4_ = fVar263 * fVar212 + fVar358 * fVar319 + fVar192 * fVar228 + fVar329 * fVar328
      ;
      auVar332._12_4_ =
           fVar264 * fVar321 + fVar359 * fVar285 + fVar193 * fVar230 + fVar330 * fVar211;
      auVar332._16_4_ =
           fVar259 * fStack_330 + fVar354 * fVar287 + fVar179 * fVar232 + fVar323 * fVar194;
      auVar332._20_4_ =
           fVar261 * fStack_32c + fVar357 * fVar210 + fVar191 * fVar235 + fVar327 * fVar206;
      auVar332._24_4_ =
           fVar263 * fStack_328 + fVar358 * fVar320 + fVar192 * fVar245 + fVar329 * fVar208;
      auVar332._28_4_ = fVar193 + 0.0 + 0.0 + 0.0;
      auVar221 = vpermilps_avx(_local_710,0xff);
      register0x00001490 = auVar221;
      _local_c0 = auVar221;
      fVar304 = auVar221._0_4_;
      fVar312 = auVar221._4_4_;
      fVar315 = auVar221._8_4_;
      auVar143._0_4_ = fVar345 * fVar246 + fVar296 * fVar209 + fVar250 * fVar324 + fVar304 * fVar289
      ;
      auVar143._4_4_ = fVar348 * fVar247 + fVar301 * fVar216 + fVar176 * fVar207 + fVar312 * fVar291
      ;
      auVar143._8_4_ = fVar350 * fVar319 + fVar302 * fVar228 + fVar260 * fVar328 + fVar315 * fVar212
      ;
      auVar143._12_4_ =
           fVar352 * fVar285 + auVar186._12_4_ * fVar230 + fVar262 * fVar211 +
           auVar221._12_4_ * fVar321;
      auVar143._16_4_ =
           fVar345 * fVar287 + fVar296 * fVar232 + fVar250 * fVar194 + fVar304 * fStack_330;
      auVar143._20_4_ =
           fVar348 * fVar210 + fVar301 * fVar235 + fVar176 * fVar206 + fVar312 * fStack_32c;
      auVar143._24_4_ =
           fVar350 * fVar320 + fVar302 * fVar245 + fVar260 * fVar208 + fVar315 * fStack_328;
      auVar143._28_4_ = 0;
      fVar289 = *(float *)(bspline_basis1 + lVar22 + 0x908);
      fVar291 = *(float *)(bspline_basis1 + lVar22 + 0x90c);
      fVar212 = *(float *)(bspline_basis1 + lVar22 + 0x910);
      fVar293 = *(float *)(bspline_basis1 + lVar22 + 0x914);
      fVar295 = *(float *)(bspline_basis1 + lVar22 + 0x918);
      fVar213 = *(float *)(bspline_basis1 + lVar22 + 0x91c);
      fVar322 = *(float *)(bspline_basis1 + lVar22 + 0x920);
      auVar13 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0xd8c);
      auVar283 = ZEXT3264(auVar13);
      fVar276 = auVar13._0_4_;
      fVar284 = auVar13._4_4_;
      fVar286 = auVar13._8_4_;
      fVar288 = auVar13._12_4_;
      fVar290 = auVar13._16_4_;
      fVar292 = auVar13._20_4_;
      fVar294 = auVar13._24_4_;
      fVar314 = *(float *)(bspline_basis1 + lVar22 + 0x484);
      fVar317 = *(float *)(bspline_basis1 + lVar22 + 0x488);
      fVar214 = *(float *)(bspline_basis1 + lVar22 + 0x48c);
      fVar215 = *(float *)(bspline_basis1 + lVar22 + 0x490);
      fVar136 = *(float *)(bspline_basis1 + lVar22 + 0x494);
      fVar151 = *(float *)(bspline_basis1 + lVar22 + 0x498);
      fVar177 = *(float *)(bspline_basis1 + lVar22 + 0x49c);
      fVar154 = *(float *)(bspline_basis1 + lVar22);
      fVar156 = *(float *)(bspline_basis1 + lVar22 + 4);
      fVar158 = *(float *)(bspline_basis1 + lVar22 + 8);
      fVar160 = *(float *)(bspline_basis1 + lVar22 + 0xc);
      fVar137 = *(float *)(bspline_basis1 + lVar22 + 0x10);
      fVar152 = *(float *)(bspline_basis1 + lVar22 + 0x14);
      fVar153 = *(float *)(bspline_basis1 + lVar22 + 0x18);
      auVar223._0_4_ = fVar265 * fVar154 + fVar217 * fVar314 + fVar289 * fVar162 + fVar276 * fVar155
      ;
      auVar223._4_4_ = fVar266 * fVar156 + fVar229 * fVar317 + fVar291 * fVar234 + fVar284 * fVar157
      ;
      auVar223._8_4_ = fVar267 * fVar158 + fVar231 * fVar214 + fVar212 * fVar178 + fVar286 * fVar159
      ;
      auVar223._12_4_ =
           fVar248 * fVar160 + fVar233 * fVar215 + fVar293 * fVar251 + fVar288 * fVar161;
      auVar223._16_4_ =
           fVar265 * fVar137 + fVar217 * fVar136 + fVar295 * fVar162 + fVar290 * fVar155;
      auVar223._20_4_ =
           fVar266 * fVar152 + fVar229 * fVar151 + fVar213 * fVar234 + fVar292 * fVar157;
      auVar223._24_4_ =
           fVar267 * fVar153 + fVar231 * fVar177 + fVar322 * fVar178 + fVar294 * fVar159;
      auVar223._28_4_ = fVar352 + fVar248 + 0.0 + 0.0;
      auVar199._0_4_ = fVar259 * fVar154 + fVar354 * fVar314 + fVar289 * fVar179 + fVar323 * fVar276
      ;
      auVar199._4_4_ = fVar261 * fVar156 + fVar357 * fVar317 + fVar291 * fVar191 + fVar327 * fVar284
      ;
      auVar199._8_4_ = fVar263 * fVar158 + fVar358 * fVar214 + fVar212 * fVar192 + fVar329 * fVar286
      ;
      auVar199._12_4_ =
           fVar264 * fVar160 + fVar359 * fVar215 + fVar293 * fVar193 + fVar330 * fVar288;
      auVar199._16_4_ =
           fVar259 * fVar137 + fVar354 * fVar136 + fVar295 * fVar179 + fVar323 * fVar290;
      auVar199._20_4_ =
           fVar261 * fVar152 + fVar357 * fVar151 + fVar213 * fVar191 + fVar327 * fVar292;
      auVar199._24_4_ =
           fVar263 * fVar153 + fVar358 * fVar177 + fVar322 * fVar192 + fVar329 * fVar294;
      auVar199._28_4_ = fVar264 + fVar248 + 0.0 + 0.0;
      local_760._0_4_ =
           fVar345 * fVar314 + fVar296 * fVar289 + fVar276 * fVar250 + fVar304 * fVar154;
      local_760._4_4_ =
           fVar348 * fVar317 + fVar301 * fVar291 + fVar284 * fVar176 + fVar312 * fVar156;
      local_760._8_4_ =
           fVar350 * fVar214 + fVar302 * fVar212 + fVar286 * fVar260 + fVar315 * fVar158;
      local_760._12_4_ =
           fVar352 * fVar215 + auVar186._12_4_ * fVar293 + fVar288 * fVar262 +
           auVar221._12_4_ * fVar160;
      local_760._16_4_ =
           fVar345 * fVar136 + fVar296 * fVar295 + fVar290 * fVar250 + fVar304 * fVar137;
      local_760._20_4_ =
           fVar348 * fVar151 + fVar301 * fVar213 + fVar292 * fVar176 + fVar312 * fVar152;
      local_760._24_4_ =
           fVar350 * fVar177 + fVar302 * fVar322 + fVar294 * fVar260 + fVar315 * fVar153;
      local_760._28_4_ = fVar262 + fVar248 + 0.0 + fVar264;
      auVar32 = vsubps_avx(auVar223,auVar274);
      auVar33 = vsubps_avx(auVar199,auVar332);
      fVar324 = auVar32._0_4_;
      fVar207 = auVar32._4_4_;
      auVar23._4_4_ = auVar332._4_4_ * fVar207;
      auVar23._0_4_ = auVar332._0_4_ * fVar324;
      fVar328 = auVar32._8_4_;
      auVar23._8_4_ = auVar332._8_4_ * fVar328;
      fVar211 = auVar32._12_4_;
      auVar23._12_4_ = auVar332._12_4_ * fVar211;
      fVar194 = auVar32._16_4_;
      auVar23._16_4_ = auVar332._16_4_ * fVar194;
      fVar206 = auVar32._20_4_;
      auVar23._20_4_ = auVar332._20_4_ * fVar206;
      fVar208 = auVar32._24_4_;
      auVar23._24_4_ = auVar332._24_4_ * fVar208;
      auVar23._28_4_ = fVar264;
      fVar250 = auVar33._0_4_;
      fVar176 = auVar33._4_4_;
      auVar242._4_4_ = fVar176 * auVar274._4_4_;
      auVar242._0_4_ = fVar250 * auVar274._0_4_;
      fVar260 = auVar33._8_4_;
      auVar242._8_4_ = fVar260 * auVar274._8_4_;
      fVar262 = auVar33._12_4_;
      auVar242._12_4_ = fVar262 * auVar274._12_4_;
      fVar296 = auVar33._16_4_;
      auVar242._16_4_ = fVar296 * auVar274._16_4_;
      fVar301 = auVar33._20_4_;
      auVar242._20_4_ = fVar301 * auVar274._20_4_;
      fVar302 = auVar33._24_4_;
      auVar242._24_4_ = fVar302 * auVar274._24_4_;
      auVar242._28_4_ = auVar199._28_4_;
      auVar242 = vsubps_avx(auVar23,auVar242);
      auVar23 = vmaxps_avx(auVar143,local_760);
      auVar40._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar207 * fVar207 + fVar176 * fVar176);
      auVar40._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar324 * fVar324 + fVar250 * fVar250);
      auVar40._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar328 * fVar328 + fVar260 * fVar260);
      auVar40._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar211 * fVar211 + fVar262 * fVar262);
      auVar40._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar194 * fVar194 + fVar296 * fVar296);
      auVar40._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar206 * fVar206 + fVar301 * fVar301);
      auVar40._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar208 * fVar208 + fVar302 * fVar302);
      auVar40._28_4_ = auVar223._28_4_ + auVar199._28_4_;
      auVar308._4_4_ = auVar242._4_4_ * auVar242._4_4_;
      auVar308._0_4_ = auVar242._0_4_ * auVar242._0_4_;
      auVar308._8_4_ = auVar242._8_4_ * auVar242._8_4_;
      auVar308._12_4_ = auVar242._12_4_ * auVar242._12_4_;
      auVar308._16_4_ = auVar242._16_4_ * auVar242._16_4_;
      auVar308._20_4_ = auVar242._20_4_ * auVar242._20_4_;
      auVar308._24_4_ = auVar242._24_4_ * auVar242._24_4_;
      auVar308._28_4_ = auVar242._28_4_;
      auVar23 = vcmpps_avx(auVar308,auVar40,2);
      auVar186 = ZEXT416((uint)(float)(int)uVar17);
      local_4c0._0_16_ = auVar186;
      auVar186 = vshufps_avx(auVar186,auVar186,0);
      auVar200._16_16_ = auVar186;
      auVar200._0_16_ = auVar186;
      auVar242 = vcmpps_avx(_DAT_01faff40,auVar200,1);
      auVar205 = ZEXT3264(auVar242);
      auVar112._8_4_ = auVar197._8_4_;
      auVar112._0_8_ = auVar197._0_8_;
      auVar112._12_4_ = auVar197._12_4_;
      auVar186 = vpermilps_avx(auVar112,0xaa);
      register0x00001490 = auVar186;
      _local_140 = auVar186;
      auVar221 = vpermilps_avx(auVar273,0xaa);
      register0x00001550 = auVar221;
      _local_500 = auVar221;
      auVar198 = vpermilps_avx(auVar280,0xaa);
      register0x00001590 = auVar198;
      _local_300 = auVar198;
      auVar24 = vpermilps_avx(auVar166,0xaa);
      register0x00001310 = auVar24;
      _local_320 = auVar24;
      auVar40 = auVar242 & auVar23;
      uVar128 = *(uint *)(ray + k * 4 + 0x30);
      auVar237 = ZEXT416((uint)(auVar237._0_4_ * 4.7683716e-07));
      _local_740 = auVar237;
      auVar308 = local_560;
      auVar200 = local_580;
      fVar324 = fVar179;
      fVar207 = fVar191;
      fVar328 = fVar192;
      fVar211 = fVar193;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar40 >> 0x7f,0) == '\0') &&
            (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar40 >> 0xbf,0) == '\0') &&
          (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar40[0x1f])
      {
LAB_00f498ec:
        uVar126 = 0;
      }
      else {
        local_360 = vandps_avx(auVar23,auVar242);
        fVar305 = auVar186._0_4_;
        fVar313 = auVar186._4_4_;
        fVar316 = auVar186._8_4_;
        fVar318 = auVar186._12_4_;
        fVar337 = auVar221._0_4_;
        fVar342 = auVar221._4_4_;
        fVar343 = auVar221._8_4_;
        fVar344 = auVar221._12_4_;
        fVar346 = auVar198._0_4_;
        fVar349 = auVar198._4_4_;
        fVar351 = auVar198._8_4_;
        fVar353 = auVar198._12_4_;
        fVar194 = auVar24._0_4_;
        fVar206 = auVar24._4_4_;
        fVar208 = auVar24._8_4_;
        fVar250 = auVar24._12_4_;
        fVar176 = auVar242._28_4_ +
                  *(float *)(bspline_basis1 + lVar22 + 0x924) +
                  *(float *)(bspline_basis1 + lVar22 + 0x4a0);
        local_380._0_4_ =
             fVar305 * fVar154 + fVar337 * fVar314 + fVar346 * fVar289 + fVar276 * fVar194;
        local_380._4_4_ =
             fVar313 * fVar156 + fVar342 * fVar317 + fVar349 * fVar291 + fVar284 * fVar206;
        fStack_378 = fVar316 * fVar158 + fVar343 * fVar214 + fVar351 * fVar212 + fVar286 * fVar208;
        fStack_374 = fVar318 * fVar160 + fVar344 * fVar215 + fVar353 * fVar293 + fVar288 * fVar250;
        fStack_370 = fVar305 * fVar137 + fVar337 * fVar136 + fVar346 * fVar295 + fVar290 * fVar194;
        fStack_36c = fVar313 * fVar152 + fVar342 * fVar151 + fVar349 * fVar213 + fVar292 * fVar206;
        fStack_368 = fVar316 * fVar153 + fVar343 * fVar177 + fVar351 * fVar322 + fVar294 * fVar208;
        fStack_364 = local_360._28_4_ + fVar176;
        local_340._0_4_ = auVar120._0_4_;
        local_340._4_4_ = auVar120._4_4_;
        fStack_338 = auVar120._8_4_;
        local_6a0._0_4_ = auVar119._0_4_;
        local_6a0._4_4_ = auVar119._4_4_;
        fStack_698 = auVar119._8_4_;
        fStack_694 = auVar119._12_4_;
        fStack_690 = auVar119._16_4_;
        fStack_68c = auVar119._20_4_;
        fStack_688 = auVar119._24_4_;
        local_680 = fVar305 * (float)local_340._0_4_ +
                    fVar337 * fVar246 + fVar346 * fVar209 + fVar194 * (float)local_6a0._0_4_;
        fStack_67c = fVar313 * (float)local_340._4_4_ +
                     fVar342 * fVar247 + fVar349 * fVar216 + fVar206 * (float)local_6a0._4_4_;
        fStack_678 = fVar316 * fStack_338 +
                     fVar343 * fVar319 + fVar351 * fVar228 + fVar208 * fStack_698;
        fStack_674 = fVar318 * fVar321 +
                     fVar344 * fVar285 + fVar353 * fVar230 + fVar250 * fStack_694;
        fStack_670 = fVar305 * fStack_330 +
                     fVar337 * fVar287 + fVar346 * fVar232 + fVar194 * fStack_690;
        fStack_66c = fVar313 * fStack_32c +
                     fVar342 * fVar210 + fVar349 * fVar235 + fVar206 * fStack_68c;
        fStack_668 = fVar316 * fStack_328 +
                     fVar343 * fVar320 + fVar351 * fVar245 + fVar208 * fStack_688;
        fStack_664 = fStack_364 + fVar176 + local_360._28_4_ + auVar242._28_4_;
        fVar209 = *(float *)(bspline_basis0 + lVar22 + 0x1210);
        fVar216 = *(float *)(bspline_basis0 + lVar22 + 0x1214);
        fVar228 = *(float *)(bspline_basis0 + lVar22 + 0x1218);
        fVar230 = *(float *)(bspline_basis0 + lVar22 + 0x121c);
        fVar232 = *(float *)(bspline_basis0 + lVar22 + 0x1220);
        fVar235 = *(float *)(bspline_basis0 + lVar22 + 0x1224);
        fVar245 = *(float *)(bspline_basis0 + lVar22 + 0x1228);
        fVar246 = *(float *)(bspline_basis0 + lVar22 + 0x1694);
        fVar247 = *(float *)(bspline_basis0 + lVar22 + 0x1698);
        fVar319 = *(float *)(bspline_basis0 + lVar22 + 0x169c);
        fVar285 = *(float *)(bspline_basis0 + lVar22 + 0x16a0);
        fVar287 = *(float *)(bspline_basis0 + lVar22 + 0x16a4);
        fVar210 = *(float *)(bspline_basis0 + lVar22 + 0x16a8);
        fVar320 = *(float *)(bspline_basis0 + lVar22 + 0x16ac);
        fVar289 = *(float *)(bspline_basis0 + lVar22 + 0x1b18);
        fVar291 = *(float *)(bspline_basis0 + lVar22 + 0x1b1c);
        fVar212 = *(float *)(bspline_basis0 + lVar22 + 0x1b20);
        fVar321 = *(float *)(bspline_basis0 + lVar22 + 0x1b24);
        fVar293 = *(float *)(bspline_basis0 + lVar22 + 0x1b28);
        fVar295 = *(float *)(bspline_basis0 + lVar22 + 0x1b2c);
        fVar213 = *(float *)(bspline_basis0 + lVar22 + 0x1b30);
        fVar322 = *(float *)(bspline_basis0 + lVar22 + 0x1f9c);
        fVar314 = *(float *)(bspline_basis0 + lVar22 + 0x1fa0);
        fVar317 = *(float *)(bspline_basis0 + lVar22 + 0x1fa4);
        fVar214 = *(float *)(bspline_basis0 + lVar22 + 0x1fa8);
        fVar215 = *(float *)(bspline_basis0 + lVar22 + 0x1fac);
        fVar136 = *(float *)(bspline_basis0 + lVar22 + 0x1fb0);
        fVar151 = *(float *)(bspline_basis0 + lVar22 + 0x1fb4);
        fVar249 = *(float *)(bspline_basis1 + lVar22 + 0x4a0) + 0.0;
        fVar177 = *(float *)(bspline_basis0 + lVar22 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar22 + 0x1fb8);
        fVar303 = *(float *)(bspline_basis0 + lVar22 + 0x16b0) + fVar177;
        auVar170._0_4_ =
             fVar259 * fVar209 + fVar179 * fVar289 + fVar322 * fVar323 + fVar354 * fVar246;
        auVar170._4_4_ =
             fVar261 * fVar216 + fVar191 * fVar291 + fVar314 * fVar327 + fVar357 * fVar247;
        auVar170._8_4_ =
             fVar263 * fVar228 + fVar192 * fVar212 + fVar317 * fVar329 + fVar358 * fVar319;
        auVar170._12_4_ =
             fVar264 * fVar230 + fVar193 * fVar321 + fVar214 * fVar330 + fVar359 * fVar285;
        auVar170._16_4_ =
             fVar259 * fVar232 + fVar179 * fVar293 + fVar215 * fVar323 + fVar354 * fVar287;
        auVar170._20_4_ =
             fVar261 * fVar235 + fVar191 * fVar295 + fVar136 * fVar327 + fVar357 * fVar210;
        auVar170._24_4_ =
             fVar263 * fVar245 + fVar192 * fVar213 + fVar151 * fVar329 + fVar358 * fVar320;
        auVar170._28_4_ = fVar177 + auVar13._28_4_ + 0.0 + fVar249;
        auVar238._0_4_ =
             fVar337 * fVar246 + fVar346 * fVar289 + fVar194 * fVar322 + fVar305 * fVar209;
        auVar238._4_4_ =
             fVar342 * fVar247 + fVar349 * fVar291 + fVar206 * fVar314 + fVar313 * fVar216;
        auVar238._8_4_ =
             fVar343 * fVar319 + fVar351 * fVar212 + fVar208 * fVar317 + fVar316 * fVar228;
        auVar238._12_4_ =
             fVar344 * fVar285 + fVar353 * fVar321 + fVar250 * fVar214 + fVar318 * fVar230;
        auVar238._16_4_ =
             fVar337 * fVar287 + fVar346 * fVar293 + fVar194 * fVar215 + fVar305 * fVar232;
        auVar238._20_4_ =
             fVar342 * fVar210 + fVar349 * fVar295 + fVar206 * fVar136 + fVar313 * fVar235;
        auVar238._24_4_ =
             fVar343 * fVar320 + fVar351 * fVar213 + fVar208 * fVar151 + fVar316 * fVar245;
        auVar238._28_4_ = fVar303 + *(float *)(bspline_basis0 + lVar22 + 0x122c);
        fVar177 = *(float *)(bspline_basis1 + lVar22 + 0x1b18);
        fVar154 = *(float *)(bspline_basis1 + lVar22 + 0x1b1c);
        fVar156 = *(float *)(bspline_basis1 + lVar22 + 0x1b20);
        fVar158 = *(float *)(bspline_basis1 + lVar22 + 0x1b24);
        fVar160 = *(float *)(bspline_basis1 + lVar22 + 0x1b28);
        fVar137 = *(float *)(bspline_basis1 + lVar22 + 0x1b2c);
        fVar152 = *(float *)(bspline_basis1 + lVar22 + 0x1b30);
        fVar153 = *(float *)(bspline_basis1 + lVar22 + 0x1f9c);
        fVar176 = *(float *)(bspline_basis1 + lVar22 + 0x1fa0);
        fVar260 = *(float *)(bspline_basis1 + lVar22 + 0x1fa4);
        fVar262 = *(float *)(bspline_basis1 + lVar22 + 0x1fa8);
        fVar276 = *(float *)(bspline_basis1 + lVar22 + 0x1fac);
        fVar284 = *(float *)(bspline_basis1 + lVar22 + 0x1fb0);
        fVar286 = *(float *)(bspline_basis1 + lVar22 + 0x1fb4);
        fVar288 = *(float *)(bspline_basis1 + lVar22 + 0x1694);
        fVar290 = *(float *)(bspline_basis1 + lVar22 + 0x1698);
        fVar292 = *(float *)(bspline_basis1 + lVar22 + 0x169c);
        fVar294 = *(float *)(bspline_basis1 + lVar22 + 0x16a0);
        fVar296 = *(float *)(bspline_basis1 + lVar22 + 0x16a4);
        fVar301 = *(float *)(bspline_basis1 + lVar22 + 0x16a8);
        fVar302 = *(float *)(bspline_basis1 + lVar22 + 0x16ac);
        fVar304 = *(float *)(bspline_basis1 + lVar22 + 0x1210);
        fVar312 = *(float *)(bspline_basis1 + lVar22 + 0x1214);
        fVar315 = *(float *)(bspline_basis1 + lVar22 + 0x1218);
        fVar345 = *(float *)(bspline_basis1 + lVar22 + 0x121c);
        fVar348 = *(float *)(bspline_basis1 + lVar22 + 0x1220);
        fVar350 = *(float *)(bspline_basis1 + lVar22 + 0x1224);
        fVar352 = *(float *)(bspline_basis1 + lVar22 + 0x1228);
        auVar254._0_4_ =
             fVar265 * fVar304 + fVar217 * fVar288 + fVar162 * fVar177 + fVar155 * fVar153;
        auVar254._4_4_ =
             fVar266 * fVar312 + fVar229 * fVar290 + fVar234 * fVar154 + fVar157 * fVar176;
        auVar254._8_4_ =
             fVar267 * fVar315 + fVar231 * fVar292 + fVar178 * fVar156 + fVar159 * fVar260;
        auVar254._12_4_ =
             fVar248 * fVar345 + fVar233 * fVar294 + fVar251 * fVar158 + fVar161 * fVar262;
        auVar254._16_4_ =
             fVar265 * fVar348 + fVar217 * fVar296 + fVar162 * fVar160 + fVar155 * fVar276;
        auVar254._20_4_ =
             fVar266 * fVar350 + fVar229 * fVar301 + fVar234 * fVar137 + fVar157 * fVar284;
        auVar254._24_4_ =
             fVar267 * fVar352 + fVar231 * fVar302 + fVar178 * fVar152 + fVar159 * fVar286;
        auVar254._28_4_ = fVar318 + fVar318 + fVar303 + fVar161;
        auVar298._0_4_ =
             fVar259 * fVar304 + fVar354 * fVar288 + fVar179 * fVar177 + fVar153 * fVar323;
        auVar298._4_4_ =
             fVar261 * fVar312 + fVar357 * fVar290 + fVar191 * fVar154 + fVar176 * fVar327;
        auVar298._8_4_ =
             fVar263 * fVar315 + fVar358 * fVar292 + fVar192 * fVar156 + fVar260 * fVar329;
        auVar298._12_4_ =
             fVar264 * fVar345 + fVar359 * fVar294 + fVar193 * fVar158 + fVar262 * fVar330;
        auVar298._16_4_ =
             fVar259 * fVar348 + fVar354 * fVar296 + fVar179 * fVar160 + fVar276 * fVar323;
        auVar298._20_4_ =
             fVar261 * fVar350 + fVar357 * fVar301 + fVar191 * fVar137 + fVar284 * fVar327;
        auVar298._24_4_ =
             fVar263 * fVar352 + fVar358 * fVar302 + fVar192 * fVar152 + fVar286 * fVar329;
        auVar298._28_4_ = fVar318 + fVar318 + fVar318 + fVar303;
        auVar189._0_4_ =
             fVar305 * fVar304 + fVar337 * fVar288 + fVar346 * fVar177 + fVar194 * fVar153;
        auVar189._4_4_ =
             fVar313 * fVar312 + fVar342 * fVar290 + fVar349 * fVar154 + fVar206 * fVar176;
        auVar189._8_4_ =
             fVar316 * fVar315 + fVar343 * fVar292 + fVar351 * fVar156 + fVar208 * fVar260;
        auVar189._12_4_ =
             fVar318 * fVar345 + fVar344 * fVar294 + fVar353 * fVar158 + fVar250 * fVar262;
        auVar189._16_4_ =
             fVar305 * fVar348 + fVar337 * fVar296 + fVar346 * fVar160 + fVar194 * fVar276;
        auVar189._20_4_ =
             fVar313 * fVar350 + fVar342 * fVar301 + fVar349 * fVar137 + fVar206 * fVar284;
        auVar189._24_4_ =
             fVar316 * fVar352 + fVar343 * fVar302 + fVar351 * fVar152 + fVar208 * fVar286;
        auVar189._28_4_ =
             *(float *)(bspline_basis1 + lVar22 + 0x122c) +
             *(float *)(bspline_basis1 + lVar22 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar22 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar22 + 0x1fb8);
        auVar224._8_4_ = 0x7fffffff;
        auVar224._0_8_ = 0x7fffffff7fffffff;
        auVar224._12_4_ = 0x7fffffff;
        auVar224._16_4_ = 0x7fffffff;
        auVar224._20_4_ = 0x7fffffff;
        auVar224._24_4_ = 0x7fffffff;
        auVar224._28_4_ = 0x7fffffff;
        auVar114._4_4_ =
             fVar266 * fVar216 + fVar229 * fVar247 + fVar234 * fVar291 + fVar157 * fVar314;
        auVar114._0_4_ =
             fVar265 * fVar209 + fVar217 * fVar246 + fVar162 * fVar289 + fVar155 * fVar322;
        auVar114._8_4_ =
             fVar267 * fVar228 + fVar231 * fVar319 + fVar178 * fVar212 + fVar159 * fVar317;
        auVar114._12_4_ =
             fVar248 * fVar230 + fVar233 * fVar285 + fVar251 * fVar321 + fVar161 * fVar214;
        auVar114._16_4_ =
             fVar265 * fVar232 + fVar217 * fVar287 + fVar162 * fVar293 + fVar155 * fVar215;
        auVar114._20_4_ =
             fVar266 * fVar235 + fVar229 * fVar210 + fVar234 * fVar295 + fVar157 * fVar136;
        auVar114._24_4_ =
             fVar267 * fVar245 + fVar231 * fVar320 + fVar178 * fVar213 + fVar159 * fVar151;
        auVar114._28_4_ =
             *(float *)(bspline_basis0 + lVar22 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar22 + 0x1fb8) + fVar249;
        auVar13 = vandps_avx(auVar114,auVar224);
        auVar23 = vandps_avx(auVar170,auVar224);
        auVar23 = vmaxps_avx(auVar13,auVar23);
        auVar13 = vandps_avx(auVar238,auVar224);
        auVar13 = vmaxps_avx(auVar23,auVar13);
        auVar237 = vpermilps_avx(auVar237,0);
        auVar239._16_16_ = auVar237;
        auVar239._0_16_ = auVar237;
        auVar13 = vcmpps_avx(auVar13,auVar239,1);
        auVar242 = vblendvps_avx(auVar114,auVar32,auVar13);
        auVar40 = vblendvps_avx(auVar170,auVar33,auVar13);
        auVar13 = vandps_avx(auVar254,auVar224);
        auVar23 = vandps_avx(auVar298,auVar224);
        auVar308 = vmaxps_avx(auVar13,auVar23);
        auVar13 = vandps_avx(auVar189,auVar224);
        auVar13 = vmaxps_avx(auVar308,auVar13);
        auVar308 = vcmpps_avx(auVar13,auVar239,1);
        auVar13 = vblendvps_avx(auVar254,auVar32,auVar308);
        auVar33 = vblendvps_avx(auVar298,auVar33,auVar308);
        fVar136 = auVar242._0_4_;
        fVar151 = auVar242._4_4_;
        fVar177 = auVar242._8_4_;
        fVar154 = auVar242._12_4_;
        fVar156 = auVar242._16_4_;
        fVar158 = auVar242._20_4_;
        fVar160 = auVar242._24_4_;
        fVar162 = -auVar242._28_4_;
        fVar137 = auVar13._0_4_;
        fVar152 = auVar13._4_4_;
        fVar153 = auVar13._8_4_;
        fVar155 = auVar13._12_4_;
        fVar157 = auVar13._16_4_;
        fVar159 = auVar13._20_4_;
        fVar161 = auVar13._24_4_;
        fVar194 = auVar40._0_4_;
        fVar216 = auVar40._4_4_;
        fVar235 = auVar40._8_4_;
        fVar319 = auVar40._12_4_;
        fVar320 = auVar40._16_4_;
        fVar321 = auVar40._20_4_;
        fVar322 = auVar40._24_4_;
        auVar144._0_4_ = fVar194 * fVar194 + fVar136 * fVar136;
        auVar144._4_4_ = fVar216 * fVar216 + fVar151 * fVar151;
        auVar144._8_4_ = fVar235 * fVar235 + fVar177 * fVar177;
        auVar144._12_4_ = fVar319 * fVar319 + fVar154 * fVar154;
        auVar144._16_4_ = fVar320 * fVar320 + fVar156 * fVar156;
        auVar144._20_4_ = fVar321 * fVar321 + fVar158 * fVar158;
        auVar144._24_4_ = fVar322 * fVar322 + fVar160 * fVar160;
        auVar144._28_4_ = auVar298._28_4_ + auVar242._28_4_;
        auVar242 = vrsqrtps_avx(auVar144);
        fVar206 = auVar242._0_4_;
        fVar208 = auVar242._4_4_;
        auVar36._4_4_ = fVar208 * 1.5;
        auVar36._0_4_ = fVar206 * 1.5;
        fVar209 = auVar242._8_4_;
        auVar36._8_4_ = fVar209 * 1.5;
        fVar228 = auVar242._12_4_;
        auVar36._12_4_ = fVar228 * 1.5;
        fVar230 = auVar242._16_4_;
        auVar36._16_4_ = fVar230 * 1.5;
        fVar232 = auVar242._20_4_;
        auVar36._20_4_ = fVar232 * 1.5;
        fVar245 = auVar242._24_4_;
        fVar215 = auVar23._28_4_;
        auVar36._24_4_ = fVar245 * 1.5;
        auVar36._28_4_ = fVar215;
        auVar37._4_4_ = fVar208 * fVar208 * fVar208 * auVar144._4_4_ * 0.5;
        auVar37._0_4_ = fVar206 * fVar206 * fVar206 * auVar144._0_4_ * 0.5;
        auVar37._8_4_ = fVar209 * fVar209 * fVar209 * auVar144._8_4_ * 0.5;
        auVar37._12_4_ = fVar228 * fVar228 * fVar228 * auVar144._12_4_ * 0.5;
        auVar37._16_4_ = fVar230 * fVar230 * fVar230 * auVar144._16_4_ * 0.5;
        auVar37._20_4_ = fVar232 * fVar232 * fVar232 * auVar144._20_4_ * 0.5;
        auVar37._24_4_ = fVar245 * fVar245 * fVar245 * auVar144._24_4_ * 0.5;
        auVar37._28_4_ = auVar144._28_4_;
        auVar23 = vsubps_avx(auVar36,auVar37);
        fVar206 = auVar23._0_4_;
        fVar228 = auVar23._4_4_;
        fVar245 = auVar23._8_4_;
        fVar285 = auVar23._12_4_;
        fVar289 = auVar23._16_4_;
        fVar293 = auVar23._20_4_;
        fVar314 = auVar23._24_4_;
        fVar208 = auVar33._0_4_;
        fVar230 = auVar33._4_4_;
        fVar246 = auVar33._8_4_;
        fVar287 = auVar33._12_4_;
        fVar291 = auVar33._16_4_;
        fVar295 = auVar33._20_4_;
        fVar317 = auVar33._24_4_;
        auVar145._0_4_ = fVar208 * fVar208 + fVar137 * fVar137;
        auVar145._4_4_ = fVar230 * fVar230 + fVar152 * fVar152;
        auVar145._8_4_ = fVar246 * fVar246 + fVar153 * fVar153;
        auVar145._12_4_ = fVar287 * fVar287 + fVar155 * fVar155;
        auVar145._16_4_ = fVar291 * fVar291 + fVar157 * fVar157;
        auVar145._20_4_ = fVar295 * fVar295 + fVar159 * fVar159;
        auVar145._24_4_ = fVar317 * fVar317 + fVar161 * fVar161;
        auVar145._28_4_ = auVar13._28_4_ + auVar23._28_4_;
        auVar13 = vrsqrtps_avx(auVar145);
        fVar209 = auVar13._0_4_;
        fVar232 = auVar13._4_4_;
        auVar38._4_4_ = fVar232 * 1.5;
        auVar38._0_4_ = fVar209 * 1.5;
        fVar247 = auVar13._8_4_;
        auVar38._8_4_ = fVar247 * 1.5;
        fVar210 = auVar13._12_4_;
        auVar38._12_4_ = fVar210 * 1.5;
        fVar212 = auVar13._16_4_;
        auVar38._16_4_ = fVar212 * 1.5;
        fVar213 = auVar13._20_4_;
        auVar38._20_4_ = fVar213 * 1.5;
        fVar214 = auVar13._24_4_;
        auVar38._24_4_ = fVar214 * 1.5;
        auVar38._28_4_ = fVar215;
        auVar13._4_4_ = fVar232 * fVar232 * fVar232 * auVar145._4_4_ * 0.5;
        auVar13._0_4_ = fVar209 * fVar209 * fVar209 * auVar145._0_4_ * 0.5;
        auVar13._8_4_ = fVar247 * fVar247 * fVar247 * auVar145._8_4_ * 0.5;
        auVar13._12_4_ = fVar210 * fVar210 * fVar210 * auVar145._12_4_ * 0.5;
        auVar13._16_4_ = fVar212 * fVar212 * fVar212 * auVar145._16_4_ * 0.5;
        auVar13._20_4_ = fVar213 * fVar213 * fVar213 * auVar145._20_4_ * 0.5;
        auVar13._24_4_ = fVar214 * fVar214 * fVar214 * auVar145._24_4_ * 0.5;
        auVar13._28_4_ = auVar145._28_4_;
        auVar13 = vsubps_avx(auVar38,auVar13);
        fVar209 = auVar13._0_4_;
        fVar232 = auVar13._4_4_;
        fVar247 = auVar13._8_4_;
        fVar210 = auVar13._12_4_;
        fVar212 = auVar13._16_4_;
        fVar213 = auVar13._20_4_;
        fVar214 = auVar13._24_4_;
        fVar194 = auVar143._0_4_ * fVar194 * fVar206;
        fVar216 = auVar143._4_4_ * fVar216 * fVar228;
        auVar39._4_4_ = fVar216;
        auVar39._0_4_ = fVar194;
        fVar235 = auVar143._8_4_ * fVar235 * fVar245;
        auVar39._8_4_ = fVar235;
        fVar319 = auVar143._12_4_ * fVar319 * fVar285;
        auVar39._12_4_ = fVar319;
        fVar320 = auVar143._16_4_ * fVar320 * fVar289;
        auVar39._16_4_ = fVar320;
        fVar321 = auVar143._20_4_ * fVar321 * fVar293;
        auVar39._20_4_ = fVar321;
        fVar322 = auVar143._24_4_ * fVar322 * fVar314;
        auVar39._24_4_ = fVar322;
        auVar39._28_4_ = fVar215;
        local_6a0._4_4_ = fVar216 + auVar274._4_4_;
        local_6a0._0_4_ = fVar194 + auVar274._0_4_;
        fStack_698 = fVar235 + auVar274._8_4_;
        fStack_694 = fVar319 + auVar274._12_4_;
        fStack_690 = fVar320 + auVar274._16_4_;
        fStack_68c = fVar321 + auVar274._20_4_;
        fStack_688 = fVar322 + auVar274._24_4_;
        fStack_684 = fVar215 + auVar274._28_4_;
        local_6c0 = auVar143._0_4_ * fVar206 * -fVar136;
        fStack_6bc = auVar143._4_4_ * fVar228 * -fVar151;
        auVar34._4_4_ = fStack_6bc;
        auVar34._0_4_ = local_6c0;
        fStack_6b8 = auVar143._8_4_ * fVar245 * -fVar177;
        auVar34._8_4_ = fStack_6b8;
        fStack_6b4 = auVar143._12_4_ * fVar285 * -fVar154;
        auVar34._12_4_ = fStack_6b4;
        fStack_6b0 = auVar143._16_4_ * fVar289 * -fVar156;
        auVar34._16_4_ = fStack_6b0;
        fStack_6ac = auVar143._20_4_ * fVar293 * -fVar158;
        auVar34._20_4_ = fStack_6ac;
        fStack_6a8 = auVar143._24_4_ * fVar314 * -fVar160;
        auVar34._24_4_ = fStack_6a8;
        auVar34._28_4_ = fVar162;
        local_6c0 = auVar332._0_4_ + local_6c0;
        fStack_6bc = auVar332._4_4_ + fStack_6bc;
        fStack_6b8 = auVar332._8_4_ + fStack_6b8;
        fStack_6b4 = auVar332._12_4_ + fStack_6b4;
        fStack_6b0 = auVar332._16_4_ + fStack_6b0;
        fStack_6ac = auVar332._20_4_ + fStack_6ac;
        fStack_6a8 = auVar332._24_4_ + fStack_6a8;
        fStack_6a4 = auVar332._28_4_ + fVar162;
        fVar194 = fVar206 * 0.0 * auVar143._0_4_;
        fVar206 = fVar228 * 0.0 * auVar143._4_4_;
        auVar35._4_4_ = fVar206;
        auVar35._0_4_ = fVar194;
        fVar216 = fVar245 * 0.0 * auVar143._8_4_;
        auVar35._8_4_ = fVar216;
        fVar228 = fVar285 * 0.0 * auVar143._12_4_;
        auVar35._12_4_ = fVar228;
        fVar235 = fVar289 * 0.0 * auVar143._16_4_;
        auVar35._16_4_ = fVar235;
        fVar245 = fVar293 * 0.0 * auVar143._20_4_;
        auVar35._20_4_ = fVar245;
        fVar319 = fVar314 * 0.0 * auVar143._24_4_;
        auVar35._24_4_ = fVar319;
        auVar35._28_4_ = fVar344;
        auVar117._4_4_ = fStack_67c;
        auVar117._0_4_ = local_680;
        auVar117._8_4_ = fStack_678;
        auVar117._12_4_ = fStack_674;
        auVar117._16_4_ = fStack_670;
        auVar117._20_4_ = fStack_66c;
        auVar117._24_4_ = fStack_668;
        auVar117._28_4_ = fStack_664;
        auVar255._0_4_ = local_680 + fVar194;
        auVar255._4_4_ = fStack_67c + fVar206;
        auVar255._8_4_ = fStack_678 + fVar216;
        auVar255._12_4_ = fStack_674 + fVar228;
        auVar255._16_4_ = fStack_670 + fVar235;
        auVar255._20_4_ = fStack_66c + fVar245;
        auVar255._24_4_ = fStack_668 + fVar319;
        auVar255._28_4_ = fStack_664 + fVar344;
        fVar194 = (float)local_760._0_4_ * fVar208 * fVar209;
        fVar206 = local_760._4_4_ * fVar230 * fVar232;
        auVar41._4_4_ = fVar206;
        auVar41._0_4_ = fVar194;
        fVar208 = local_760._8_4_ * fVar246 * fVar247;
        auVar41._8_4_ = fVar208;
        fVar216 = local_760._12_4_ * fVar287 * fVar210;
        auVar41._12_4_ = fVar216;
        fVar228 = local_760._16_4_ * fVar291 * fVar212;
        auVar41._16_4_ = fVar228;
        fVar230 = local_760._20_4_ * fVar295 * fVar213;
        auVar41._20_4_ = fVar230;
        fVar235 = local_760._24_4_ * fVar317 * fVar214;
        auVar41._24_4_ = fVar235;
        auVar41._28_4_ = auVar33._28_4_;
        auVar200 = vsubps_avx(auVar274,auVar39);
        auVar307._0_4_ = auVar223._0_4_ + fVar194;
        auVar307._4_4_ = auVar223._4_4_ + fVar206;
        auVar307._8_4_ = auVar223._8_4_ + fVar208;
        auVar307._12_4_ = auVar223._12_4_ + fVar216;
        auVar307._16_4_ = auVar223._16_4_ + fVar228;
        auVar307._20_4_ = auVar223._20_4_ + fVar230;
        auVar307._24_4_ = auVar223._24_4_ + fVar235;
        auVar307._28_4_ = auVar223._28_4_ + auVar33._28_4_;
        fVar194 = (float)local_760._0_4_ * fVar209 * -fVar137;
        fVar206 = local_760._4_4_ * fVar232 * -fVar152;
        auVar33._4_4_ = fVar206;
        auVar33._0_4_ = fVar194;
        fVar208 = local_760._8_4_ * fVar247 * -fVar153;
        auVar33._8_4_ = fVar208;
        fVar216 = local_760._12_4_ * fVar210 * -fVar155;
        auVar33._12_4_ = fVar216;
        fVar228 = local_760._16_4_ * fVar212 * -fVar157;
        auVar33._16_4_ = fVar228;
        fVar230 = local_760._20_4_ * fVar213 * -fVar159;
        auVar33._20_4_ = fVar230;
        fVar235 = local_760._24_4_ * fVar214 * -fVar161;
        auVar33._24_4_ = fVar235;
        auVar33._28_4_ = fVar353;
        auVar274 = vsubps_avx(auVar332,auVar34);
        auVar326._0_4_ = fVar194 + auVar199._0_4_;
        auVar326._4_4_ = fVar206 + auVar199._4_4_;
        auVar326._8_4_ = fVar208 + auVar199._8_4_;
        auVar326._12_4_ = fVar216 + auVar199._12_4_;
        auVar326._16_4_ = fVar228 + auVar199._16_4_;
        auVar326._20_4_ = fVar230 + auVar199._20_4_;
        auVar326._24_4_ = fVar235 + auVar199._24_4_;
        auVar326._28_4_ = fVar353 + auVar199._28_4_;
        fVar194 = fVar209 * 0.0 * (float)local_760._0_4_;
        fVar206 = fVar232 * 0.0 * local_760._4_4_;
        auVar42._4_4_ = fVar206;
        auVar42._0_4_ = fVar194;
        fVar208 = fVar247 * 0.0 * local_760._8_4_;
        auVar42._8_4_ = fVar208;
        fVar209 = fVar210 * 0.0 * local_760._12_4_;
        auVar42._12_4_ = fVar209;
        fVar216 = fVar212 * 0.0 * local_760._16_4_;
        auVar42._16_4_ = fVar216;
        fVar228 = fVar213 * 0.0 * local_760._20_4_;
        auVar42._20_4_ = fVar228;
        fVar230 = fVar214 * 0.0 * local_760._24_4_;
        auVar42._24_4_ = fVar230;
        auVar42._28_4_ = fVar162;
        auVar332 = vsubps_avx(auVar117,auVar35);
        auVar355._0_4_ = (float)local_380._0_4_ + fVar194;
        auVar355._4_4_ = (float)local_380._4_4_ + fVar206;
        auVar355._8_4_ = fStack_378 + fVar208;
        auVar355._12_4_ = fStack_374 + fVar209;
        auVar355._16_4_ = fStack_370 + fVar216;
        auVar355._20_4_ = fStack_36c + fVar228;
        auVar355._24_4_ = fStack_368 + fVar230;
        auVar355._28_4_ = fStack_364 + fVar162;
        auVar13 = vsubps_avx(auVar223,auVar41);
        auVar23 = vsubps_avx(auVar199,auVar33);
        auVar242 = vsubps_avx(_local_380,auVar42);
        auVar33 = vsubps_avx(auVar326,auVar274);
        auVar40 = vsubps_avx(auVar355,auVar332);
        auVar43._4_4_ = auVar332._4_4_ * auVar33._4_4_;
        auVar43._0_4_ = auVar332._0_4_ * auVar33._0_4_;
        auVar43._8_4_ = auVar332._8_4_ * auVar33._8_4_;
        auVar43._12_4_ = auVar332._12_4_ * auVar33._12_4_;
        auVar43._16_4_ = auVar332._16_4_ * auVar33._16_4_;
        auVar43._20_4_ = auVar332._20_4_ * auVar33._20_4_;
        auVar43._24_4_ = auVar332._24_4_ * auVar33._24_4_;
        auVar43._28_4_ = fVar353;
        auVar44._4_4_ = auVar274._4_4_ * auVar40._4_4_;
        auVar44._0_4_ = auVar274._0_4_ * auVar40._0_4_;
        auVar44._8_4_ = auVar274._8_4_ * auVar40._8_4_;
        auVar44._12_4_ = auVar274._12_4_ * auVar40._12_4_;
        auVar44._16_4_ = auVar274._16_4_ * auVar40._16_4_;
        auVar44._20_4_ = auVar274._20_4_ * auVar40._20_4_;
        auVar44._24_4_ = auVar274._24_4_ * auVar40._24_4_;
        auVar44._28_4_ = auVar199._28_4_;
        auVar308 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar200._4_4_ * auVar40._4_4_;
        auVar45._0_4_ = auVar200._0_4_ * auVar40._0_4_;
        auVar45._8_4_ = auVar200._8_4_ * auVar40._8_4_;
        auVar45._12_4_ = auVar200._12_4_ * auVar40._12_4_;
        auVar45._16_4_ = auVar200._16_4_ * auVar40._16_4_;
        auVar45._20_4_ = auVar200._20_4_ * auVar40._20_4_;
        auVar45._24_4_ = auVar200._24_4_ * auVar40._24_4_;
        auVar45._28_4_ = auVar40._28_4_;
        auVar36 = vsubps_avx(auVar307,auVar200);
        auVar46._4_4_ = auVar332._4_4_ * auVar36._4_4_;
        auVar46._0_4_ = auVar332._0_4_ * auVar36._0_4_;
        auVar46._8_4_ = auVar332._8_4_ * auVar36._8_4_;
        auVar46._12_4_ = auVar332._12_4_ * auVar36._12_4_;
        auVar46._16_4_ = auVar332._16_4_ * auVar36._16_4_;
        auVar46._20_4_ = auVar332._20_4_ * auVar36._20_4_;
        auVar46._24_4_ = auVar332._24_4_ * auVar36._24_4_;
        auVar46._28_4_ = auVar223._28_4_;
        auVar37 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar36._4_4_ * auVar274._4_4_;
        auVar47._0_4_ = auVar36._0_4_ * auVar274._0_4_;
        auVar47._8_4_ = auVar36._8_4_ * auVar274._8_4_;
        auVar47._12_4_ = auVar36._12_4_ * auVar274._12_4_;
        auVar47._16_4_ = auVar36._16_4_ * auVar274._16_4_;
        auVar47._20_4_ = auVar36._20_4_ * auVar274._20_4_;
        auVar47._24_4_ = auVar36._24_4_ * auVar274._24_4_;
        auVar47._28_4_ = auVar40._28_4_;
        auVar48._4_4_ = auVar200._4_4_ * auVar33._4_4_;
        auVar48._0_4_ = auVar200._0_4_ * auVar33._0_4_;
        auVar48._8_4_ = auVar200._8_4_ * auVar33._8_4_;
        auVar48._12_4_ = auVar200._12_4_ * auVar33._12_4_;
        auVar48._16_4_ = auVar200._16_4_ * auVar33._16_4_;
        auVar48._20_4_ = auVar200._20_4_ * auVar33._20_4_;
        auVar48._24_4_ = auVar200._24_4_ * auVar33._24_4_;
        auVar48._28_4_ = auVar33._28_4_;
        auVar33 = vsubps_avx(auVar48,auVar47);
        auVar146._0_4_ = auVar308._0_4_ * 0.0 + auVar33._0_4_ + auVar37._0_4_ * 0.0;
        auVar146._4_4_ = auVar308._4_4_ * 0.0 + auVar33._4_4_ + auVar37._4_4_ * 0.0;
        auVar146._8_4_ = auVar308._8_4_ * 0.0 + auVar33._8_4_ + auVar37._8_4_ * 0.0;
        auVar146._12_4_ = auVar308._12_4_ * 0.0 + auVar33._12_4_ + auVar37._12_4_ * 0.0;
        auVar146._16_4_ = auVar308._16_4_ * 0.0 + auVar33._16_4_ + auVar37._16_4_ * 0.0;
        auVar146._20_4_ = auVar308._20_4_ * 0.0 + auVar33._20_4_ + auVar37._20_4_ * 0.0;
        auVar146._24_4_ = auVar308._24_4_ * 0.0 + auVar33._24_4_ + auVar37._24_4_ * 0.0;
        auVar146._28_4_ = auVar33._28_4_ + auVar33._28_4_ + auVar37._28_4_;
        auVar36 = vcmpps_avx(auVar146,ZEXT432(0) << 0x20,2);
        auVar13 = vblendvps_avx(auVar13,_local_6a0,auVar36);
        auVar115._4_4_ = fStack_6bc;
        auVar115._0_4_ = local_6c0;
        auVar115._8_4_ = fStack_6b8;
        auVar115._12_4_ = fStack_6b4;
        auVar115._16_4_ = fStack_6b0;
        auVar115._20_4_ = fStack_6ac;
        auVar115._24_4_ = fStack_6a8;
        auVar115._28_4_ = fStack_6a4;
        auVar23 = vblendvps_avx(auVar23,auVar115,auVar36);
        auVar242 = vblendvps_avx(auVar242,auVar255,auVar36);
        auVar33 = vblendvps_avx(auVar200,auVar307,auVar36);
        auVar40 = vblendvps_avx(auVar274,auVar326,auVar36);
        auVar308 = vblendvps_avx(auVar332,auVar355,auVar36);
        auVar200 = vblendvps_avx(auVar307,auVar200,auVar36);
        auVar274 = vblendvps_avx(auVar326,auVar274,auVar36);
        auVar237 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar332 = vblendvps_avx(auVar355,auVar332,auVar36);
        auVar200 = vsubps_avx(auVar200,auVar13);
        auVar37 = vsubps_avx(auVar274,auVar23);
        auVar332 = vsubps_avx(auVar332,auVar242);
        auVar38 = vsubps_avx(auVar23,auVar40);
        fVar194 = auVar37._0_4_;
        fVar160 = auVar242._0_4_;
        fVar228 = auVar37._4_4_;
        fVar137 = auVar242._4_4_;
        auVar49._4_4_ = fVar137 * fVar228;
        auVar49._0_4_ = fVar160 * fVar194;
        fVar246 = auVar37._8_4_;
        fVar152 = auVar242._8_4_;
        auVar49._8_4_ = fVar152 * fVar246;
        fVar210 = auVar37._12_4_;
        fVar153 = auVar242._12_4_;
        auVar49._12_4_ = fVar153 * fVar210;
        fVar321 = auVar37._16_4_;
        fVar155 = auVar242._16_4_;
        auVar49._16_4_ = fVar155 * fVar321;
        fVar314 = auVar37._20_4_;
        fVar157 = auVar242._20_4_;
        auVar49._20_4_ = fVar157 * fVar314;
        fVar151 = auVar37._24_4_;
        fVar159 = auVar242._24_4_;
        auVar49._24_4_ = fVar159 * fVar151;
        auVar49._28_4_ = auVar274._28_4_;
        fVar206 = auVar23._0_4_;
        fVar263 = auVar332._0_4_;
        fVar230 = auVar23._4_4_;
        fVar264 = auVar332._4_4_;
        auVar50._4_4_ = fVar264 * fVar230;
        auVar50._0_4_ = fVar263 * fVar206;
        fVar247 = auVar23._8_4_;
        fVar265 = auVar332._8_4_;
        auVar50._8_4_ = fVar265 * fVar247;
        fVar320 = auVar23._12_4_;
        fVar266 = auVar332._12_4_;
        auVar50._12_4_ = fVar266 * fVar320;
        fVar293 = auVar23._16_4_;
        fVar267 = auVar332._16_4_;
        auVar50._16_4_ = fVar267 * fVar293;
        fVar317 = auVar23._20_4_;
        fVar248 = auVar332._20_4_;
        auVar50._20_4_ = fVar248 * fVar317;
        fVar177 = auVar23._24_4_;
        fVar250 = auVar332._24_4_;
        auVar50._24_4_ = fVar250 * fVar177;
        auVar50._28_4_ = auVar326._28_4_;
        auVar274 = vsubps_avx(auVar50,auVar49);
        fVar208 = auVar13._0_4_;
        fVar232 = auVar13._4_4_;
        auVar51._4_4_ = fVar264 * fVar232;
        auVar51._0_4_ = fVar263 * fVar208;
        fVar319 = auVar13._8_4_;
        auVar51._8_4_ = fVar265 * fVar319;
        fVar289 = auVar13._12_4_;
        auVar51._12_4_ = fVar266 * fVar289;
        fVar295 = auVar13._16_4_;
        auVar51._16_4_ = fVar267 * fVar295;
        fVar214 = auVar13._20_4_;
        auVar51._20_4_ = fVar248 * fVar214;
        fVar154 = auVar13._24_4_;
        auVar51._24_4_ = fVar250 * fVar154;
        auVar51._28_4_ = auVar326._28_4_;
        fVar209 = auVar200._0_4_;
        auVar347._0_4_ = fVar160 * fVar209;
        fVar235 = auVar200._4_4_;
        auVar347._4_4_ = fVar137 * fVar235;
        fVar285 = auVar200._8_4_;
        auVar347._8_4_ = fVar152 * fVar285;
        fVar291 = auVar200._12_4_;
        auVar347._12_4_ = fVar153 * fVar291;
        fVar213 = auVar200._16_4_;
        auVar347._16_4_ = fVar155 * fVar213;
        fVar215 = auVar200._20_4_;
        auVar347._20_4_ = fVar157 * fVar215;
        fVar156 = auVar200._24_4_;
        auVar347._24_4_ = fVar159 * fVar156;
        auVar347._28_4_ = 0;
        auVar39 = vsubps_avx(auVar347,auVar51);
        auVar52._4_4_ = fVar230 * fVar235;
        auVar52._0_4_ = fVar206 * fVar209;
        auVar52._8_4_ = fVar247 * fVar285;
        auVar52._12_4_ = fVar320 * fVar291;
        auVar52._16_4_ = fVar293 * fVar213;
        auVar52._20_4_ = fVar317 * fVar215;
        auVar52._24_4_ = fVar177 * fVar156;
        auVar52._28_4_ = auVar326._28_4_;
        auVar53._4_4_ = fVar232 * fVar228;
        auVar53._0_4_ = fVar208 * fVar194;
        auVar53._8_4_ = fVar319 * fVar246;
        auVar53._12_4_ = fVar289 * fVar210;
        auVar53._16_4_ = fVar295 * fVar321;
        auVar53._20_4_ = fVar214 * fVar314;
        auVar53._24_4_ = fVar154 * fVar151;
        auVar53._28_4_ = auVar355._28_4_;
        auVar34 = vsubps_avx(auVar53,auVar52);
        auVar35 = vsubps_avx(auVar242,auVar308);
        fVar216 = auVar34._28_4_ + auVar39._28_4_;
        auVar171._0_4_ = auVar34._0_4_ + auVar39._0_4_ * 0.0 + auVar274._0_4_ * 0.0;
        auVar171._4_4_ = auVar34._4_4_ + auVar39._4_4_ * 0.0 + auVar274._4_4_ * 0.0;
        auVar171._8_4_ = auVar34._8_4_ + auVar39._8_4_ * 0.0 + auVar274._8_4_ * 0.0;
        auVar171._12_4_ = auVar34._12_4_ + auVar39._12_4_ * 0.0 + auVar274._12_4_ * 0.0;
        auVar171._16_4_ = auVar34._16_4_ + auVar39._16_4_ * 0.0 + auVar274._16_4_ * 0.0;
        auVar171._20_4_ = auVar34._20_4_ + auVar39._20_4_ * 0.0 + auVar274._20_4_ * 0.0;
        auVar171._24_4_ = auVar34._24_4_ + auVar39._24_4_ * 0.0 + auVar274._24_4_ * 0.0;
        auVar171._28_4_ = fVar216 + auVar274._28_4_;
        fVar161 = auVar38._0_4_;
        fVar162 = auVar38._4_4_;
        auVar54._4_4_ = fVar162 * auVar308._4_4_;
        auVar54._0_4_ = fVar161 * auVar308._0_4_;
        fVar234 = auVar38._8_4_;
        auVar54._8_4_ = fVar234 * auVar308._8_4_;
        fVar178 = auVar38._12_4_;
        auVar54._12_4_ = fVar178 * auVar308._12_4_;
        fVar251 = auVar38._16_4_;
        auVar54._16_4_ = fVar251 * auVar308._16_4_;
        fVar259 = auVar38._20_4_;
        auVar54._20_4_ = fVar259 * auVar308._20_4_;
        fVar261 = auVar38._24_4_;
        auVar54._24_4_ = fVar261 * auVar308._24_4_;
        auVar54._28_4_ = fVar216;
        fVar216 = auVar35._0_4_;
        fVar245 = auVar35._4_4_;
        auVar55._4_4_ = auVar40._4_4_ * fVar245;
        auVar55._0_4_ = auVar40._0_4_ * fVar216;
        fVar287 = auVar35._8_4_;
        auVar55._8_4_ = auVar40._8_4_ * fVar287;
        fVar212 = auVar35._12_4_;
        auVar55._12_4_ = auVar40._12_4_ * fVar212;
        fVar322 = auVar35._16_4_;
        auVar55._16_4_ = auVar40._16_4_ * fVar322;
        fVar136 = auVar35._20_4_;
        auVar55._20_4_ = auVar40._20_4_ * fVar136;
        fVar158 = auVar35._24_4_;
        auVar55._24_4_ = auVar40._24_4_ * fVar158;
        auVar55._28_4_ = auVar34._28_4_;
        auVar38 = vsubps_avx(auVar55,auVar54);
        auVar39 = vsubps_avx(auVar13,auVar33);
        fVar176 = auVar39._0_4_;
        fVar260 = auVar39._4_4_;
        auVar56._4_4_ = fVar260 * auVar308._4_4_;
        auVar56._0_4_ = fVar176 * auVar308._0_4_;
        fVar262 = auVar39._8_4_;
        auVar56._8_4_ = fVar262 * auVar308._8_4_;
        fVar276 = auVar39._12_4_;
        auVar56._12_4_ = fVar276 * auVar308._12_4_;
        fVar284 = auVar39._16_4_;
        auVar56._16_4_ = fVar284 * auVar308._16_4_;
        fVar286 = auVar39._20_4_;
        auVar56._20_4_ = fVar286 * auVar308._20_4_;
        fVar288 = auVar39._24_4_;
        auVar56._24_4_ = fVar288 * auVar308._24_4_;
        auVar56._28_4_ = auVar308._28_4_;
        auVar57._4_4_ = auVar33._4_4_ * fVar245;
        auVar57._0_4_ = auVar33._0_4_ * fVar216;
        auVar57._8_4_ = auVar33._8_4_ * fVar287;
        auVar57._12_4_ = auVar33._12_4_ * fVar212;
        auVar57._16_4_ = auVar33._16_4_ * fVar322;
        auVar57._20_4_ = auVar33._20_4_ * fVar136;
        auVar57._24_4_ = auVar33._24_4_ * fVar158;
        auVar57._28_4_ = auVar274._28_4_;
        auVar274 = vsubps_avx(auVar56,auVar57);
        auVar58._4_4_ = auVar40._4_4_ * fVar260;
        auVar58._0_4_ = auVar40._0_4_ * fVar176;
        auVar58._8_4_ = auVar40._8_4_ * fVar262;
        auVar58._12_4_ = auVar40._12_4_ * fVar276;
        auVar58._16_4_ = auVar40._16_4_ * fVar284;
        auVar58._20_4_ = auVar40._20_4_ * fVar286;
        auVar58._24_4_ = auVar40._24_4_ * fVar288;
        auVar58._28_4_ = auVar308._28_4_;
        auVar59._4_4_ = auVar33._4_4_ * fVar162;
        auVar59._0_4_ = auVar33._0_4_ * fVar161;
        auVar59._8_4_ = auVar33._8_4_ * fVar234;
        auVar59._12_4_ = auVar33._12_4_ * fVar178;
        auVar59._16_4_ = auVar33._16_4_ * fVar251;
        auVar59._20_4_ = auVar33._20_4_ * fVar259;
        auVar59._24_4_ = auVar33._24_4_ * fVar261;
        auVar59._28_4_ = auVar33._28_4_;
        auVar33 = vsubps_avx(auVar59,auVar58);
        auVar225._0_4_ = auVar38._0_4_ * 0.0 + auVar33._0_4_ + auVar274._0_4_ * 0.0;
        auVar225._4_4_ = auVar38._4_4_ * 0.0 + auVar33._4_4_ + auVar274._4_4_ * 0.0;
        auVar225._8_4_ = auVar38._8_4_ * 0.0 + auVar33._8_4_ + auVar274._8_4_ * 0.0;
        auVar225._12_4_ = auVar38._12_4_ * 0.0 + auVar33._12_4_ + auVar274._12_4_ * 0.0;
        auVar225._16_4_ = auVar38._16_4_ * 0.0 + auVar33._16_4_ + auVar274._16_4_ * 0.0;
        auVar225._20_4_ = auVar38._20_4_ * 0.0 + auVar33._20_4_ + auVar274._20_4_ * 0.0;
        auVar225._24_4_ = auVar38._24_4_ * 0.0 + auVar33._24_4_ + auVar274._24_4_ * 0.0;
        auVar225._28_4_ = auVar33._28_4_ + auVar33._28_4_ + auVar274._28_4_;
        auVar33 = vmaxps_avx(auVar171,auVar225);
        auVar33 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,2);
        auVar186 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
        auVar237 = vpand_avx(auVar237,auVar186);
        auVar186 = vpmovsxwd_avx(auVar237);
        auVar221 = vpunpckhwd_avx(auVar237,auVar237);
        auVar201._16_16_ = auVar221;
        auVar201._0_16_ = auVar186;
        if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar201 >> 0x7f,0) == '\0') &&
              (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar221 >> 0x3f,0) == '\0') &&
            (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar221[0xf]) {
LAB_00f4ad52:
          auVar341 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar205 = ZEXT3264(auVar201);
          auVar311 = ZEXT3264(local_560);
          auVar150 = ZEXT3264(local_580);
        }
        else {
          auVar60._4_4_ = fVar245 * fVar228;
          auVar60._0_4_ = fVar216 * fVar194;
          auVar60._8_4_ = fVar287 * fVar246;
          auVar60._12_4_ = fVar212 * fVar210;
          auVar60._16_4_ = fVar322 * fVar321;
          auVar60._20_4_ = fVar136 * fVar314;
          auVar60._24_4_ = fVar158 * fVar151;
          auVar60._28_4_ = auVar221._12_4_;
          auVar333._0_4_ = fVar161 * fVar263;
          auVar333._4_4_ = fVar162 * fVar264;
          auVar333._8_4_ = fVar234 * fVar265;
          auVar333._12_4_ = fVar178 * fVar266;
          auVar333._16_4_ = fVar251 * fVar267;
          auVar333._20_4_ = fVar259 * fVar248;
          auVar333._24_4_ = fVar261 * fVar250;
          auVar333._28_4_ = 0;
          auVar33 = vsubps_avx(auVar333,auVar60);
          auVar61._4_4_ = fVar260 * fVar264;
          auVar61._0_4_ = fVar176 * fVar263;
          auVar61._8_4_ = fVar262 * fVar265;
          auVar61._12_4_ = fVar276 * fVar266;
          auVar61._16_4_ = fVar284 * fVar267;
          auVar61._20_4_ = fVar286 * fVar248;
          auVar61._24_4_ = fVar288 * fVar250;
          auVar61._28_4_ = auVar332._28_4_;
          auVar62._4_4_ = fVar245 * fVar235;
          auVar62._0_4_ = fVar216 * fVar209;
          auVar62._8_4_ = fVar287 * fVar285;
          auVar62._12_4_ = fVar212 * fVar291;
          auVar62._16_4_ = fVar322 * fVar213;
          auVar62._20_4_ = fVar136 * fVar215;
          auVar62._24_4_ = fVar158 * fVar156;
          auVar62._28_4_ = auVar35._28_4_;
          auVar308 = vsubps_avx(auVar62,auVar61);
          auVar63._4_4_ = fVar162 * fVar235;
          auVar63._0_4_ = fVar161 * fVar209;
          auVar63._8_4_ = fVar234 * fVar285;
          auVar63._12_4_ = fVar178 * fVar291;
          auVar63._16_4_ = fVar251 * fVar213;
          auVar63._20_4_ = fVar259 * fVar215;
          auVar63._24_4_ = fVar261 * fVar156;
          auVar63._28_4_ = auVar171._28_4_;
          auVar64._4_4_ = fVar260 * fVar228;
          auVar64._0_4_ = fVar176 * fVar194;
          auVar64._8_4_ = fVar262 * fVar246;
          auVar64._12_4_ = fVar276 * fVar210;
          auVar64._16_4_ = fVar284 * fVar321;
          auVar64._20_4_ = fVar286 * fVar314;
          auVar64._24_4_ = fVar288 * fVar151;
          auVar64._28_4_ = auVar37._28_4_;
          auVar274 = vsubps_avx(auVar64,auVar63);
          auVar275._0_4_ = auVar33._0_4_ * 0.0 + auVar274._0_4_ + auVar308._0_4_ * 0.0;
          auVar275._4_4_ = auVar33._4_4_ * 0.0 + auVar274._4_4_ + auVar308._4_4_ * 0.0;
          auVar275._8_4_ = auVar33._8_4_ * 0.0 + auVar274._8_4_ + auVar308._8_4_ * 0.0;
          auVar275._12_4_ = auVar33._12_4_ * 0.0 + auVar274._12_4_ + auVar308._12_4_ * 0.0;
          auVar275._16_4_ = auVar33._16_4_ * 0.0 + auVar274._16_4_ + auVar308._16_4_ * 0.0;
          auVar275._20_4_ = auVar33._20_4_ * 0.0 + auVar274._20_4_ + auVar308._20_4_ * 0.0;
          auVar275._24_4_ = auVar33._24_4_ * 0.0 + auVar274._24_4_ + auVar308._24_4_ * 0.0;
          auVar275._28_4_ = auVar37._28_4_ + auVar274._28_4_ + auVar171._28_4_;
          auVar40 = vrcpps_avx(auVar275);
          fVar194 = auVar40._0_4_;
          fVar209 = auVar40._4_4_;
          auVar65._4_4_ = auVar275._4_4_ * fVar209;
          auVar65._0_4_ = auVar275._0_4_ * fVar194;
          fVar216 = auVar40._8_4_;
          auVar65._8_4_ = auVar275._8_4_ * fVar216;
          fVar228 = auVar40._12_4_;
          auVar65._12_4_ = auVar275._12_4_ * fVar228;
          fVar235 = auVar40._16_4_;
          auVar65._16_4_ = auVar275._16_4_ * fVar235;
          fVar245 = auVar40._20_4_;
          auVar65._20_4_ = auVar275._20_4_ * fVar245;
          fVar246 = auVar40._24_4_;
          auVar65._24_4_ = auVar275._24_4_ * fVar246;
          auVar65._28_4_ = auVar35._28_4_;
          auVar334._8_4_ = 0x3f800000;
          auVar334._0_8_ = 0x3f8000003f800000;
          auVar334._12_4_ = 0x3f800000;
          auVar334._16_4_ = 0x3f800000;
          auVar334._20_4_ = 0x3f800000;
          auVar334._24_4_ = 0x3f800000;
          auVar334._28_4_ = 0x3f800000;
          auVar332 = vsubps_avx(auVar334,auVar65);
          fVar194 = auVar332._0_4_ * fVar194 + fVar194;
          fVar209 = auVar332._4_4_ * fVar209 + fVar209;
          fVar216 = auVar332._8_4_ * fVar216 + fVar216;
          fVar228 = auVar332._12_4_ * fVar228 + fVar228;
          fVar235 = auVar332._16_4_ * fVar235 + fVar235;
          fVar245 = auVar332._20_4_ * fVar245 + fVar245;
          fVar246 = auVar332._24_4_ * fVar246 + fVar246;
          auVar66._4_4_ =
               (auVar33._4_4_ * fVar232 + auVar308._4_4_ * fVar230 + auVar274._4_4_ * fVar137) *
               fVar209;
          auVar66._0_4_ =
               (auVar33._0_4_ * fVar208 + auVar308._0_4_ * fVar206 + auVar274._0_4_ * fVar160) *
               fVar194;
          auVar66._8_4_ =
               (auVar33._8_4_ * fVar319 + auVar308._8_4_ * fVar247 + auVar274._8_4_ * fVar152) *
               fVar216;
          auVar66._12_4_ =
               (auVar33._12_4_ * fVar289 + auVar308._12_4_ * fVar320 + auVar274._12_4_ * fVar153) *
               fVar228;
          auVar66._16_4_ =
               (auVar33._16_4_ * fVar295 + auVar308._16_4_ * fVar293 + auVar274._16_4_ * fVar155) *
               fVar235;
          auVar66._20_4_ =
               (auVar33._20_4_ * fVar214 + auVar308._20_4_ * fVar317 + auVar274._20_4_ * fVar157) *
               fVar245;
          auVar66._24_4_ =
               (auVar33._24_4_ * fVar154 + auVar308._24_4_ * fVar177 + auVar274._24_4_ * fVar159) *
               fVar246;
          auVar66._28_4_ = auVar13._28_4_ + auVar200._28_4_ + auVar242._28_4_;
          auVar186 = vpermilps_avx(ZEXT416(uVar128),0);
          auVar202._16_16_ = auVar186;
          auVar202._0_16_ = auVar186;
          auVar242 = vcmpps_avx(auVar202,auVar66,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar240._4_4_ = uVar12;
          auVar240._0_4_ = uVar12;
          auVar240._8_4_ = uVar12;
          auVar240._12_4_ = uVar12;
          auVar240._16_4_ = uVar12;
          auVar240._20_4_ = uVar12;
          auVar240._24_4_ = uVar12;
          auVar240._28_4_ = uVar12;
          auVar33 = vcmpps_avx(auVar66,auVar240,2);
          auVar242 = vandps_avx(auVar33,auVar242);
          auVar186 = vpackssdw_avx(auVar242._0_16_,auVar242._16_16_);
          auVar237 = vpand_avx(auVar237,auVar186);
          auVar186 = vpmovsxwd_avx(auVar237);
          auVar221 = vpshufd_avx(auVar237,0xee);
          auVar221 = vpmovsxwd_avx(auVar221);
          auVar201._16_16_ = auVar221;
          auVar201._0_16_ = auVar186;
          if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar201 >> 0x7f,0) == '\0') &&
                (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar221 >> 0x3f,0) == '\0') &&
              (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar221[0xf]) goto LAB_00f4ad52;
          auVar242 = vcmpps_avx(ZEXT832(0) << 0x20,auVar275,4);
          auVar186 = vpackssdw_avx(auVar242._0_16_,auVar242._16_16_);
          auVar237 = vpand_avx(auVar237,auVar186);
          auVar186 = vpmovsxwd_avx(auVar237);
          auVar237 = vpunpckhwd_avx(auVar237,auVar237);
          auVar205 = ZEXT1664(auVar237);
          auVar256._16_16_ = auVar237;
          auVar256._0_16_ = auVar186;
          auVar341 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar311 = ZEXT3264(local_560);
          auVar150 = ZEXT3264(local_580);
          if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar256 >> 0x7f,0) != '\0') ||
                (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar237 >> 0x3f,0) != '\0') ||
              (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar237[0xf] < '\0') {
            auVar203._0_4_ = auVar171._0_4_ * fVar194;
            auVar203._4_4_ = auVar171._4_4_ * fVar209;
            auVar203._8_4_ = auVar171._8_4_ * fVar216;
            auVar203._12_4_ = auVar171._12_4_ * fVar228;
            auVar203._16_4_ = auVar171._16_4_ * fVar235;
            auVar203._20_4_ = auVar171._20_4_ * fVar245;
            auVar203._24_4_ = auVar171._24_4_ * fVar246;
            auVar203._28_4_ = 0;
            auVar67._4_4_ = auVar225._4_4_ * fVar209;
            auVar67._0_4_ = auVar225._0_4_ * fVar194;
            auVar67._8_4_ = auVar225._8_4_ * fVar216;
            auVar67._12_4_ = auVar225._12_4_ * fVar228;
            auVar67._16_4_ = auVar225._16_4_ * fVar235;
            auVar67._20_4_ = auVar225._20_4_ * fVar245;
            auVar67._24_4_ = auVar225._24_4_ * fVar246;
            auVar67._28_4_ = auVar332._28_4_ + auVar40._28_4_;
            auVar241._8_4_ = 0x3f800000;
            auVar241._0_8_ = 0x3f8000003f800000;
            auVar241._12_4_ = 0x3f800000;
            auVar241._16_4_ = 0x3f800000;
            auVar241._20_4_ = 0x3f800000;
            auVar241._24_4_ = 0x3f800000;
            auVar241._28_4_ = 0x3f800000;
            auVar242 = vsubps_avx(auVar241,auVar203);
            auVar242 = vblendvps_avx(auVar242,auVar203,auVar36);
            auVar311 = ZEXT3264(auVar242);
            auVar242 = vsubps_avx(auVar241,auVar67);
            auVar205 = ZEXT3264(auVar242);
            _local_3c0 = vblendvps_avx(auVar242,auVar67,auVar36);
            auVar341 = ZEXT3264(auVar256);
            auVar150 = ZEXT3264(auVar66);
          }
        }
        auVar283 = ZEXT3264(auVar143);
        auVar200 = auVar150._0_32_;
        auVar308 = auVar311._0_32_;
        auVar242 = auVar341._0_32_;
        local_3a0 = auVar32;
        if ((((((((auVar242 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar242 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar242 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar242 >> 0x7f,0) == '\0') &&
              (auVar341 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar242 >> 0xbf,0) == '\0') &&
            (auVar341 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar341[0x1f]) goto LAB_00f498ec;
        auVar32 = vsubps_avx(local_760,auVar143);
        fVar206 = auVar143._0_4_ + auVar311._0_4_ * auVar32._0_4_;
        fVar208 = auVar143._4_4_ + auVar311._4_4_ * auVar32._4_4_;
        fVar209 = auVar143._8_4_ + auVar311._8_4_ * auVar32._8_4_;
        fVar216 = auVar143._12_4_ + auVar311._12_4_ * auVar32._12_4_;
        fVar228 = auVar143._16_4_ + auVar311._16_4_ * auVar32._16_4_;
        fVar230 = auVar143._20_4_ + auVar311._20_4_ * auVar32._20_4_;
        fVar232 = auVar143._24_4_ + auVar311._24_4_ * auVar32._24_4_;
        fVar235 = auVar32._28_4_ + 0.0;
        fVar194 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
        auVar32._4_4_ = (fVar208 + fVar208) * fVar194;
        auVar32._0_4_ = (fVar206 + fVar206) * fVar194;
        auVar32._8_4_ = (fVar209 + fVar209) * fVar194;
        auVar32._12_4_ = (fVar216 + fVar216) * fVar194;
        auVar32._16_4_ = (fVar228 + fVar228) * fVar194;
        auVar32._20_4_ = (fVar230 + fVar230) * fVar194;
        auVar32._24_4_ = (fVar232 + fVar232) * fVar194;
        auVar32._28_4_ = fVar235 + fVar235;
        auVar32 = vcmpps_avx(auVar200,auVar32,6);
        auVar33 = auVar242 & auVar32;
        if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar33 >> 0x7f,0) == '\0') &&
              (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar33 >> 0xbf,0) == '\0') &&
            (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar33[0x1f]) {
LAB_00f49986:
          uVar126 = 0;
        }
        else {
          local_200 = vandps_avx(auVar32,auVar242);
          local_2a0 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
          fStack_29c = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
          fStack_298 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
          fStack_294 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
          fStack_290 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
          fStack_28c = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
          fStack_288 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
          fStack_284 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
          local_260 = 0;
          uStack_248 = uStack_708;
          uStack_238 = uStack_5c8;
          uStack_228 = uStack_5d8;
          uStack_218 = uStack_5e8;
          local_3c0._4_4_ = fStack_29c;
          local_3c0._0_4_ = local_2a0;
          uStack_3b8._0_4_ = fStack_298;
          uStack_3b8._4_4_ = fStack_294;
          uStack_3b0._0_4_ = fStack_290;
          uStack_3b0._4_4_ = fStack_28c;
          auVar123 = _local_3c0;
          uStack_3a8._0_4_ = fStack_288;
          uStack_3a8._4_4_ = fStack_284;
          auVar242 = _local_3c0;
          _local_3c0 = auVar242;
          if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_00f49986;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (uVar126 = CONCAT71((int7)(uVar126 >> 8),1),
             pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar183._0_4_ = 1.0 / (float)(int)uVar17;
            auVar183._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar237 = vshufps_avx(auVar183,auVar183,0);
            local_1e0[0] = auVar237._0_4_ * (auVar311._0_4_ + 0.0);
            local_1e0[1] = auVar237._4_4_ * (auVar311._4_4_ + 1.0);
            local_1e0[2] = auVar237._8_4_ * (auVar311._8_4_ + 2.0);
            local_1e0[3] = auVar237._12_4_ * (auVar311._12_4_ + 3.0);
            fStack_1d0 = auVar237._0_4_ * (auVar311._16_4_ + 4.0);
            fStack_1cc = auVar237._4_4_ * (auVar311._20_4_ + 5.0);
            fStack_1c8 = auVar237._8_4_ * (auVar311._24_4_ + 6.0);
            fStack_1c4 = auVar311._28_4_ + 7.0;
            uStack_3b0 = auVar123._16_8_;
            uStack_3a8 = auVar242._24_8_;
            local_1c0 = local_3c0;
            uStack_1b8 = uStack_3b8;
            uStack_1b0 = uStack_3b0;
            uStack_1a8 = uStack_3a8;
            local_1a0 = auVar200;
            iVar125 = vmovmskps_avx(local_200);
            uVar133 = CONCAT44((int)((ulong)lVar132 >> 0x20),iVar125);
            uVar129 = 0;
            if (uVar133 != 0) {
              for (; (uVar133 >> uVar129 & 1) == 0; uVar129 = uVar129 + 1) {
              }
            }
            if (iVar125 == 0) goto LAB_00f49986;
            local_640 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
            auStack_630 = auVar13._16_16_;
            _local_660 = vshufps_avx(ZEXT416(uVar16),ZEXT416(uVar16),0);
            auStack_650 = auVar23._16_16_;
            _auStack_590 = auVar223._16_16_;
            _local_5a0 = *local_700;
            _auStack_5bc = auVar199._4_28_;
            local_5c0 = (undefined1  [4])*(undefined4 *)(ray + k * 4 + 0x80);
            local_580 = auVar200;
            local_560 = auVar308;
            _local_340 = *pauVar9;
            local_2c0 = auVar308;
            local_280 = auVar200;
            local_25c = uVar17;
            local_250 = local_710;
            local_240 = local_5d0;
            local_230 = local_5e0;
            local_220 = local_5f0;
            do {
              local_440 = local_1e0[uVar129];
              local_430 = *(undefined4 *)((long)&local_1c0 + uVar129 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar129 * 4);
              fVar206 = 1.0 - local_440;
              fVar194 = local_440 * fVar206 * 4.0;
              auVar237 = ZEXT416((uint)(local_440 * local_440 * 0.5));
              auVar237 = vshufps_avx(auVar237,auVar237,0);
              auVar186 = ZEXT416((uint)((fVar206 * fVar206 + fVar194) * 0.5));
              auVar186 = vshufps_avx(auVar186,auVar186,0);
              auVar221 = ZEXT416((uint)((-local_440 * local_440 - fVar194) * 0.5));
              auVar221 = vshufps_avx(auVar221,auVar221,0);
              local_6f0.context = context->user;
              auVar198 = ZEXT416((uint)(fVar206 * -fVar206 * 0.5));
              auVar198 = vshufps_avx(auVar198,auVar198,0);
              auVar184._0_4_ =
                   auVar198._0_4_ * (float)local_710._0_4_ +
                   auVar221._0_4_ * (float)local_5d0._0_4_ +
                   auVar237._0_4_ * (float)local_5f0._0_4_ + auVar186._0_4_ * (float)local_5e0._0_4_
              ;
              auVar184._4_4_ =
                   auVar198._4_4_ * (float)local_710._4_4_ +
                   auVar221._4_4_ * (float)local_5d0._4_4_ +
                   auVar237._4_4_ * (float)local_5f0._4_4_ + auVar186._4_4_ * (float)local_5e0._4_4_
              ;
              auVar184._8_4_ =
                   auVar198._8_4_ * (float)uStack_708 +
                   auVar221._8_4_ * (float)uStack_5c8 +
                   auVar237._8_4_ * (float)uStack_5e8 + auVar186._8_4_ * (float)uStack_5d8;
              auVar184._12_4_ =
                   auVar198._12_4_ * uStack_708._4_4_ +
                   auVar221._12_4_ * uStack_5c8._4_4_ +
                   auVar237._12_4_ * uStack_5e8._4_4_ + auVar186._12_4_ * uStack_5d8._4_4_;
              local_470 = (RTCHitN  [16])vshufps_avx(auVar184,auVar184,0);
              local_460 = vshufps_avx(auVar184,auVar184,0x55);
              auVar205 = ZEXT1664(local_460);
              local_450 = vshufps_avx(auVar184,auVar184,0xaa);
              local_420 = local_660;
              uStack_418 = uStack_658;
              local_410 = local_640._0_8_;
              uStack_408 = local_640._8_8_;
              vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
              uStack_3fc = (local_6f0.context)->instID[0];
              local_400 = uStack_3fc;
              uStack_3f8 = uStack_3fc;
              uStack_3f4 = uStack_3fc;
              uStack_3f0 = (local_6f0.context)->instPrimID[0];
              uStack_3ec = uStack_3f0;
              uStack_3e8 = uStack_3f0;
              uStack_3e4 = uStack_3f0;
              local_7a0 = _local_5a0;
              local_6f0.valid = (int *)local_7a0;
              local_6f0.geometryUserPtr = pGVar18->userPtr;
              local_6f0.hit = local_470;
              local_6f0.N = 4;
              local_760._0_8_ = uVar129;
              local_6f0.ray = (RTCRayN *)ray;
              fStack_43c = local_440;
              fStack_438 = local_440;
              fStack_434 = local_440;
              uStack_42c = local_430;
              uStack_428 = local_430;
              uStack_424 = local_430;
              if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar205 = ZEXT1664(local_460);
                auVar283 = ZEXT1664(auVar283._0_16_);
                (*pGVar18->occlusionFilterN)(&local_6f0);
                auVar150 = ZEXT3264(local_580);
                auVar311 = ZEXT3264(local_560);
                uVar129 = local_760._0_8_;
                fVar179 = (float)local_780._0_4_;
                fVar191 = (float)local_780._4_4_;
                fVar192 = fStack_778;
                fVar193 = fStack_774;
                fVar324 = fStack_770;
                fVar207 = fStack_76c;
                fVar328 = fStack_768;
                fVar211 = fStack_764;
              }
              if (local_7a0 == (undefined1  [16])0x0) {
                auVar237 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar237 = auVar237 ^ _DAT_01f7ae20;
              }
              else {
                p_Var21 = context->args->filter;
                if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar205 = ZEXT1664(auVar205._0_16_);
                  auVar283 = ZEXT1664(auVar283._0_16_);
                  (*p_Var21)(&local_6f0);
                  auVar150 = ZEXT3264(local_580);
                  auVar311 = ZEXT3264(local_560);
                  uVar129 = local_760._0_8_;
                  fVar179 = (float)local_780._0_4_;
                  fVar191 = (float)local_780._4_4_;
                  fVar192 = fStack_778;
                  fVar193 = fStack_774;
                  fVar324 = fStack_770;
                  fVar207 = fStack_76c;
                  fVar328 = fStack_768;
                  fVar211 = fStack_764;
                }
                auVar186 = vpcmpeqd_avx(local_7a0,_DAT_01f7aa10);
                auVar237 = auVar186 ^ _DAT_01f7ae20;
                auVar185._8_4_ = 0xff800000;
                auVar185._0_8_ = 0xff800000ff800000;
                auVar185._12_4_ = 0xff800000;
                auVar186 = vblendvps_avx(auVar185,*(undefined1 (*) [16])(local_6f0.ray + 0x80),
                                         auVar186);
                *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar186;
              }
              auVar200 = auVar150._0_32_;
              auVar308 = auVar311._0_32_;
              auVar167._8_8_ = 0x100000001;
              auVar167._0_8_ = 0x100000001;
              if ((auVar167 & auVar237) != (undefined1  [16])0x0) {
                uVar126 = CONCAT71((int7)(uVar126 >> 8),1);
                break;
              }
              *(undefined1 (*) [4])(ray + k * 4 + 0x80) = local_5c0;
              uVar133 = uVar133 ^ 1L << (uVar129 & 0x3f);
              uVar129 = 0;
              if (uVar133 != 0) {
                for (; (uVar133 >> uVar129 & 1) == 0; uVar129 = uVar129 + 1) {
                }
              }
              uVar126 = 0;
            } while (uVar133 != 0);
          }
        }
      }
      auVar341 = ZEXT3264(auVar222);
      local_580 = auVar200;
      local_560 = auVar308;
      if (8 < (int)uVar17) {
        _local_340 = vpshufd_avx(ZEXT416(uVar17),0);
        auVar237 = vshufps_avx(_local_740,_local_740,0);
        local_360._16_16_ = auVar237;
        local_360._0_16_ = auVar237;
        auVar237 = vpermilps_avx(ZEXT416(uVar128),0);
        register0x00001210 = auVar237;
        _local_380 = auVar237;
        auVar142._0_4_ = 1.0 / (float)local_4c0._0_4_;
        auVar142._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar237 = vshufps_avx(auVar142,auVar142,0);
        register0x00001210 = auVar237;
        _local_e0 = auVar237;
        auVar237 = vshufps_avx(ZEXT416((uint)local_788),ZEXT416((uint)local_788),0);
        local_3a0._0_16_ = auVar237;
        local_600 = vshufps_avx(ZEXT416((uint)local_600._0_4_),ZEXT416((uint)local_600._0_4_),0);
        auVar150 = ZEXT1664(local_600);
        lVar135 = 8;
        do {
          pauVar10 = (undefined1 (*) [28])(bspline_basis0 + lVar135 * 4 + lVar22);
          fVar194 = *(float *)*pauVar10;
          fVar206 = *(float *)(*pauVar10 + 4);
          fVar208 = *(float *)(*pauVar10 + 8);
          fVar209 = *(float *)(*pauVar10 + 0xc);
          fVar216 = *(float *)(*pauVar10 + 0x10);
          fVar228 = *(float *)(*pauVar10 + 0x14);
          fVar230 = *(float *)(*pauVar10 + 0x18);
          auVar122 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar22 + 0x21aefac + lVar135 * 4);
          fVar232 = *(float *)*pauVar10;
          fVar235 = *(float *)(*pauVar10 + 4);
          fVar245 = *(float *)(*pauVar10 + 8);
          fVar246 = *(float *)(*pauVar10 + 0xc);
          fVar247 = *(float *)(*pauVar10 + 0x10);
          fVar319 = *(float *)(*pauVar10 + 0x14);
          fVar285 = *(float *)(*pauVar10 + 0x18);
          auVar121 = *pauVar10;
          pfVar1 = (float *)(lVar22 + 0x21af430 + lVar135 * 4);
          fVar210 = *pfVar1;
          fVar320 = pfVar1[1];
          fVar289 = pfVar1[2];
          fVar291 = pfVar1[3];
          fVar212 = pfVar1[4];
          fVar321 = pfVar1[5];
          fVar293 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar22 + 0x21af8b4 + lVar135 * 4);
          fVar287 = *(float *)*pauVar10;
          fVar295 = *(float *)(*pauVar10 + 4);
          fVar213 = *(float *)(*pauVar10 + 8);
          fVar322 = *(float *)(*pauVar10 + 0xc);
          fVar314 = *(float *)(*pauVar10 + 0x10);
          fVar317 = *(float *)(*pauVar10 + 0x14);
          fVar214 = *(float *)(*pauVar10 + 0x18);
          auVar119 = *pauVar10;
          fVar215 = auVar205._28_4_;
          fStack_804 = fVar215 + *(float *)pauVar10[1];
          fVar234 = fVar215 + fStack_804;
          local_820._0_4_ =
               (float)local_4a0._0_4_ * fVar194 +
               auVar341._0_4_ * fVar232 +
               (float)local_620._0_4_ * fVar210 + (float)local_4e0._0_4_ * fVar287;
          local_820._4_4_ =
               (float)local_4a0._4_4_ * fVar206 +
               auVar341._4_4_ * fVar235 +
               (float)local_620._4_4_ * fVar320 + (float)local_4e0._4_4_ * fVar295;
          fStack_818 = fStack_498 * fVar208 +
                       auVar341._8_4_ * fVar245 + fStack_618 * fVar289 + fStack_4d8 * fVar213;
          fStack_814 = fStack_494 * fVar209 +
                       auVar341._12_4_ * fVar246 + fStack_614 * fVar291 + fStack_4d4 * fVar322;
          fStack_810 = fStack_490 * fVar216 +
                       auVar341._16_4_ * fVar247 + fStack_610 * fVar212 + fStack_4d0 * fVar314;
          fStack_80c = fStack_48c * fVar228 +
                       auVar341._20_4_ * fVar319 + fStack_60c * fVar321 + fStack_4cc * fVar317;
          fStack_808 = fStack_488 * fVar230 +
                       auVar341._24_4_ * fVar285 + fStack_608 * fVar293 + fStack_4c8 * fVar214;
          fStack_804 = fStack_804 + fVar215 + fVar215 + auVar150._28_4_;
          auVar204._0_4_ =
               (float)local_100._0_4_ * fVar194 +
               fVar323 * fVar287 + fVar179 * fVar210 + fVar232 * fVar354;
          auVar204._4_4_ =
               (float)local_100._4_4_ * fVar206 +
               fVar327 * fVar295 + fVar191 * fVar320 + fVar235 * fVar357;
          auVar204._8_4_ =
               fStack_f8 * fVar208 + fVar329 * fVar213 + fVar192 * fVar289 + fVar245 * fVar358;
          auVar204._12_4_ =
               fStack_f4 * fVar209 + fVar330 * fVar322 + fVar193 * fVar291 + fVar246 * fVar359;
          auVar204._16_4_ =
               fStack_f0 * fVar216 + fVar323 * fVar314 + fVar324 * fVar212 + fVar247 * fVar354;
          auVar204._20_4_ =
               fStack_ec * fVar228 + fVar327 * fVar317 + fVar207 * fVar321 + fVar319 * fVar357;
          auVar204._24_4_ =
               fStack_e8 * fVar230 + fVar329 * fVar214 + fVar328 * fVar293 + fVar285 * fVar358;
          auVar204._28_4_ = fStack_804 + auVar283._28_4_ + fVar215 + fVar215;
          auVar205 = ZEXT3264(auVar204);
          fVar137 = (float)local_c0._0_4_ * fVar194 +
                    (float)local_a0._0_4_ * fVar232 +
                    (float)local_80._0_4_ * fVar210 + fVar287 * (float)local_120._0_4_;
          fVar152 = (float)local_c0._4_4_ * fVar206 +
                    (float)local_a0._4_4_ * fVar235 +
                    (float)local_80._4_4_ * fVar320 + fVar295 * (float)local_120._4_4_;
          fVar153 = fStack_b8 * fVar208 +
                    fStack_98 * fVar245 + fStack_78 * fVar289 + fVar213 * fStack_118;
          fVar155 = fStack_b4 * fVar209 +
                    fStack_94 * fVar246 + fStack_74 * fVar291 + fVar322 * fStack_114;
          fVar157 = fStack_b0 * fVar216 +
                    fStack_90 * fVar247 + fStack_70 * fVar212 + fVar314 * fStack_110;
          fVar159 = fStack_ac * fVar228 +
                    fStack_8c * fVar319 + fStack_6c * fVar321 + fVar317 * fStack_10c;
          fVar161 = fStack_a8 * fVar230 +
                    fStack_88 * fVar285 + fStack_68 * fVar293 + fVar214 * fStack_108;
          fVar162 = fStack_804 + fVar234;
          pauVar11 = (undefined1 (*) [32])(bspline_basis1 + lVar135 * 4 + lVar22);
          auVar123 = *(undefined1 (*) [24])*pauVar11;
          pfVar1 = (float *)(lVar22 + 0x21b13cc + lVar135 * 4);
          fVar295 = *pfVar1;
          fVar213 = pfVar1[1];
          fVar322 = pfVar1[2];
          fVar314 = pfVar1[3];
          fVar317 = pfVar1[4];
          fVar214 = pfVar1[5];
          fVar215 = pfVar1[6];
          auVar13 = *(undefined1 (*) [32])(lVar22 + 0x21b1850 + lVar135 * 4);
          auVar150 = ZEXT3264(auVar13);
          pfVar2 = (float *)(lVar22 + 0x21b1cd4 + lVar135 * 4);
          fVar136 = *pfVar2;
          fVar151 = pfVar2[1];
          fVar177 = pfVar2[2];
          fVar154 = pfVar2[3];
          fVar156 = pfVar2[4];
          fVar158 = pfVar2[5];
          fVar160 = pfVar2[6];
          fVar287 = auVar341._28_4_;
          fVar194 = auVar13._0_4_;
          fVar208 = auVar13._4_4_;
          fVar216 = auVar13._8_4_;
          fVar230 = auVar13._12_4_;
          fVar235 = auVar13._16_4_;
          fVar246 = auVar13._20_4_;
          fVar319 = auVar13._24_4_;
          fVar234 = fVar330 + fVar330 + fVar234;
          local_740._0_4_ = auVar123._0_4_;
          local_740._4_4_ = auVar123._4_4_;
          auStack_738._0_4_ = auVar123._8_4_;
          auStack_738._4_4_ = auVar123._12_4_;
          fStack_730 = auVar123._16_4_;
          fStack_72c = auVar123._20_4_;
          fStack_728 = (float)*(undefined8 *)(*pauVar11 + 0x18);
          fStack_724 = (float)((ulong)*(undefined8 *)(*pauVar11 + 0x18) >> 0x20);
          auVar257._0_4_ =
               (float)local_4a0._0_4_ * (float)local_740._0_4_ +
               fVar295 * auVar341._0_4_ +
               (float)local_620._0_4_ * fVar194 + (float)local_4e0._0_4_ * fVar136;
          auVar257._4_4_ =
               (float)local_4a0._4_4_ * (float)local_740._4_4_ +
               fVar213 * auVar341._4_4_ +
               (float)local_620._4_4_ * fVar208 + (float)local_4e0._4_4_ * fVar151;
          auVar257._8_4_ =
               fStack_498 * (float)auStack_738._0_4_ +
               fVar322 * auVar341._8_4_ + fStack_618 * fVar216 + fStack_4d8 * fVar177;
          auVar257._12_4_ =
               fStack_494 * (float)auStack_738._4_4_ +
               fVar314 * auVar341._12_4_ + fStack_614 * fVar230 + fStack_4d4 * fVar154;
          auVar257._16_4_ =
               fStack_490 * fStack_730 +
               fVar317 * auVar341._16_4_ + fStack_610 * fVar235 + fStack_4d0 * fVar156;
          auVar257._20_4_ =
               fStack_48c * fStack_72c +
               fVar214 * auVar341._20_4_ + fStack_60c * fVar246 + fStack_4cc * fVar158;
          auVar257._24_4_ =
               fStack_488 * fStack_728 +
               fVar215 * auVar341._24_4_ + fStack_608 * fVar319 + fStack_4c8 * fVar160;
          auVar257._28_4_ = fVar330 + pfVar2[7] + fVar234;
          auVar243._0_4_ =
               (float)local_100._0_4_ * (float)local_740._0_4_ +
               fVar354 * fVar295 + fVar179 * fVar194 + fVar323 * fVar136;
          auVar243._4_4_ =
               (float)local_100._4_4_ * (float)local_740._4_4_ +
               fVar357 * fVar213 + fVar191 * fVar208 + fVar327 * fVar151;
          auVar243._8_4_ =
               fStack_f8 * (float)auStack_738._0_4_ +
               fVar358 * fVar322 + fVar192 * fVar216 + fVar329 * fVar177;
          auVar243._12_4_ =
               fStack_f4 * (float)auStack_738._4_4_ +
               fVar359 * fVar314 + fVar193 * fVar230 + fVar330 * fVar154;
          auVar243._16_4_ =
               fStack_f0 * fStack_730 + fVar354 * fVar317 + fVar324 * fVar235 + fVar323 * fVar156;
          auVar243._20_4_ =
               fStack_ec * fStack_72c + fVar357 * fVar214 + fVar207 * fVar246 + fVar327 * fVar158;
          auVar243._24_4_ =
               fStack_e8 * fStack_728 + fVar358 * fVar215 + fVar328 * fVar319 + fVar329 * fVar160;
          auVar243._28_4_ = fVar234 + fVar330 + fVar330 + fVar287;
          auVar281._0_4_ =
               (float)local_a0._0_4_ * fVar295 +
               (float)local_80._0_4_ * fVar194 + fVar136 * (float)local_120._0_4_ +
               (float)local_740._0_4_ * (float)local_c0._0_4_;
          auVar281._4_4_ =
               (float)local_a0._4_4_ * fVar213 +
               (float)local_80._4_4_ * fVar208 + fVar151 * (float)local_120._4_4_ +
               (float)local_740._4_4_ * (float)local_c0._4_4_;
          auVar281._8_4_ =
               fStack_98 * fVar322 + fStack_78 * fVar216 + fVar177 * fStack_118 +
               (float)auStack_738._0_4_ * fStack_b8;
          auVar281._12_4_ =
               fStack_94 * fVar314 + fStack_74 * fVar230 + fVar154 * fStack_114 +
               (float)auStack_738._4_4_ * fStack_b4;
          auVar281._16_4_ =
               fStack_90 * fVar317 + fStack_70 * fVar235 + fVar156 * fStack_110 +
               fStack_730 * fStack_b0;
          auVar281._20_4_ =
               fStack_8c * fVar214 + fStack_6c * fVar246 + fVar158 * fStack_10c +
               fStack_72c * fStack_ac;
          auVar281._24_4_ =
               fStack_88 * fVar215 + fStack_68 * fVar319 + fVar160 * fStack_108 +
               fStack_728 * fStack_a8;
          auVar281._28_4_ = fVar330 + fVar330 + pfVar2[7] + fVar234;
          auVar283 = ZEXT3264(auVar281);
          auVar242 = vsubps_avx(auVar257,_local_820);
          auVar32 = vsubps_avx(auVar243,auVar204);
          fVar206 = auVar242._0_4_;
          fVar209 = auVar242._4_4_;
          auVar68._4_4_ = auVar204._4_4_ * fVar209;
          auVar68._0_4_ = auVar204._0_4_ * fVar206;
          fVar228 = auVar242._8_4_;
          auVar68._8_4_ = auVar204._8_4_ * fVar228;
          fVar232 = auVar242._12_4_;
          auVar68._12_4_ = auVar204._12_4_ * fVar232;
          fVar245 = auVar242._16_4_;
          auVar68._16_4_ = auVar204._16_4_ * fVar245;
          fVar247 = auVar242._20_4_;
          auVar68._20_4_ = auVar204._20_4_ * fVar247;
          fVar285 = auVar242._24_4_;
          auVar68._24_4_ = auVar204._24_4_ * fVar285;
          auVar68._28_4_ = fVar234;
          fVar234 = auVar32._0_4_;
          fVar178 = auVar32._4_4_;
          auVar69._4_4_ = fVar178 * (float)local_820._4_4_;
          auVar69._0_4_ = fVar234 * (float)local_820._0_4_;
          fVar251 = auVar32._8_4_;
          auVar69._8_4_ = fVar251 * fStack_818;
          fVar259 = auVar32._12_4_;
          auVar69._12_4_ = fVar259 * fStack_814;
          fVar261 = auVar32._16_4_;
          auVar69._16_4_ = fVar261 * fStack_810;
          fVar263 = auVar32._20_4_;
          auVar69._20_4_ = fVar263 * fStack_80c;
          fVar264 = auVar32._24_4_;
          auVar69._24_4_ = fVar264 * fStack_808;
          auVar69._28_4_ = auVar243._28_4_;
          auVar33 = vsubps_avx(auVar68,auVar69);
          auVar113._4_4_ = fVar152;
          auVar113._0_4_ = fVar137;
          auVar113._8_4_ = fVar153;
          auVar113._12_4_ = fVar155;
          auVar113._16_4_ = fVar157;
          auVar113._20_4_ = fVar159;
          auVar113._24_4_ = fVar161;
          auVar113._28_4_ = fVar162;
          auVar23 = vmaxps_avx(auVar113,auVar281);
          auVar70._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar209 * fVar209 + fVar178 * fVar178);
          auVar70._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar206 * fVar206 + fVar234 * fVar234);
          auVar70._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar228 * fVar228 + fVar251 * fVar251);
          auVar70._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar232 * fVar232 + fVar259 * fVar259)
          ;
          auVar70._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar245 * fVar245 + fVar261 * fVar261)
          ;
          auVar70._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar247 * fVar247 + fVar263 * fVar263)
          ;
          auVar70._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar285 * fVar285 + fVar264 * fVar264)
          ;
          auVar70._28_4_ = auVar257._28_4_ + auVar243._28_4_;
          auVar71._4_4_ = auVar33._4_4_ * auVar33._4_4_;
          auVar71._0_4_ = auVar33._0_4_ * auVar33._0_4_;
          auVar71._8_4_ = auVar33._8_4_ * auVar33._8_4_;
          auVar71._12_4_ = auVar33._12_4_ * auVar33._12_4_;
          auVar71._16_4_ = auVar33._16_4_ * auVar33._16_4_;
          auVar71._20_4_ = auVar33._20_4_ * auVar33._20_4_;
          auVar71._24_4_ = auVar33._24_4_ * auVar33._24_4_;
          auVar71._28_4_ = auVar33._28_4_;
          auVar23 = vcmpps_avx(auVar71,auVar70,2);
          local_260 = (uint)lVar135;
          auVar186 = vpshufd_avx(ZEXT416(local_260),0);
          auVar237 = vpor_avx(auVar186,_DAT_01f7fcf0);
          auVar186 = vpor_avx(auVar186,_DAT_01fafea0);
          auVar237 = vpcmpgtd_avx(_local_340,auVar237);
          auVar186 = vpcmpgtd_avx(_local_340,auVar186);
          auVar190._16_16_ = auVar186;
          auVar190._0_16_ = auVar237;
          auVar33 = auVar190 & auVar23;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0x7f,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar33 >> 0xbf,0) == '\0') &&
              (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar33[0x1f]) {
            auVar341 = ZEXT3264(auVar341._0_32_);
            _local_740 = *pauVar11;
          }
          else {
            local_6c0 = (float)local_740._0_4_ * (float)local_140._0_4_ +
                        fVar295 * (float)local_500._0_4_ +
                        (float)local_300._0_4_ * fVar194 + (float)local_320._0_4_ * fVar136;
            fStack_6bc = (float)local_740._4_4_ * (float)local_140._4_4_ +
                         fVar213 * (float)local_500._4_4_ +
                         (float)local_300._4_4_ * fVar208 + (float)local_320._4_4_ * fVar151;
            fStack_6b8 = (float)auStack_738._0_4_ * fStack_138 +
                         fVar322 * fStack_4f8 + fStack_2f8 * fVar216 + fStack_318 * fVar177;
            fStack_6b4 = (float)auStack_738._4_4_ * fStack_134 +
                         fVar314 * fStack_4f4 + fStack_2f4 * fVar230 + fStack_314 * fVar154;
            fStack_6b0 = fStack_730 * fStack_130 +
                         fVar317 * fStack_4f0 + fStack_2f0 * fVar235 + fStack_310 * fVar156;
            fStack_6ac = fStack_72c * fStack_12c +
                         fVar214 * fStack_4ec + fStack_2ec * fVar246 + fStack_30c * fVar158;
            fStack_6a8 = fStack_728 * fStack_128 +
                         fVar215 * fStack_4e8 + fStack_2e8 * fVar319 + fStack_308 * fVar160;
            fStack_6a4 = fStack_724 + auVar13._28_4_ + fVar287 + 0.0;
            local_5c0 = auVar121._0_4_;
            auStack_5bc._0_4_ = auVar121._4_4_;
            auStack_5bc._4_4_ = auVar121._8_4_;
            fStack_5b4 = auVar121._12_4_;
            fStack_5b0 = auVar121._16_4_;
            fStack_5ac = auVar121._20_4_;
            fStack_5a8 = auVar121._24_4_;
            local_6a0._0_4_ = auVar119._0_4_;
            local_6a0._4_4_ = auVar119._4_4_;
            fStack_698 = auVar119._8_4_;
            fStack_694 = auVar119._12_4_;
            fStack_690 = auVar119._16_4_;
            fStack_68c = auVar119._20_4_;
            fStack_688 = auVar119._24_4_;
            fVar251 = (float)local_320._0_4_ * (float)local_6a0._0_4_;
            fVar259 = (float)local_320._4_4_ * (float)local_6a0._4_4_;
            fVar261 = fStack_318 * fStack_698;
            fVar263 = fStack_314 * fStack_694;
            fVar264 = fStack_310 * fStack_690;
            fVar265 = fStack_30c * fStack_68c;
            fVar266 = fStack_308 * fStack_688;
            pfVar2 = (float *)(lVar22 + 0x21b0640 + lVar135 * 4);
            fVar194 = *pfVar2;
            fVar206 = pfVar2[1];
            fVar208 = pfVar2[2];
            fVar209 = pfVar2[3];
            fVar216 = pfVar2[4];
            fVar228 = pfVar2[5];
            fVar230 = pfVar2[6];
            pfVar3 = (float *)(lVar22 + 0x21b0ac4 + lVar135 * 4);
            fVar232 = *pfVar3;
            fVar235 = pfVar3[1];
            fVar245 = pfVar3[2];
            fVar246 = pfVar3[3];
            fVar247 = pfVar3[4];
            fVar319 = pfVar3[5];
            fVar285 = pfVar3[6];
            pfVar4 = (float *)(lVar22 + 0x21b01bc + lVar135 * 4);
            fVar295 = *pfVar4;
            fVar213 = pfVar4[1];
            fVar322 = pfVar4[2];
            fVar314 = pfVar4[3];
            fVar317 = pfVar4[4];
            fVar214 = pfVar4[5];
            fVar215 = pfVar4[6];
            fVar234 = pfVar2[7] + pfVar3[7];
            fVar178 = pfVar3[7] + fVar211 + 0.0;
            fVar267 = fVar211 + pfVar1[7] + fVar211 + 0.0;
            pfVar1 = (float *)(lVar22 + 0x21afd38 + lVar135 * 4);
            fVar136 = *pfVar1;
            fVar151 = pfVar1[1];
            fVar177 = pfVar1[2];
            fVar154 = pfVar1[3];
            fVar156 = pfVar1[4];
            fVar158 = pfVar1[5];
            fVar160 = pfVar1[6];
            local_6a0._4_4_ =
                 fVar151 * (float)local_4a0._4_4_ +
                 fVar213 * fVar229 +
                 (float)local_620._4_4_ * fVar206 + (float)local_4e0._4_4_ * fVar235;
            local_6a0._0_4_ =
                 fVar136 * (float)local_4a0._0_4_ +
                 fVar295 * fVar217 +
                 (float)local_620._0_4_ * fVar194 + (float)local_4e0._0_4_ * fVar232;
            fStack_698 = fVar177 * fStack_498 +
                         fVar322 * fVar231 + fStack_618 * fVar208 + fStack_4d8 * fVar245;
            fStack_694 = fVar154 * fStack_494 +
                         fVar314 * fVar233 + fStack_614 * fVar209 + fStack_4d4 * fVar246;
            fStack_690 = fVar156 * fStack_490 +
                         fVar317 * fVar217 + fStack_610 * fVar216 + fStack_4d0 * fVar247;
            fStack_68c = fVar158 * fStack_48c +
                         fVar214 * fVar229 + fStack_60c * fVar228 + fStack_4cc * fVar319;
            fStack_688 = fVar160 * fStack_488 +
                         fVar215 * fVar231 + fStack_608 * fVar230 + fStack_4c8 * fVar285;
            fStack_684 = fVar234 + fVar178;
            auVar172._0_4_ =
                 (float)local_100._0_4_ * fVar136 +
                 fVar179 * fVar194 + fVar323 * fVar232 + fVar295 * fVar354;
            auVar172._4_4_ =
                 (float)local_100._4_4_ * fVar151 +
                 fVar191 * fVar206 + fVar327 * fVar235 + fVar213 * fVar357;
            auVar172._8_4_ =
                 fStack_f8 * fVar177 + fVar192 * fVar208 + fVar329 * fVar245 + fVar322 * fVar358;
            auVar172._12_4_ =
                 fStack_f4 * fVar154 + fVar193 * fVar209 + fVar330 * fVar246 + fVar314 * fVar359;
            auVar172._16_4_ =
                 fStack_f0 * fVar156 + fVar324 * fVar216 + fVar323 * fVar247 + fVar317 * fVar354;
            auVar172._20_4_ =
                 fStack_ec * fVar158 + fVar207 * fVar228 + fVar327 * fVar319 + fVar214 * fVar357;
            auVar172._24_4_ =
                 fStack_e8 * fVar160 + fVar328 * fVar230 + fVar329 * fVar285 + fVar215 * fVar358;
            auVar172._28_4_ = fVar178 + fVar267;
            auVar339._0_4_ =
                 fVar295 * (float)local_500._0_4_ +
                 (float)local_300._0_4_ * fVar194 + (float)local_320._0_4_ * fVar232 +
                 fVar136 * (float)local_140._0_4_;
            auVar339._4_4_ =
                 fVar213 * (float)local_500._4_4_ +
                 (float)local_300._4_4_ * fVar206 + (float)local_320._4_4_ * fVar235 +
                 fVar151 * (float)local_140._4_4_;
            auVar339._8_4_ =
                 fVar322 * fStack_4f8 + fStack_2f8 * fVar208 + fStack_318 * fVar245 +
                 fVar177 * fStack_138;
            auVar339._12_4_ =
                 fVar314 * fStack_4f4 + fStack_2f4 * fVar209 + fStack_314 * fVar246 +
                 fVar154 * fStack_134;
            auVar339._16_4_ =
                 fVar317 * fStack_4f0 + fStack_2f0 * fVar216 + fStack_310 * fVar247 +
                 fVar156 * fStack_130;
            auVar339._20_4_ =
                 fVar214 * fStack_4ec + fStack_2ec * fVar228 + fStack_30c * fVar319 +
                 fVar158 * fStack_12c;
            auVar339._24_4_ =
                 fVar215 * fStack_4e8 + fStack_2e8 * fVar230 + fStack_308 * fVar285 +
                 fVar160 * fStack_128;
            auVar339._28_4_ = pfVar4[7] + fVar234 + fVar267;
            pfVar1 = (float *)(lVar22 + 0x21b2a60 + lVar135 * 4);
            fVar194 = *pfVar1;
            fVar206 = pfVar1[1];
            fVar208 = pfVar1[2];
            fVar209 = pfVar1[3];
            fVar216 = pfVar1[4];
            fVar228 = pfVar1[5];
            fVar230 = pfVar1[6];
            pfVar2 = (float *)(lVar22 + 0x21b2ee4 + lVar135 * 4);
            fVar232 = *pfVar2;
            fVar235 = pfVar2[1];
            fVar245 = pfVar2[2];
            fVar246 = pfVar2[3];
            fVar247 = pfVar2[4];
            fVar319 = pfVar2[5];
            fVar285 = pfVar2[6];
            pfVar3 = (float *)(lVar22 + 0x21b25dc + lVar135 * 4);
            fVar295 = *pfVar3;
            fVar213 = pfVar3[1];
            fVar322 = pfVar3[2];
            fVar314 = pfVar3[3];
            fVar317 = pfVar3[4];
            fVar214 = pfVar3[5];
            fVar215 = pfVar3[6];
            pfVar4 = (float *)(lVar22 + 0x21b2158 + lVar135 * 4);
            fVar136 = *pfVar4;
            fVar151 = pfVar4[1];
            fVar177 = pfVar4[2];
            fVar154 = pfVar4[3];
            fVar156 = pfVar4[4];
            fVar158 = pfVar4[5];
            fVar160 = pfVar4[6];
            auVar299._0_4_ =
                 fVar136 * (float)local_4a0._0_4_ +
                 fVar295 * fVar217 +
                 (float)local_620._0_4_ * fVar194 + (float)local_4e0._0_4_ * fVar232;
            auVar299._4_4_ =
                 fVar151 * (float)local_4a0._4_4_ +
                 fVar213 * fVar229 +
                 (float)local_620._4_4_ * fVar206 + (float)local_4e0._4_4_ * fVar235;
            auVar299._8_4_ =
                 fVar177 * fStack_498 +
                 fVar322 * fVar231 + fStack_618 * fVar208 + fStack_4d8 * fVar245;
            auVar299._12_4_ =
                 fVar154 * fStack_494 +
                 fVar314 * fVar233 + fStack_614 * fVar209 + fStack_4d4 * fVar246;
            auVar299._16_4_ =
                 fVar156 * fStack_490 +
                 fVar317 * fVar217 + fStack_610 * fVar216 + fStack_4d0 * fVar247;
            auVar299._20_4_ =
                 fVar158 * fStack_48c +
                 fVar214 * fVar229 + fStack_60c * fVar228 + fStack_4cc * fVar319;
            auVar299._24_4_ =
                 fVar160 * fStack_488 +
                 fVar215 * fVar231 + fStack_608 * fVar230 + fStack_4c8 * fVar285;
            auVar299._28_4_ = fStack_4c4 + fStack_4c4 + fStack_604 + fStack_4c4;
            auVar335._0_4_ =
                 fVar136 * (float)local_100._0_4_ +
                 fVar295 * fVar354 + fVar179 * fVar194 + fVar232 * fVar323;
            auVar335._4_4_ =
                 fVar151 * (float)local_100._4_4_ +
                 fVar213 * fVar357 + fVar191 * fVar206 + fVar235 * fVar327;
            auVar335._8_4_ =
                 fVar177 * fStack_f8 + fVar322 * fVar358 + fVar192 * fVar208 + fVar245 * fVar329;
            auVar335._12_4_ =
                 fVar154 * fStack_f4 + fVar314 * fVar359 + fVar193 * fVar209 + fVar246 * fVar330;
            auVar335._16_4_ =
                 fVar156 * fStack_f0 + fVar317 * fVar354 + fVar324 * fVar216 + fVar247 * fVar323;
            auVar335._20_4_ =
                 fVar158 * fStack_ec + fVar214 * fVar357 + fVar207 * fVar228 + fVar319 * fVar327;
            auVar335._24_4_ =
                 fVar160 * fStack_e8 + fVar215 * fVar358 + fVar328 * fVar230 + fVar285 * fVar329;
            auVar335._28_4_ = fStack_4c4 + fStack_4c4 + fStack_e4 + fStack_4c4;
            auVar244._8_4_ = 0x7fffffff;
            auVar244._0_8_ = 0x7fffffff7fffffff;
            auVar244._12_4_ = 0x7fffffff;
            auVar244._16_4_ = 0x7fffffff;
            auVar244._20_4_ = 0x7fffffff;
            auVar244._24_4_ = 0x7fffffff;
            auVar244._28_4_ = 0x7fffffff;
            auVar13 = vandps_avx(_local_6a0,auVar244);
            auVar33 = vandps_avx(auVar172,auVar244);
            auVar33 = vmaxps_avx(auVar13,auVar33);
            auVar13 = vandps_avx(auVar339,auVar244);
            auVar33 = vmaxps_avx(auVar33,auVar13);
            auVar33 = vcmpps_avx(auVar33,local_360,1);
            auVar40 = vblendvps_avx(_local_6a0,auVar242,auVar33);
            auVar147._0_4_ =
                 fVar136 * (float)local_140._0_4_ +
                 fVar295 * (float)local_500._0_4_ +
                 (float)local_320._0_4_ * fVar232 + (float)local_300._0_4_ * fVar194;
            auVar147._4_4_ =
                 fVar151 * (float)local_140._4_4_ +
                 fVar213 * (float)local_500._4_4_ +
                 (float)local_320._4_4_ * fVar235 + (float)local_300._4_4_ * fVar206;
            auVar147._8_4_ =
                 fVar177 * fStack_138 +
                 fVar322 * fStack_4f8 + fStack_318 * fVar245 + fStack_2f8 * fVar208;
            auVar147._12_4_ =
                 fVar154 * fStack_134 +
                 fVar314 * fStack_4f4 + fStack_314 * fVar246 + fStack_2f4 * fVar209;
            auVar147._16_4_ =
                 fVar156 * fStack_130 +
                 fVar317 * fStack_4f0 + fStack_310 * fVar247 + fStack_2f0 * fVar216;
            auVar147._20_4_ =
                 fVar158 * fStack_12c +
                 fVar214 * fStack_4ec + fStack_30c * fVar319 + fStack_2ec * fVar228;
            auVar147._24_4_ =
                 fVar160 * fStack_128 +
                 fVar215 * fStack_4e8 + fStack_308 * fVar285 + fStack_2e8 * fVar230;
            auVar147._28_4_ = auVar13._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar308 = vblendvps_avx(auVar172,auVar32,auVar33);
            auVar13 = vandps_avx(auVar299,auVar244);
            auVar33 = vandps_avx(auVar335,auVar244);
            auVar200 = vmaxps_avx(auVar13,auVar33);
            auVar13 = vandps_avx(auVar147,auVar244);
            auVar13 = vmaxps_avx(auVar200,auVar13);
            local_5a0._0_4_ = auVar122._0_4_;
            local_5a0._4_4_ = auVar122._4_4_;
            fStack_598 = auVar122._8_4_;
            fStack_594 = auVar122._12_4_;
            auStack_590._0_4_ = auVar122._16_4_;
            auStack_590._4_4_ = auVar122._20_4_;
            fStack_588 = auVar122._24_4_;
            auVar33 = vcmpps_avx(auVar13,local_360,1);
            auVar13 = vblendvps_avx(auVar299,auVar242,auVar33);
            auVar148._0_4_ =
                 (float)local_140._0_4_ * (float)local_5a0._0_4_ +
                 (float)local_500._0_4_ * (float)local_5c0 +
                 (float)local_300._0_4_ * fVar210 + fVar251;
            auVar148._4_4_ =
                 (float)local_140._4_4_ * (float)local_5a0._4_4_ +
                 (float)local_500._4_4_ * (float)auStack_5bc._0_4_ +
                 (float)local_300._4_4_ * fVar320 + fVar259;
            auVar148._8_4_ =
                 fStack_138 * fStack_598 +
                 fStack_4f8 * (float)auStack_5bc._4_4_ + fStack_2f8 * fVar289 + fVar261;
            auVar148._12_4_ =
                 fStack_134 * fStack_594 + fStack_4f4 * fStack_5b4 + fStack_2f4 * fVar291 + fVar263;
            auVar148._16_4_ =
                 fStack_130 * (float)auStack_590._0_4_ +
                 fStack_4f0 * fStack_5b0 + fStack_2f0 * fVar212 + fVar264;
            auVar148._20_4_ =
                 fStack_12c * (float)auStack_590._4_4_ +
                 fStack_4ec * fStack_5ac + fStack_2ec * fVar321 + fVar265;
            auVar148._24_4_ =
                 fStack_128 * fStack_588 + fStack_4e8 * fStack_5a8 + fStack_2e8 * fVar293 + fVar266;
            auVar148._28_4_ = auVar200._28_4_ + fStack_6a4 + fVar287 + 0.0;
            auVar242 = vblendvps_avx(auVar335,auVar32,auVar33);
            fVar177 = auVar40._0_4_;
            fVar154 = auVar40._4_4_;
            fVar156 = auVar40._8_4_;
            fVar158 = auVar40._12_4_;
            fVar160 = auVar40._16_4_;
            fVar179 = auVar40._20_4_;
            fVar191 = auVar40._24_4_;
            fVar192 = auVar40._28_4_;
            fVar246 = auVar13._0_4_;
            fVar319 = auVar13._4_4_;
            fVar287 = auVar13._8_4_;
            fVar320 = auVar13._12_4_;
            fVar291 = auVar13._16_4_;
            fVar321 = auVar13._20_4_;
            fVar295 = auVar13._24_4_;
            fVar324 = auVar308._0_4_;
            fVar328 = auVar308._4_4_;
            fVar194 = auVar308._8_4_;
            fVar208 = auVar308._12_4_;
            fVar216 = auVar308._16_4_;
            fVar230 = auVar308._20_4_;
            fVar235 = auVar308._24_4_;
            auVar309._0_4_ = fVar324 * fVar324 + fVar177 * fVar177;
            auVar309._4_4_ = fVar328 * fVar328 + fVar154 * fVar154;
            auVar309._8_4_ = fVar194 * fVar194 + fVar156 * fVar156;
            auVar309._12_4_ = fVar208 * fVar208 + fVar158 * fVar158;
            auVar309._16_4_ = fVar216 * fVar216 + fVar160 * fVar160;
            auVar309._20_4_ = fVar230 * fVar230 + fVar179 * fVar179;
            auVar309._24_4_ = fVar235 * fVar235 + fVar191 * fVar191;
            auVar309._28_4_ = fVar211 + auVar32._28_4_;
            auVar32 = vrsqrtps_avx(auVar309);
            fVar207 = auVar32._0_4_;
            fVar211 = auVar32._4_4_;
            auVar72._4_4_ = fVar211 * 1.5;
            auVar72._0_4_ = fVar207 * 1.5;
            fVar206 = auVar32._8_4_;
            auVar72._8_4_ = fVar206 * 1.5;
            fVar209 = auVar32._12_4_;
            auVar72._12_4_ = fVar209 * 1.5;
            fVar228 = auVar32._16_4_;
            auVar72._16_4_ = fVar228 * 1.5;
            fVar232 = auVar32._20_4_;
            auVar72._20_4_ = fVar232 * 1.5;
            fVar245 = auVar32._24_4_;
            auVar72._24_4_ = fVar245 * 1.5;
            auVar72._28_4_ = auVar335._28_4_;
            auVar73._4_4_ = fVar211 * fVar211 * fVar211 * auVar309._4_4_ * 0.5;
            auVar73._0_4_ = fVar207 * fVar207 * fVar207 * auVar309._0_4_ * 0.5;
            auVar73._8_4_ = fVar206 * fVar206 * fVar206 * auVar309._8_4_ * 0.5;
            auVar73._12_4_ = fVar209 * fVar209 * fVar209 * auVar309._12_4_ * 0.5;
            auVar73._16_4_ = fVar228 * fVar228 * fVar228 * auVar309._16_4_ * 0.5;
            auVar73._20_4_ = fVar232 * fVar232 * fVar232 * auVar309._20_4_ * 0.5;
            auVar73._24_4_ = fVar245 * fVar245 * fVar245 * auVar309._24_4_ * 0.5;
            auVar73._28_4_ = auVar309._28_4_;
            auVar33 = vsubps_avx(auVar72,auVar73);
            fVar322 = auVar33._0_4_;
            fVar314 = auVar33._4_4_;
            fVar317 = auVar33._8_4_;
            fVar214 = auVar33._12_4_;
            fVar215 = auVar33._16_4_;
            fVar136 = auVar33._20_4_;
            fVar151 = auVar33._24_4_;
            fVar207 = auVar242._0_4_;
            fVar211 = auVar242._4_4_;
            fVar206 = auVar242._8_4_;
            fVar209 = auVar242._12_4_;
            fVar228 = auVar242._16_4_;
            fVar232 = auVar242._20_4_;
            fVar245 = auVar242._24_4_;
            auVar282._0_4_ = fVar207 * fVar207 + fVar246 * fVar246;
            auVar282._4_4_ = fVar211 * fVar211 + fVar319 * fVar319;
            auVar282._8_4_ = fVar206 * fVar206 + fVar287 * fVar287;
            auVar282._12_4_ = fVar209 * fVar209 + fVar320 * fVar320;
            auVar282._16_4_ = fVar228 * fVar228 + fVar291 * fVar291;
            auVar282._20_4_ = fVar232 * fVar232 + fVar321 * fVar321;
            auVar282._24_4_ = fVar245 * fVar245 + fVar295 * fVar295;
            auVar282._28_4_ = auVar32._28_4_ + auVar13._28_4_;
            auVar13 = vrsqrtps_avx(auVar282);
            fVar247 = auVar13._0_4_;
            fVar285 = auVar13._4_4_;
            auVar74._4_4_ = fVar285 * 1.5;
            auVar74._0_4_ = fVar247 * 1.5;
            fVar210 = auVar13._8_4_;
            auVar74._8_4_ = fVar210 * 1.5;
            fVar289 = auVar13._12_4_;
            auVar74._12_4_ = fVar289 * 1.5;
            fVar212 = auVar13._16_4_;
            auVar74._16_4_ = fVar212 * 1.5;
            fVar293 = auVar13._20_4_;
            auVar74._20_4_ = fVar293 * 1.5;
            fVar213 = auVar13._24_4_;
            auVar74._24_4_ = fVar213 * 1.5;
            auVar74._28_4_ = auVar335._28_4_;
            auVar75._4_4_ = fVar285 * fVar285 * fVar285 * auVar282._4_4_ * 0.5;
            auVar75._0_4_ = fVar247 * fVar247 * fVar247 * auVar282._0_4_ * 0.5;
            auVar75._8_4_ = fVar210 * fVar210 * fVar210 * auVar282._8_4_ * 0.5;
            auVar75._12_4_ = fVar289 * fVar289 * fVar289 * auVar282._12_4_ * 0.5;
            auVar75._16_4_ = fVar212 * fVar212 * fVar212 * auVar282._16_4_ * 0.5;
            auVar75._20_4_ = fVar293 * fVar293 * fVar293 * auVar282._20_4_ * 0.5;
            auVar75._24_4_ = fVar213 * fVar213 * fVar213 * auVar282._24_4_ * 0.5;
            auVar75._28_4_ = auVar282._28_4_;
            auVar242 = vsubps_avx(auVar74,auVar75);
            fVar247 = auVar242._0_4_;
            fVar285 = auVar242._4_4_;
            fVar210 = auVar242._8_4_;
            fVar289 = auVar242._12_4_;
            fVar212 = auVar242._16_4_;
            fVar293 = auVar242._20_4_;
            fVar213 = auVar242._24_4_;
            fVar324 = fVar137 * fVar322 * fVar324;
            fVar328 = fVar152 * fVar314 * fVar328;
            auVar76._4_4_ = fVar328;
            auVar76._0_4_ = fVar324;
            fVar194 = fVar153 * fVar317 * fVar194;
            auVar76._8_4_ = fVar194;
            fVar208 = fVar155 * fVar214 * fVar208;
            auVar76._12_4_ = fVar208;
            fVar216 = fVar157 * fVar215 * fVar216;
            auVar76._16_4_ = fVar216;
            fVar230 = fVar159 * fVar136 * fVar230;
            auVar76._20_4_ = fVar230;
            fVar235 = fVar161 * fVar151 * fVar235;
            auVar76._24_4_ = fVar235;
            auVar76._28_4_ = auVar13._28_4_;
            local_5a0._4_4_ = fVar328 + (float)local_820._4_4_;
            local_5a0._0_4_ = fVar324 + (float)local_820._0_4_;
            fStack_598 = fVar194 + fStack_818;
            fStack_594 = fVar208 + fStack_814;
            auStack_590._0_4_ = fVar216 + fStack_810;
            auStack_590._4_4_ = fVar230 + fStack_80c;
            fStack_588 = fVar235 + fStack_808;
            fStack_584 = auVar13._28_4_ + fStack_804;
            local_680 = fVar137 * fVar322 * -fVar177;
            fStack_67c = fVar152 * fVar314 * -fVar154;
            auVar77._4_4_ = fStack_67c;
            auVar77._0_4_ = local_680;
            fStack_678 = fVar153 * fVar317 * -fVar156;
            auVar77._8_4_ = fStack_678;
            fStack_674 = fVar155 * fVar214 * -fVar158;
            auVar77._12_4_ = fStack_674;
            fStack_670 = fVar157 * fVar215 * -fVar160;
            auVar77._16_4_ = fStack_670;
            fStack_66c = fVar159 * fVar136 * -fVar179;
            auVar77._20_4_ = fStack_66c;
            fStack_668 = fVar161 * fVar151 * -fVar191;
            auVar77._24_4_ = fStack_668;
            auVar77._28_4_ = -fVar192;
            local_680 = auVar204._0_4_ + local_680;
            fStack_67c = auVar204._4_4_ + fStack_67c;
            fStack_678 = auVar204._8_4_ + fStack_678;
            fStack_674 = auVar204._12_4_ + fStack_674;
            fStack_670 = auVar204._16_4_ + fStack_670;
            fStack_66c = auVar204._20_4_ + fStack_66c;
            fStack_668 = auVar204._24_4_ + fStack_668;
            fStack_664 = auVar204._28_4_ + -fVar192;
            fVar324 = fVar322 * 0.0 * fVar137;
            fVar328 = fVar314 * 0.0 * fVar152;
            auVar78._4_4_ = fVar328;
            auVar78._0_4_ = fVar324;
            fVar194 = fVar317 * 0.0 * fVar153;
            auVar78._8_4_ = fVar194;
            fVar208 = fVar214 * 0.0 * fVar155;
            auVar78._12_4_ = fVar208;
            fVar216 = fVar215 * 0.0 * fVar157;
            auVar78._16_4_ = fVar216;
            fVar230 = fVar136 * 0.0 * fVar159;
            auVar78._20_4_ = fVar230;
            fVar235 = fVar151 * 0.0 * fVar161;
            auVar78._24_4_ = fVar235;
            auVar78._28_4_ = fVar192;
            auVar13 = vsubps_avx(_local_820,auVar76);
            auVar356._0_4_ = fVar324 + auVar148._0_4_;
            auVar356._4_4_ = fVar328 + auVar148._4_4_;
            auVar356._8_4_ = fVar194 + auVar148._8_4_;
            auVar356._12_4_ = fVar208 + auVar148._12_4_;
            auVar356._16_4_ = fVar216 + auVar148._16_4_;
            auVar356._20_4_ = fVar230 + auVar148._20_4_;
            auVar356._24_4_ = fVar235 + auVar148._24_4_;
            auVar356._28_4_ = fVar192 + auVar148._28_4_;
            fVar324 = auVar281._0_4_ * fVar247 * fVar207;
            fVar207 = auVar281._4_4_ * fVar285 * fVar211;
            auVar79._4_4_ = fVar207;
            auVar79._0_4_ = fVar324;
            fVar328 = auVar281._8_4_ * fVar210 * fVar206;
            auVar79._8_4_ = fVar328;
            fVar211 = auVar281._12_4_ * fVar289 * fVar209;
            auVar79._12_4_ = fVar211;
            fVar194 = auVar281._16_4_ * fVar212 * fVar228;
            auVar79._16_4_ = fVar194;
            fVar206 = auVar281._20_4_ * fVar293 * fVar232;
            auVar79._20_4_ = fVar206;
            fVar208 = auVar281._24_4_ * fVar213 * fVar245;
            auVar79._24_4_ = fVar208;
            auVar79._28_4_ = fStack_804;
            auVar332 = vsubps_avx(auVar204,auVar77);
            auVar340._0_4_ = auVar257._0_4_ + fVar324;
            auVar340._4_4_ = auVar257._4_4_ + fVar207;
            auVar340._8_4_ = auVar257._8_4_ + fVar328;
            auVar340._12_4_ = auVar257._12_4_ + fVar211;
            auVar340._16_4_ = auVar257._16_4_ + fVar194;
            auVar340._20_4_ = auVar257._20_4_ + fVar206;
            auVar340._24_4_ = auVar257._24_4_ + fVar208;
            auVar340._28_4_ = auVar257._28_4_ + fStack_804;
            fVar324 = fVar247 * -fVar246 * auVar281._0_4_;
            fVar207 = fVar285 * -fVar319 * auVar281._4_4_;
            auVar80._4_4_ = fVar207;
            auVar80._0_4_ = fVar324;
            fVar328 = fVar210 * -fVar287 * auVar281._8_4_;
            auVar80._8_4_ = fVar328;
            fVar211 = fVar289 * -fVar320 * auVar281._12_4_;
            auVar80._12_4_ = fVar211;
            fVar194 = fVar212 * -fVar291 * auVar281._16_4_;
            auVar80._16_4_ = fVar194;
            fVar206 = fVar293 * -fVar321 * auVar281._20_4_;
            auVar80._20_4_ = fVar206;
            fVar208 = fVar213 * -fVar295 * auVar281._24_4_;
            auVar80._24_4_ = fVar208;
            auVar80._28_4_ = fVar162;
            auVar36 = vsubps_avx(auVar148,auVar78);
            auVar226._0_4_ = auVar243._0_4_ + fVar324;
            auVar226._4_4_ = auVar243._4_4_ + fVar207;
            auVar226._8_4_ = auVar243._8_4_ + fVar328;
            auVar226._12_4_ = auVar243._12_4_ + fVar211;
            auVar226._16_4_ = auVar243._16_4_ + fVar194;
            auVar226._20_4_ = auVar243._20_4_ + fVar206;
            auVar226._24_4_ = auVar243._24_4_ + fVar208;
            auVar226._28_4_ = auVar243._28_4_ + fVar162;
            fVar324 = fVar247 * 0.0 * auVar281._0_4_;
            fVar207 = fVar285 * 0.0 * auVar281._4_4_;
            auVar81._4_4_ = fVar207;
            auVar81._0_4_ = fVar324;
            fVar328 = fVar210 * 0.0 * auVar281._8_4_;
            auVar81._8_4_ = fVar328;
            fVar211 = fVar289 * 0.0 * auVar281._12_4_;
            auVar81._12_4_ = fVar211;
            fVar194 = fVar212 * 0.0 * auVar281._16_4_;
            auVar81._16_4_ = fVar194;
            fVar206 = fVar293 * 0.0 * auVar281._20_4_;
            auVar81._20_4_ = fVar206;
            fVar208 = fVar213 * 0.0 * auVar281._24_4_;
            auVar81._24_4_ = fVar208;
            auVar81._28_4_ = auVar148._28_4_;
            auVar32 = vsubps_avx(auVar257,auVar79);
            auVar116._4_4_ = fStack_6bc;
            auVar116._0_4_ = local_6c0;
            auVar116._8_4_ = fStack_6b8;
            auVar116._12_4_ = fStack_6b4;
            auVar116._16_4_ = fStack_6b0;
            auVar116._20_4_ = fStack_6ac;
            auVar116._24_4_ = fStack_6a8;
            auVar116._28_4_ = fStack_6a4;
            auVar300._0_4_ = local_6c0 + fVar324;
            auVar300._4_4_ = fStack_6bc + fVar207;
            auVar300._8_4_ = fStack_6b8 + fVar328;
            auVar300._12_4_ = fStack_6b4 + fVar211;
            auVar300._16_4_ = fStack_6b0 + fVar194;
            auVar300._20_4_ = fStack_6ac + fVar206;
            auVar300._24_4_ = fStack_6a8 + fVar208;
            auVar300._28_4_ = fStack_6a4 + auVar148._28_4_;
            auVar33 = vsubps_avx(auVar243,auVar80);
            auVar40 = vsubps_avx(auVar116,auVar81);
            auVar308 = vsubps_avx(auVar226,auVar332);
            auVar200 = vsubps_avx(auVar300,auVar36);
            auVar82._4_4_ = auVar36._4_4_ * auVar308._4_4_;
            auVar82._0_4_ = auVar36._0_4_ * auVar308._0_4_;
            auVar82._8_4_ = auVar36._8_4_ * auVar308._8_4_;
            auVar82._12_4_ = auVar36._12_4_ * auVar308._12_4_;
            auVar82._16_4_ = auVar36._16_4_ * auVar308._16_4_;
            auVar82._20_4_ = auVar36._20_4_ * auVar308._20_4_;
            auVar82._24_4_ = auVar36._24_4_ * auVar308._24_4_;
            auVar82._28_4_ = auVar335._28_4_;
            auVar83._4_4_ = auVar332._4_4_ * auVar200._4_4_;
            auVar83._0_4_ = auVar332._0_4_ * auVar200._0_4_;
            auVar83._8_4_ = auVar332._8_4_ * auVar200._8_4_;
            auVar83._12_4_ = auVar332._12_4_ * auVar200._12_4_;
            auVar83._16_4_ = auVar332._16_4_ * auVar200._16_4_;
            auVar83._20_4_ = auVar332._20_4_ * auVar200._20_4_;
            auVar83._24_4_ = auVar332._24_4_ * auVar200._24_4_;
            auVar83._28_4_ = fStack_6a4;
            auVar143 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar13._4_4_ * auVar200._4_4_;
            auVar84._0_4_ = auVar13._0_4_ * auVar200._0_4_;
            auVar84._8_4_ = auVar13._8_4_ * auVar200._8_4_;
            auVar84._12_4_ = auVar13._12_4_ * auVar200._12_4_;
            auVar84._16_4_ = auVar13._16_4_ * auVar200._16_4_;
            auVar84._20_4_ = auVar13._20_4_ * auVar200._20_4_;
            auVar84._24_4_ = auVar13._24_4_ * auVar200._24_4_;
            auVar84._28_4_ = auVar200._28_4_;
            auVar200 = vsubps_avx(auVar340,auVar13);
            auVar85._4_4_ = auVar36._4_4_ * auVar200._4_4_;
            auVar85._0_4_ = auVar36._0_4_ * auVar200._0_4_;
            auVar85._8_4_ = auVar36._8_4_ * auVar200._8_4_;
            auVar85._12_4_ = auVar36._12_4_ * auVar200._12_4_;
            auVar85._16_4_ = auVar36._16_4_ * auVar200._16_4_;
            auVar85._20_4_ = auVar36._20_4_ * auVar200._20_4_;
            auVar85._24_4_ = auVar36._24_4_ * auVar200._24_4_;
            auVar85._28_4_ = auVar242._28_4_;
            auVar199 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar332._4_4_ * auVar200._4_4_;
            auVar86._0_4_ = auVar332._0_4_ * auVar200._0_4_;
            auVar86._8_4_ = auVar332._8_4_ * auVar200._8_4_;
            auVar86._12_4_ = auVar332._12_4_ * auVar200._12_4_;
            auVar86._16_4_ = auVar332._16_4_ * auVar200._16_4_;
            auVar86._20_4_ = auVar332._20_4_ * auVar200._20_4_;
            auVar86._24_4_ = auVar332._24_4_ * auVar200._24_4_;
            auVar86._28_4_ = auVar242._28_4_;
            auVar87._4_4_ = auVar13._4_4_ * auVar308._4_4_;
            auVar87._0_4_ = auVar13._0_4_ * auVar308._0_4_;
            auVar87._8_4_ = auVar13._8_4_ * auVar308._8_4_;
            auVar87._12_4_ = auVar13._12_4_ * auVar308._12_4_;
            auVar87._16_4_ = auVar13._16_4_ * auVar308._16_4_;
            auVar87._20_4_ = auVar13._20_4_ * auVar308._20_4_;
            auVar87._24_4_ = auVar13._24_4_ * auVar308._24_4_;
            auVar87._28_4_ = auVar308._28_4_;
            auVar242 = vsubps_avx(auVar87,auVar86);
            auVar173._0_4_ = auVar143._0_4_ * 0.0 + auVar242._0_4_ + auVar199._0_4_ * 0.0;
            auVar173._4_4_ = auVar143._4_4_ * 0.0 + auVar242._4_4_ + auVar199._4_4_ * 0.0;
            auVar173._8_4_ = auVar143._8_4_ * 0.0 + auVar242._8_4_ + auVar199._8_4_ * 0.0;
            auVar173._12_4_ = auVar143._12_4_ * 0.0 + auVar242._12_4_ + auVar199._12_4_ * 0.0;
            auVar173._16_4_ = auVar143._16_4_ * 0.0 + auVar242._16_4_ + auVar199._16_4_ * 0.0;
            auVar173._20_4_ = auVar143._20_4_ * 0.0 + auVar242._20_4_ + auVar199._20_4_ * 0.0;
            auVar173._24_4_ = auVar143._24_4_ * 0.0 + auVar242._24_4_ + auVar199._24_4_ * 0.0;
            auVar173._28_4_ = auVar143._28_4_ + auVar242._28_4_ + auVar199._28_4_;
            auVar274 = vcmpps_avx(auVar173,ZEXT832(0) << 0x20,2);
            auVar242 = vblendvps_avx(auVar32,_local_5a0,auVar274);
            auVar205 = ZEXT3264(auVar242);
            auVar118._4_4_ = fStack_67c;
            auVar118._0_4_ = local_680;
            auVar118._8_4_ = fStack_678;
            auVar118._12_4_ = fStack_674;
            auVar118._16_4_ = fStack_670;
            auVar118._20_4_ = fStack_66c;
            auVar118._24_4_ = fStack_668;
            auVar118._28_4_ = fStack_664;
            auVar32 = vblendvps_avx(auVar33,auVar118,auVar274);
            auVar33 = vblendvps_avx(auVar40,auVar356,auVar274);
            auVar40 = vblendvps_avx(auVar13,auVar340,auVar274);
            auVar308 = vblendvps_avx(auVar332,auVar226,auVar274);
            auVar200 = vblendvps_avx(auVar36,auVar300,auVar274);
            auVar143 = vblendvps_avx(auVar340,auVar13,auVar274);
            auVar199 = vblendvps_avx(auVar226,auVar332,auVar274);
            auVar223 = vblendvps_avx(auVar300,auVar36,auVar274);
            auVar13 = vandps_avx(auVar190,auVar23);
            auVar143 = vsubps_avx(auVar143,auVar242);
            auVar37 = vsubps_avx(auVar199,auVar32);
            auVar223 = vsubps_avx(auVar223,auVar33);
            auVar38 = vsubps_avx(auVar32,auVar308);
            fVar324 = auVar37._0_4_;
            fVar263 = auVar33._0_4_;
            fVar209 = auVar37._4_4_;
            fVar264 = auVar33._4_4_;
            auVar88._4_4_ = fVar264 * fVar209;
            auVar88._0_4_ = fVar263 * fVar324;
            fVar246 = auVar37._8_4_;
            fVar265 = auVar33._8_4_;
            auVar88._8_4_ = fVar265 * fVar246;
            fVar289 = auVar37._12_4_;
            fVar266 = auVar33._12_4_;
            auVar88._12_4_ = fVar266 * fVar289;
            fVar322 = auVar37._16_4_;
            fVar267 = auVar33._16_4_;
            auVar88._16_4_ = fVar267 * fVar322;
            fVar177 = auVar37._20_4_;
            fVar248 = auVar33._20_4_;
            auVar88._20_4_ = fVar248 * fVar177;
            fVar192 = auVar37._24_4_;
            fVar250 = auVar33._24_4_;
            auVar88._24_4_ = fVar250 * fVar192;
            auVar88._28_4_ = auVar199._28_4_;
            fVar207 = auVar32._0_4_;
            fVar176 = auVar223._0_4_;
            fVar216 = auVar32._4_4_;
            fVar260 = auVar223._4_4_;
            auVar89._4_4_ = fVar260 * fVar216;
            auVar89._0_4_ = fVar176 * fVar207;
            fVar247 = auVar32._8_4_;
            fVar262 = auVar223._8_4_;
            auVar89._8_4_ = fVar262 * fVar247;
            fVar291 = auVar32._12_4_;
            fVar276 = auVar223._12_4_;
            auVar89._12_4_ = fVar276 * fVar291;
            fVar314 = auVar32._16_4_;
            fVar284 = auVar223._16_4_;
            auVar89._16_4_ = fVar284 * fVar314;
            fVar154 = auVar32._20_4_;
            fVar286 = auVar223._20_4_;
            auVar89._20_4_ = fVar286 * fVar154;
            fVar193 = auVar32._24_4_;
            fVar288 = auVar223._24_4_;
            uVar12 = auVar332._28_4_;
            auVar89._24_4_ = fVar288 * fVar193;
            auVar89._28_4_ = uVar12;
            auVar199 = vsubps_avx(auVar89,auVar88);
            fVar328 = auVar242._0_4_;
            fVar228 = auVar242._4_4_;
            auVar90._4_4_ = fVar260 * fVar228;
            auVar90._0_4_ = fVar176 * fVar328;
            fVar319 = auVar242._8_4_;
            auVar90._8_4_ = fVar262 * fVar319;
            fVar212 = auVar242._12_4_;
            auVar90._12_4_ = fVar276 * fVar212;
            fVar317 = auVar242._16_4_;
            auVar90._16_4_ = fVar284 * fVar317;
            fVar156 = auVar242._20_4_;
            auVar90._20_4_ = fVar286 * fVar156;
            fVar234 = auVar242._24_4_;
            auVar90._24_4_ = fVar288 * fVar234;
            auVar90._28_4_ = uVar12;
            fVar211 = auVar143._0_4_;
            fVar230 = auVar143._4_4_;
            auVar91._4_4_ = fVar264 * fVar230;
            auVar91._0_4_ = fVar263 * fVar211;
            fVar285 = auVar143._8_4_;
            auVar91._8_4_ = fVar265 * fVar285;
            fVar321 = auVar143._12_4_;
            auVar91._12_4_ = fVar266 * fVar321;
            fVar214 = auVar143._16_4_;
            auVar91._16_4_ = fVar267 * fVar214;
            fVar158 = auVar143._20_4_;
            auVar91._20_4_ = fVar248 * fVar158;
            fVar178 = auVar143._24_4_;
            auVar91._24_4_ = fVar250 * fVar178;
            auVar91._28_4_ = auVar340._28_4_;
            auVar332 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar216 * fVar230;
            auVar92._0_4_ = fVar207 * fVar211;
            auVar92._8_4_ = fVar247 * fVar285;
            auVar92._12_4_ = fVar291 * fVar321;
            auVar92._16_4_ = fVar314 * fVar214;
            auVar92._20_4_ = fVar154 * fVar158;
            auVar92._24_4_ = fVar193 * fVar178;
            auVar92._28_4_ = uVar12;
            auVar93._4_4_ = fVar228 * fVar209;
            auVar93._0_4_ = fVar328 * fVar324;
            auVar93._8_4_ = fVar319 * fVar246;
            auVar93._12_4_ = fVar212 * fVar289;
            auVar93._16_4_ = fVar317 * fVar322;
            auVar93._20_4_ = fVar156 * fVar177;
            auVar93._24_4_ = fVar234 * fVar192;
            auVar93._28_4_ = auVar36._28_4_;
            auVar36 = vsubps_avx(auVar93,auVar92);
            auVar39 = vsubps_avx(auVar33,auVar200);
            fVar206 = auVar36._28_4_ + auVar332._28_4_;
            auVar310._0_4_ = auVar36._0_4_ + auVar332._0_4_ * 0.0 + auVar199._0_4_ * 0.0;
            auVar310._4_4_ = auVar36._4_4_ + auVar332._4_4_ * 0.0 + auVar199._4_4_ * 0.0;
            auVar310._8_4_ = auVar36._8_4_ + auVar332._8_4_ * 0.0 + auVar199._8_4_ * 0.0;
            auVar310._12_4_ = auVar36._12_4_ + auVar332._12_4_ * 0.0 + auVar199._12_4_ * 0.0;
            auVar310._16_4_ = auVar36._16_4_ + auVar332._16_4_ * 0.0 + auVar199._16_4_ * 0.0;
            auVar310._20_4_ = auVar36._20_4_ + auVar332._20_4_ * 0.0 + auVar199._20_4_ * 0.0;
            auVar310._24_4_ = auVar36._24_4_ + auVar332._24_4_ * 0.0 + auVar199._24_4_ * 0.0;
            auVar310._28_4_ = fVar206 + auVar199._28_4_;
            fVar194 = auVar38._0_4_;
            fVar232 = auVar38._4_4_;
            auVar94._4_4_ = auVar200._4_4_ * fVar232;
            auVar94._0_4_ = auVar200._0_4_ * fVar194;
            fVar287 = auVar38._8_4_;
            auVar94._8_4_ = auVar200._8_4_ * fVar287;
            fVar293 = auVar38._12_4_;
            auVar94._12_4_ = auVar200._12_4_ * fVar293;
            fVar215 = auVar38._16_4_;
            auVar94._16_4_ = auVar200._16_4_ * fVar215;
            fVar160 = auVar38._20_4_;
            auVar94._20_4_ = auVar200._20_4_ * fVar160;
            fVar251 = auVar38._24_4_;
            auVar94._24_4_ = auVar200._24_4_ * fVar251;
            auVar94._28_4_ = fVar206;
            fVar206 = auVar39._0_4_;
            fVar235 = auVar39._4_4_;
            auVar95._4_4_ = auVar308._4_4_ * fVar235;
            auVar95._0_4_ = auVar308._0_4_ * fVar206;
            fVar210 = auVar39._8_4_;
            auVar95._8_4_ = auVar308._8_4_ * fVar210;
            fVar295 = auVar39._12_4_;
            auVar95._12_4_ = auVar308._12_4_ * fVar295;
            fVar136 = auVar39._16_4_;
            auVar95._16_4_ = auVar308._16_4_ * fVar136;
            fVar179 = auVar39._20_4_;
            auVar95._20_4_ = auVar308._20_4_ * fVar179;
            fVar259 = auVar39._24_4_;
            auVar95._24_4_ = auVar308._24_4_ * fVar259;
            auVar95._28_4_ = auVar36._28_4_;
            auVar332 = vsubps_avx(auVar95,auVar94);
            auVar36 = vsubps_avx(auVar242,auVar40);
            fVar208 = auVar36._0_4_;
            fVar245 = auVar36._4_4_;
            auVar96._4_4_ = auVar200._4_4_ * fVar245;
            auVar96._0_4_ = auVar200._0_4_ * fVar208;
            fVar320 = auVar36._8_4_;
            auVar96._8_4_ = auVar200._8_4_ * fVar320;
            fVar213 = auVar36._12_4_;
            auVar96._12_4_ = auVar200._12_4_ * fVar213;
            fVar151 = auVar36._16_4_;
            auVar96._16_4_ = auVar200._16_4_ * fVar151;
            fVar191 = auVar36._20_4_;
            auVar96._20_4_ = auVar200._20_4_ * fVar191;
            fVar261 = auVar36._24_4_;
            auVar96._24_4_ = auVar200._24_4_ * fVar261;
            auVar96._28_4_ = auVar200._28_4_;
            auVar97._4_4_ = fVar235 * auVar40._4_4_;
            auVar97._0_4_ = fVar206 * auVar40._0_4_;
            auVar97._8_4_ = fVar210 * auVar40._8_4_;
            auVar97._12_4_ = fVar295 * auVar40._12_4_;
            auVar97._16_4_ = fVar136 * auVar40._16_4_;
            auVar97._20_4_ = fVar179 * auVar40._20_4_;
            auVar97._24_4_ = fVar259 * auVar40._24_4_;
            auVar97._28_4_ = auVar199._28_4_;
            auVar200 = vsubps_avx(auVar96,auVar97);
            auVar98._4_4_ = auVar308._4_4_ * fVar245;
            auVar98._0_4_ = auVar308._0_4_ * fVar208;
            auVar98._8_4_ = auVar308._8_4_ * fVar320;
            auVar98._12_4_ = auVar308._12_4_ * fVar213;
            auVar98._16_4_ = auVar308._16_4_ * fVar151;
            auVar98._20_4_ = auVar308._20_4_ * fVar191;
            auVar98._24_4_ = auVar308._24_4_ * fVar261;
            auVar98._28_4_ = auVar308._28_4_;
            auVar99._4_4_ = fVar232 * auVar40._4_4_;
            auVar99._0_4_ = fVar194 * auVar40._0_4_;
            auVar99._8_4_ = fVar287 * auVar40._8_4_;
            auVar99._12_4_ = fVar293 * auVar40._12_4_;
            auVar99._16_4_ = fVar215 * auVar40._16_4_;
            auVar99._20_4_ = fVar160 * auVar40._20_4_;
            auVar99._24_4_ = fVar251 * auVar40._24_4_;
            auVar99._28_4_ = auVar40._28_4_;
            auVar40 = vsubps_avx(auVar99,auVar98);
            auVar149._0_4_ = auVar332._0_4_ * 0.0 + auVar40._0_4_ + auVar200._0_4_ * 0.0;
            auVar149._4_4_ = auVar332._4_4_ * 0.0 + auVar40._4_4_ + auVar200._4_4_ * 0.0;
            auVar149._8_4_ = auVar332._8_4_ * 0.0 + auVar40._8_4_ + auVar200._8_4_ * 0.0;
            auVar149._12_4_ = auVar332._12_4_ * 0.0 + auVar40._12_4_ + auVar200._12_4_ * 0.0;
            auVar149._16_4_ = auVar332._16_4_ * 0.0 + auVar40._16_4_ + auVar200._16_4_ * 0.0;
            auVar149._20_4_ = auVar332._20_4_ * 0.0 + auVar40._20_4_ + auVar200._20_4_ * 0.0;
            auVar149._24_4_ = auVar332._24_4_ * 0.0 + auVar40._24_4_ + auVar200._24_4_ * 0.0;
            auVar149._28_4_ = auVar200._28_4_ + auVar40._28_4_ + auVar200._28_4_;
            auVar150 = ZEXT3264(auVar149);
            auVar40 = vmaxps_avx(auVar310,auVar149);
            auVar40 = vcmpps_avx(auVar40,ZEXT832(0) << 0x20,2);
            auVar308 = auVar13 & auVar40;
            if ((((((((auVar308 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar308 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar308 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar308 >> 0x7f,0) == '\0') &&
                  (auVar308 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar308 >> 0xbf,0) == '\0') &&
                (auVar308 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar308[0x1f]) {
LAB_00f4acce:
              auVar175._8_8_ = uStack_518;
              auVar175._0_8_ = local_520;
              auVar175._16_8_ = uStack_510;
              auVar175._24_8_ = uStack_508;
              auVar283 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar161,CONCAT420(fVar159,CONCAT416(
                                                  fVar157,CONCAT412(fVar155,CONCAT48(fVar153,
                                                  CONCAT44(fVar152,fVar137))))))));
            }
            else {
              auVar308 = vandps_avx(auVar40,auVar13);
              auVar100._4_4_ = fVar235 * fVar209;
              auVar100._0_4_ = fVar206 * fVar324;
              auVar100._8_4_ = fVar210 * fVar246;
              auVar100._12_4_ = fVar295 * fVar289;
              auVar100._16_4_ = fVar136 * fVar322;
              auVar100._20_4_ = fVar179 * fVar177;
              auVar100._24_4_ = fVar259 * fVar192;
              auVar100._28_4_ = auVar13._28_4_;
              auVar101._4_4_ = fVar232 * fVar260;
              auVar101._0_4_ = fVar194 * fVar176;
              auVar101._8_4_ = fVar287 * fVar262;
              auVar101._12_4_ = fVar293 * fVar276;
              auVar101._16_4_ = fVar215 * fVar284;
              auVar101._20_4_ = fVar160 * fVar286;
              auVar101._24_4_ = fVar251 * fVar288;
              auVar101._28_4_ = auVar40._28_4_;
              auVar40 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar245 * fVar260;
              auVar102._0_4_ = fVar208 * fVar176;
              auVar102._8_4_ = fVar320 * fVar262;
              auVar102._12_4_ = fVar213 * fVar276;
              auVar102._16_4_ = fVar151 * fVar284;
              auVar102._20_4_ = fVar191 * fVar286;
              auVar102._24_4_ = fVar261 * fVar288;
              auVar102._28_4_ = auVar223._28_4_;
              auVar103._4_4_ = fVar235 * fVar230;
              auVar103._0_4_ = fVar206 * fVar211;
              auVar103._8_4_ = fVar210 * fVar285;
              auVar103._12_4_ = fVar295 * fVar321;
              auVar103._16_4_ = fVar136 * fVar214;
              auVar103._20_4_ = fVar179 * fVar158;
              auVar103._24_4_ = fVar259 * fVar178;
              auVar103._28_4_ = auVar39._28_4_;
              auVar200 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar232 * fVar230;
              auVar104._0_4_ = fVar194 * fVar211;
              auVar104._8_4_ = fVar287 * fVar285;
              auVar104._12_4_ = fVar293 * fVar321;
              auVar104._16_4_ = fVar215 * fVar214;
              auVar104._20_4_ = fVar160 * fVar158;
              auVar104._24_4_ = fVar251 * fVar178;
              auVar104._28_4_ = auVar143._28_4_;
              auVar105._4_4_ = fVar245 * fVar209;
              auVar105._0_4_ = fVar208 * fVar324;
              auVar105._8_4_ = fVar320 * fVar246;
              auVar105._12_4_ = fVar213 * fVar289;
              auVar105._16_4_ = fVar151 * fVar322;
              auVar105._20_4_ = fVar191 * fVar177;
              auVar105._24_4_ = fVar261 * fVar192;
              auVar105._28_4_ = auVar37._28_4_;
              auVar199 = vsubps_avx(auVar105,auVar104);
              auVar174._0_4_ = auVar40._0_4_ * 0.0 + auVar199._0_4_ + auVar200._0_4_ * 0.0;
              auVar174._4_4_ = auVar40._4_4_ * 0.0 + auVar199._4_4_ + auVar200._4_4_ * 0.0;
              auVar174._8_4_ = auVar40._8_4_ * 0.0 + auVar199._8_4_ + auVar200._8_4_ * 0.0;
              auVar174._12_4_ = auVar40._12_4_ * 0.0 + auVar199._12_4_ + auVar200._12_4_ * 0.0;
              auVar174._16_4_ = auVar40._16_4_ * 0.0 + auVar199._16_4_ + auVar200._16_4_ * 0.0;
              auVar174._20_4_ = auVar40._20_4_ * 0.0 + auVar199._20_4_ + auVar200._20_4_ * 0.0;
              auVar174._24_4_ = auVar40._24_4_ * 0.0 + auVar199._24_4_ + auVar200._24_4_ * 0.0;
              auVar174._28_4_ = auVar37._28_4_ + auVar199._28_4_ + auVar143._28_4_;
              auVar13 = vrcpps_avx(auVar174);
              fVar324 = auVar13._0_4_;
              fVar211 = auVar13._4_4_;
              auVar106._4_4_ = auVar174._4_4_ * fVar211;
              auVar106._0_4_ = auVar174._0_4_ * fVar324;
              fVar194 = auVar13._8_4_;
              auVar106._8_4_ = auVar174._8_4_ * fVar194;
              fVar206 = auVar13._12_4_;
              auVar106._12_4_ = auVar174._12_4_ * fVar206;
              fVar208 = auVar13._16_4_;
              auVar106._16_4_ = auVar174._16_4_ * fVar208;
              fVar209 = auVar13._20_4_;
              auVar106._20_4_ = auVar174._20_4_ * fVar209;
              fVar230 = auVar13._24_4_;
              auVar106._24_4_ = auVar174._24_4_ * fVar230;
              auVar106._28_4_ = auVar39._28_4_;
              auVar336._8_4_ = 0x3f800000;
              auVar336._0_8_ = 0x3f8000003f800000;
              auVar336._12_4_ = 0x3f800000;
              auVar336._16_4_ = 0x3f800000;
              auVar336._20_4_ = 0x3f800000;
              auVar336._24_4_ = 0x3f800000;
              auVar336._28_4_ = 0x3f800000;
              auVar13 = vsubps_avx(auVar336,auVar106);
              fVar324 = auVar13._0_4_ * fVar324 + fVar324;
              fVar211 = auVar13._4_4_ * fVar211 + fVar211;
              fVar194 = auVar13._8_4_ * fVar194 + fVar194;
              fVar206 = auVar13._12_4_ * fVar206 + fVar206;
              fVar208 = auVar13._16_4_ * fVar208 + fVar208;
              fVar209 = auVar13._20_4_ * fVar209 + fVar209;
              fVar230 = auVar13._24_4_ * fVar230 + fVar230;
              auVar107._4_4_ =
                   (fVar228 * auVar40._4_4_ + auVar200._4_4_ * fVar216 + auVar199._4_4_ * fVar264) *
                   fVar211;
              auVar107._0_4_ =
                   (fVar328 * auVar40._0_4_ + auVar200._0_4_ * fVar207 + auVar199._0_4_ * fVar263) *
                   fVar324;
              auVar107._8_4_ =
                   (fVar319 * auVar40._8_4_ + auVar200._8_4_ * fVar247 + auVar199._8_4_ * fVar265) *
                   fVar194;
              auVar107._12_4_ =
                   (fVar212 * auVar40._12_4_ + auVar200._12_4_ * fVar291 + auVar199._12_4_ * fVar266
                   ) * fVar206;
              auVar107._16_4_ =
                   (fVar317 * auVar40._16_4_ + auVar200._16_4_ * fVar314 + auVar199._16_4_ * fVar267
                   ) * fVar208;
              auVar107._20_4_ =
                   (fVar156 * auVar40._20_4_ + auVar200._20_4_ * fVar154 + auVar199._20_4_ * fVar248
                   ) * fVar209;
              auVar107._24_4_ =
                   (fVar234 * auVar40._24_4_ + auVar200._24_4_ * fVar193 + auVar199._24_4_ * fVar250
                   ) * fVar230;
              auVar107._28_4_ = auVar242._28_4_ + auVar32._28_4_ + auVar33._28_4_;
              auVar205 = ZEXT3264(auVar107);
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar227._4_4_ = uVar12;
              auVar227._0_4_ = uVar12;
              auVar227._8_4_ = uVar12;
              auVar227._12_4_ = uVar12;
              auVar227._16_4_ = uVar12;
              auVar227._20_4_ = uVar12;
              auVar227._24_4_ = uVar12;
              auVar227._28_4_ = uVar12;
              auVar13 = vcmpps_avx(_local_380,auVar107,2);
              auVar242 = vcmpps_avx(auVar107,auVar227,2);
              auVar13 = vandps_avx(auVar13,auVar242);
              auVar32 = auVar308 & auVar13;
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar32 >> 0x7f,0) == '\0') &&
                    (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar32 >> 0xbf,0) == '\0') &&
                  (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar32[0x1f]) goto LAB_00f4acce;
              auVar13 = vandps_avx(auVar308,auVar13);
              auVar32 = vcmpps_avx(ZEXT832(0) << 0x20,auVar174,4);
              auVar33 = auVar13 & auVar32;
              auVar175._8_8_ = uStack_518;
              auVar175._0_8_ = local_520;
              auVar175._16_8_ = uStack_510;
              auVar175._24_8_ = uStack_508;
              auVar283 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar161,CONCAT420(fVar159,CONCAT416(
                                                  fVar157,CONCAT412(fVar155,CONCAT48(fVar153,
                                                  CONCAT44(fVar152,fVar137))))))));
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar175 = vandps_avx(auVar32,auVar13);
                auVar108._4_4_ = auVar310._4_4_ * fVar211;
                auVar108._0_4_ = auVar310._0_4_ * fVar324;
                auVar108._8_4_ = auVar310._8_4_ * fVar194;
                auVar108._12_4_ = auVar310._12_4_ * fVar206;
                auVar108._16_4_ = auVar310._16_4_ * fVar208;
                auVar108._20_4_ = auVar310._20_4_ * fVar209;
                auVar108._24_4_ = auVar310._24_4_ * fVar230;
                auVar108._28_4_ = auVar242._28_4_;
                auVar109._4_4_ = auVar149._4_4_ * fVar211;
                auVar109._0_4_ = auVar149._0_4_ * fVar324;
                auVar109._8_4_ = auVar149._8_4_ * fVar194;
                auVar109._12_4_ = auVar149._12_4_ * fVar206;
                auVar109._16_4_ = auVar149._16_4_ * fVar208;
                auVar109._20_4_ = auVar149._20_4_ * fVar209;
                auVar109._24_4_ = auVar149._24_4_ * fVar230;
                auVar109._28_4_ = auVar149._28_4_;
                auVar258._8_4_ = 0x3f800000;
                auVar258._0_8_ = 0x3f8000003f800000;
                auVar258._12_4_ = 0x3f800000;
                auVar258._16_4_ = 0x3f800000;
                auVar258._20_4_ = 0x3f800000;
                auVar258._24_4_ = 0x3f800000;
                auVar258._28_4_ = 0x3f800000;
                auVar13 = vsubps_avx(auVar258,auVar108);
                local_160 = vblendvps_avx(auVar13,auVar108,auVar274);
                auVar13 = vsubps_avx(auVar258,auVar109);
                _local_3e0 = vblendvps_avx(auVar13,auVar109,auVar274);
                auVar150 = ZEXT3264(_local_3e0);
                local_180 = auVar107;
              }
            }
            auVar341 = ZEXT3264(auVar222);
            fVar179 = (float)local_780._0_4_;
            fVar191 = (float)local_780._4_4_;
            fVar192 = fStack_778;
            fVar193 = fStack_774;
            fVar324 = fStack_770;
            fVar207 = fStack_76c;
            fVar328 = fStack_768;
            fVar211 = fStack_764;
            _local_740 = auVar281;
            local_4c0 = auVar23;
            if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar175 >> 0x7f,0) != '\0') ||
                  (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar175 >> 0xbf,0) != '\0') ||
                (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar175[0x1f] < '\0') {
              auVar13 = vsubps_avx(auVar281,auVar283._0_32_);
              auVar205 = ZEXT3264(local_160);
              fVar206 = auVar283._0_4_ + auVar13._0_4_ * local_160._0_4_;
              fVar208 = auVar283._4_4_ + auVar13._4_4_ * local_160._4_4_;
              fVar209 = auVar283._8_4_ + auVar13._8_4_ * local_160._8_4_;
              fVar216 = auVar283._12_4_ + auVar13._12_4_ * local_160._12_4_;
              fVar228 = auVar283._16_4_ + auVar13._16_4_ * local_160._16_4_;
              fVar230 = auVar283._20_4_ + auVar13._20_4_ * local_160._20_4_;
              fVar232 = auVar283._24_4_ + auVar13._24_4_ * local_160._24_4_;
              fVar235 = auVar283._28_4_ + auVar13._28_4_;
              fVar194 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
              auVar110._4_4_ = (fVar208 + fVar208) * fVar194;
              auVar110._0_4_ = (fVar206 + fVar206) * fVar194;
              auVar110._8_4_ = (fVar209 + fVar209) * fVar194;
              auVar110._12_4_ = (fVar216 + fVar216) * fVar194;
              auVar110._16_4_ = (fVar228 + fVar228) * fVar194;
              auVar110._20_4_ = (fVar230 + fVar230) * fVar194;
              auVar110._24_4_ = (fVar232 + fVar232) * fVar194;
              auVar110._28_4_ = fVar235 + fVar235;
              auVar13 = vcmpps_avx(local_180,auVar110,6);
              auVar150 = ZEXT3264(auVar13);
              auVar23 = auVar175 & auVar13;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                local_200 = vandps_avx(auVar13,auVar175);
                auVar150 = ZEXT3264(local_200);
                local_2a0 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
                fStack_29c = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
                fStack_298 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                fStack_294 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                fStack_290 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                fStack_28c = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                fStack_288 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                fStack_284 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                local_2c0 = local_160;
                local_280 = local_180;
                local_250 = local_710;
                uStack_248 = uStack_708;
                local_240 = local_5d0;
                uStack_238 = uStack_5c8;
                local_230 = local_5e0;
                uStack_228 = uStack_5d8;
                local_220 = local_5f0;
                uStack_218 = uStack_5e8;
                auVar134 = (undefined1  [8])(context->scene->geometries).items[local_788].ptr;
                local_3e0._4_4_ = fStack_29c;
                local_3e0._0_4_ = local_2a0;
                uStack_3d8._0_4_ = fStack_298;
                uStack_3d8._4_4_ = fStack_294;
                uStack_3d0._0_4_ = fStack_290;
                uStack_3d0._4_4_ = fStack_28c;
                auVar123 = _local_3e0;
                uStack_3c8._0_4_ = fStack_288;
                uStack_3c8._4_4_ = fStack_284;
                auVar13 = _local_3e0;
                if ((((Geometry *)auVar134)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar127 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar127 = context->args;
                  if ((pRVar127->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar127 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar127 >> 8),1),
                     ((Geometry *)auVar134)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    _auStack_738 = auVar281._8_24_;
                    local_740 = auVar134;
                    local_760._4_28_ = auVar204._4_28_;
                    local_760._0_4_ = (int)uVar126;
                    auVar168._0_4_ = (float)(int)local_260;
                    auVar168._4_8_ = SUB128(ZEXT812(0),4);
                    auVar168._12_4_ = 0;
                    auVar237 = vshufps_avx(auVar168,auVar168,0);
                    local_1e0[0] = (auVar237._0_4_ + local_160._0_4_ + 0.0) * (float)local_e0._0_4_;
                    local_1e0[1] = (auVar237._4_4_ + local_160._4_4_ + 1.0) * (float)local_e0._4_4_;
                    local_1e0[2] = (auVar237._8_4_ + local_160._8_4_ + 2.0) * fStack_d8;
                    local_1e0[3] = (auVar237._12_4_ + local_160._12_4_ + 3.0) * fStack_d4;
                    fStack_1d0 = (auVar237._0_4_ + local_160._16_4_ + 4.0) * fStack_d0;
                    fStack_1cc = (auVar237._4_4_ + local_160._20_4_ + 5.0) * fStack_cc;
                    fStack_1c8 = (auVar237._8_4_ + local_160._24_4_ + 6.0) * fStack_c8;
                    fStack_1c4 = auVar237._12_4_ + (float)local_160._28_4_ + 7.0;
                    uStack_3d0 = auVar123._16_8_;
                    uStack_3c8 = auVar13._24_8_;
                    local_1c0 = local_3e0;
                    uStack_1b8 = uStack_3d8;
                    uStack_1b0 = uStack_3d0;
                    uStack_1a8 = uStack_3c8;
                    local_1a0 = local_180;
                    iVar125 = vmovmskps_avx(local_200);
                    local_820 = (undefined1  [8])CONCAT44((int)((ulong)pRVar127 >> 0x20),iVar125);
                    lVar20 = 0;
                    if (local_820 != (undefined1  [8])0x0) {
                      for (; ((ulong)local_820 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar20;
                    uStack_7bc = (undefined4)((ulong)lVar20 >> 0x20);
                    _local_3e0 = auVar13;
                    if (iVar125 == 0) {
                      pRVar127 = (RTCIntersectArguments *)0x0;
LAB_00f4acfa:
                      uVar126 = (ulong)(uint)local_760._0_4_;
                    }
                    else {
                      auStack_630 = auVar257._16_16_;
                      local_640 = *local_700;
                      stack0xfffffffffffff9a4 = auVar243._4_28_;
                      local_660._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      _local_5c0 = auVar190;
                      local_25c = uVar17;
                      do {
                        lVar20 = CONCAT44(uStack_7bc,local_7c0);
                        local_440 = local_1e0[lVar20];
                        local_430 = *(undefined4 *)((long)&local_1c0 + lVar20 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1a0 + lVar20 * 4);
                        fVar207 = 1.0 - local_440;
                        fVar324 = local_440 * fVar207 * 4.0;
                        auVar237 = ZEXT416((uint)(local_440 * local_440 * 0.5));
                        auVar237 = vshufps_avx(auVar237,auVar237,0);
                        auVar186 = ZEXT416((uint)((fVar207 * fVar207 + fVar324) * 0.5));
                        auVar186 = vshufps_avx(auVar186,auVar186,0);
                        auVar221 = ZEXT416((uint)((-local_440 * local_440 - fVar324) * 0.5));
                        auVar221 = vshufps_avx(auVar221,auVar221,0);
                        local_6f0.context = context->user;
                        auVar198 = ZEXT416((uint)(fVar207 * -fVar207 * 0.5));
                        auVar198 = vshufps_avx(auVar198,auVar198,0);
                        auVar187._0_4_ =
                             auVar198._0_4_ * (float)local_710._0_4_ +
                             auVar221._0_4_ * (float)local_5d0._0_4_ +
                             auVar237._0_4_ * (float)local_5f0._0_4_ +
                             auVar186._0_4_ * (float)local_5e0._0_4_;
                        auVar187._4_4_ =
                             auVar198._4_4_ * (float)local_710._4_4_ +
                             auVar221._4_4_ * (float)local_5d0._4_4_ +
                             auVar237._4_4_ * (float)local_5f0._4_4_ +
                             auVar186._4_4_ * (float)local_5e0._4_4_;
                        auVar187._8_4_ =
                             auVar198._8_4_ * (float)uStack_708 +
                             auVar221._8_4_ * (float)uStack_5c8 +
                             auVar237._8_4_ * (float)uStack_5e8 + auVar186._8_4_ * (float)uStack_5d8
                        ;
                        auVar187._12_4_ =
                             auVar198._12_4_ * uStack_708._4_4_ +
                             auVar221._12_4_ * uStack_5c8._4_4_ +
                             auVar237._12_4_ * uStack_5e8._4_4_ + auVar186._12_4_ * uStack_5d8._4_4_
                        ;
                        local_470 = (RTCHitN  [16])vshufps_avx(auVar187,auVar187,0);
                        local_460 = vshufps_avx(auVar187,auVar187,0x55);
                        auVar205 = ZEXT1664(local_460);
                        local_450 = vshufps_avx(auVar187,auVar187,0xaa);
                        local_420 = local_600._0_8_;
                        uStack_418 = local_600._8_8_;
                        local_410 = local_3a0._0_8_;
                        uStack_408 = local_3a0._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_3fc = (local_6f0.context)->instID[0];
                        local_400 = uStack_3fc;
                        uStack_3f8 = uStack_3fc;
                        uStack_3f4 = uStack_3fc;
                        uStack_3f0 = (local_6f0.context)->instPrimID[0];
                        uStack_3ec = uStack_3f0;
                        uStack_3e8 = uStack_3f0;
                        uStack_3e4 = uStack_3f0;
                        local_7a0 = local_640;
                        local_6f0.valid = (int *)local_7a0;
                        local_6f0.geometryUserPtr = ((Geometry *)auVar134)->userPtr;
                        local_6f0.hit = local_470;
                        local_6f0.N = 4;
                        local_6f0.ray = (RTCRayN *)ray;
                        fStack_43c = local_440;
                        fStack_438 = local_440;
                        fStack_434 = local_440;
                        uStack_42c = local_430;
                        uStack_428 = local_430;
                        uStack_424 = local_430;
                        if (((Geometry *)auVar134)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar205 = ZEXT1664(local_460);
                          auVar283 = ZEXT1664(auVar283._0_16_);
                          (*((Geometry *)auVar134)->occlusionFilterN)(&local_6f0);
                        }
                        if (local_7a0 == (undefined1  [16])0x0) {
                          auVar237 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar237 = auVar237 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var21 = context->args->filter;
                          if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)((long)local_740 + 0x3e) & 0x40) != 0)))) {
                            auVar205 = ZEXT1664(auVar205._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            (*p_Var21)(&local_6f0);
                          }
                          auVar186 = vpcmpeqd_avx(local_7a0,_DAT_01f7aa10);
                          auVar237 = auVar186 ^ _DAT_01f7ae20;
                          auVar188._8_4_ = 0xff800000;
                          auVar188._0_8_ = 0xff800000ff800000;
                          auVar188._12_4_ = 0xff800000;
                          auVar186 = vblendvps_avx(auVar188,*(undefined1 (*) [16])
                                                             (local_6f0.ray + 0x80),auVar186);
                          *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar186;
                        }
                        auVar150 = ZEXT1664(auVar237);
                        auVar169._8_8_ = 0x100000001;
                        auVar169._0_8_ = 0x100000001;
                        if ((auVar169 & auVar237) != (undefined1  [16])0x0) {
                          pRVar127 = (RTCIntersectArguments *)0x1;
                          goto LAB_00f4acfa;
                        }
                        auVar150 = ZEXT464((uint)local_660._0_4_);
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_660._0_4_;
                        local_820 = (undefined1  [8])
                                    ((ulong)local_820 ^ 1L << ((ulong)local_7c0 & 0x3f));
                        lVar20 = 0;
                        if (local_820 != (undefined1  [8])0x0) {
                          for (; ((ulong)local_820 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar20;
                        uStack_7bc = (undefined4)((ulong)lVar20 >> 0x20);
                        pRVar127 = (RTCIntersectArguments *)0x0;
                        uVar126 = (ulong)(uint)local_760._0_4_;
                        auVar134 = local_740;
                      } while (local_820 != (undefined1  [8])0x0);
                    }
                  }
                }
                auVar341 = ZEXT3264(auVar222);
                uVar126 = CONCAT71((int7)(uVar126 >> 8),(byte)uVar126 | (byte)pRVar127);
                fVar179 = (float)local_780._0_4_;
                fVar191 = (float)local_780._4_4_;
                fVar192 = fStack_778;
                fVar193 = fStack_774;
                fVar324 = fStack_770;
                fVar207 = fStack_76c;
                fVar328 = fStack_768;
                fVar211 = fStack_764;
              }
            }
          }
          lVar135 = lVar135 + 8;
        } while ((int)lVar135 < (int)uVar17);
      }
      bVar131 = (byte)uVar126;
      if ((uVar126 & 1) != 0) break;
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar141._4_4_ = uVar12;
      auVar141._0_4_ = uVar12;
      auVar141._8_4_ = uVar12;
      auVar141._12_4_ = uVar12;
      auVar237 = vcmpps_avx(local_2d0,auVar141,2);
      uVar128 = vmovmskps_avx(auVar237);
      uVar124 = uVar124 & uVar124 + 0xf & uVar128;
    } while (uVar124 != 0);
  }
  return (bool)(bVar131 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }